

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O2

int __thiscall
ncnn::Convolution_x86::forward_int8_x86
          (Convolution_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  short *psVar1;
  int *piVar2;
  int *piVar3;
  int *piVar4;
  int *piVar5;
  int *piVar6;
  ulong uVar7;
  undefined8 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined1 uVar12;
  undefined1 uVar13;
  undefined1 uVar16;
  undefined1 uVar17;
  undefined4 uVar11;
  undefined1 uVar20;
  undefined1 uVar21;
  undefined1 uVar24;
  undefined1 uVar25;
  undefined1 uVar26;
  undefined1 uVar30;
  undefined1 uVar31;
  undefined1 uVar32;
  undefined1 uVar36;
  undefined1 uVar37;
  undefined1 uVar38;
  undefined1 uVar42;
  undefined1 uVar43;
  undefined1 uVar44;
  _func_int *p_Var45;
  Layer *pLVar46;
  size_t sVar47;
  undefined4 uVar48;
  undefined1 uVar49;
  undefined1 uVar51;
  undefined1 uVar53;
  undefined1 uVar55;
  undefined1 uVar56;
  undefined1 uVar57;
  undefined1 uVar59;
  undefined1 uVar61;
  undefined4 uVar62;
  undefined1 uVar63;
  undefined1 uVar65;
  undefined1 uVar67;
  undefined1 uVar69;
  undefined1 uVar70;
  undefined1 uVar71;
  undefined1 uVar73;
  undefined1 uVar75;
  undefined1 auVar76 [14];
  undefined1 auVar77 [12];
  unkbyte10 Var78;
  undefined1 auVar79 [14];
  undefined1 auVar80 [12];
  unkbyte10 Var81;
  undefined1 auVar82 [14];
  undefined1 auVar83 [12];
  unkbyte10 Var84;
  undefined1 auVar85 [12];
  undefined1 auVar86 [12];
  undefined1 auVar87 [12];
  undefined1 auVar88 [12];
  undefined1 auVar89 [14];
  undefined1 auVar90 [12];
  undefined1 auVar91 [12];
  undefined1 auVar92 [14];
  undefined1 auVar93 [12];
  undefined1 auVar94 [14];
  undefined1 auVar95 [12];
  undefined1 auVar96 [12];
  undefined1 auVar97 [14];
  undefined1 auVar98 [12];
  undefined1 auVar99 [14];
  undefined1 auVar100 [12];
  undefined1 auVar101 [14];
  undefined1 auVar102 [12];
  undefined1 auVar103 [14];
  undefined1 auVar104 [12];
  undefined1 auVar105 [12];
  undefined1 auVar106 [12];
  undefined1 auVar107 [12];
  undefined1 auVar108 [12];
  undefined1 auVar109 [12];
  undefined1 auVar110 [12];
  undefined1 auVar111 [12];
  undefined1 auVar112 [12];
  undefined1 auVar113 [12];
  undefined1 auVar114 [12];
  undefined1 auVar115 [12];
  undefined1 auVar116 [12];
  undefined1 auVar117 [12];
  undefined1 auVar118 [12];
  undefined1 auVar119 [12];
  undefined1 auVar120 [12];
  undefined1 auVar121 [12];
  undefined1 auVar122 [12];
  undefined1 auVar123 [12];
  undefined1 auVar124 [12];
  undefined1 auVar125 [12];
  undefined1 auVar126 [12];
  undefined1 auVar127 [12];
  undefined1 auVar128 [12];
  undefined1 auVar129 [12];
  undefined1 auVar130 [12];
  undefined1 auVar131 [12];
  unkbyte10 Var132;
  unkbyte10 Var133;
  unkbyte10 Var134;
  int n_2;
  ulong uVar135;
  undefined1 (*pauVar136) [16];
  undefined1 (*pauVar137) [16];
  int *piVar138;
  uint uVar139;
  uint uVar140;
  int iVar141;
  undefined1 (*pauVar143) [16];
  short asVar144 [4];
  short asVar145 [4];
  int iVar142;
  long lVar146;
  short asVar147 [4];
  uint uVar148;
  long lVar149;
  undefined1 *puVar150;
  ulong uVar151;
  undefined1 (*pauVar152) [16];
  void *pvVar153;
  long lVar154;
  int j_2;
  short asVar155 [4];
  int u;
  uint uVar156;
  long lVar157;
  short asVar158 [4];
  ulong uVar159;
  ulong uVar160;
  short asVar161 [4];
  void *pvVar162;
  long lVar163;
  short asVar164 [4];
  int j_1;
  uint uVar165;
  undefined8 *puVar166;
  undefined8 *puVar167;
  short asVar168 [4];
  int u_1;
  int iVar169;
  undefined1 *puVar170;
  short asVar171 [4];
  ulong uVar172;
  short asVar173 [4];
  ulong uVar174;
  ulong uVar175;
  int i;
  int iVar176;
  long lVar177;
  long lVar178;
  int v_1;
  undefined1 *puVar179;
  ulong uVar180;
  short asVar181 [4];
  void *pvVar182;
  void *pvVar183;
  size_t sVar184;
  int iVar185;
  long lVar186;
  long lVar187;
  void *pvVar188;
  int u_4;
  int iVar189;
  uint uVar190;
  ulong uVar191;
  ulong uVar192;
  int i_2;
  int *piVar193;
  int i_5;
  undefined1 (*pauVar194) [16];
  short asVar195 [4];
  short asVar196 [4];
  void *pvVar197;
  short asVar198 [4];
  uint uVar199;
  char cVar217;
  char cVar218;
  char cVar219;
  char cVar220;
  char cVar221;
  char cVar222;
  undefined1 auVar200 [16];
  undefined1 extraout_XMM0 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 extraout_XMM0_00 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined8 uVar225;
  undefined1 auVar227 [12];
  short sVar255;
  short sVar258;
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  short sVar257;
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  int iVar256;
  int iVar259;
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined8 uVar263;
  int iVar261;
  undefined1 auVar264 [12];
  undefined1 auVar269 [16];
  undefined1 auVar279 [16];
  undefined1 auVar266 [12];
  undefined1 auVar281 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  int iVar288;
  int iVar289;
  int iVar290;
  undefined1 auVar287 [16];
  undefined4 uVar291;
  int iVar292;
  int iVar293;
  undefined1 auVar298 [12];
  int iVar310;
  undefined1 auVar303 [16];
  undefined1 auVar297 [12];
  undefined1 auVar305 [16];
  undefined1 auVar307 [16];
  short sVar312;
  undefined1 auVar299 [12];
  int iVar311;
  int iVar313;
  int iVar314;
  int iVar315;
  int iVar316;
  undefined1 auVar309 [16];
  short sVar317;
  undefined1 auVar319 [12];
  short sVar353;
  short sVar354;
  short sVar355;
  short sVar356;
  undefined1 auVar318 [12];
  short sVar359;
  undefined1 auVar330 [16];
  short sVar358;
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar341 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar348 [16];
  undefined1 auVar320 [12];
  undefined1 auVar350 [16];
  undefined1 auVar321 [12];
  int iVar357;
  int iVar360;
  undefined1 auVar352 [16];
  undefined1 auVar363 [12];
  short sVar392;
  undefined1 auVar362 [12];
  short sVar397;
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 auVar364 [12];
  undefined1 auVar365 [12];
  undefined1 auVar366 [12];
  undefined1 auVar383 [16];
  undefined1 auVar367 [12];
  short sVar393;
  undefined1 auVar368 [12];
  undefined1 auVar369 [12];
  undefined1 auVar370 [12];
  undefined1 auVar388 [16];
  undefined1 auVar399 [12];
  undefined1 auVar400 [12];
  short sVar429;
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  undefined1 auVar410 [16];
  undefined1 auVar418 [16];
  undefined1 auVar419 [16];
  undefined1 auVar422 [16];
  undefined1 auVar424 [16];
  undefined1 auVar427 [16];
  int iVar430;
  undefined1 auVar431 [12];
  undefined1 auVar432 [12];
  undefined1 auVar433 [12];
  int iVar452;
  int iVar455;
  undefined1 in_XMM7 [16];
  undefined1 auVar434 [16];
  undefined1 auVar442 [16];
  undefined1 auVar443 [16];
  undefined1 auVar444 [16];
  undefined1 auVar445 [16];
  undefined1 auVar446 [16];
  undefined1 auVar447 [16];
  undefined1 auVar448 [16];
  int iVar458;
  undefined1 auVar460 [12];
  short sVar485;
  undefined1 auVar462 [12];
  short sVar486;
  undefined1 auVar463 [12];
  short sVar484;
  undefined1 in_XMM8 [16];
  undefined1 auVar464 [16];
  undefined1 auVar471 [16];
  undefined1 auVar478 [16];
  undefined1 auVar461 [12];
  undefined1 auVar480 [16];
  undefined1 auVar481 [16];
  short sVar507;
  undefined1 auVar487 [12];
  undefined1 auVar491 [12];
  short sVar508;
  undefined1 auVar492 [12];
  undefined1 auVar493 [12];
  undefined1 auVar495 [16];
  undefined1 auVar496 [16];
  undefined1 auVar497 [16];
  undefined1 auVar498 [16];
  undefined1 auVar499 [16];
  undefined1 auVar488 [12];
  undefined1 auVar489 [12];
  undefined1 auVar490 [12];
  undefined1 auVar503 [16];
  short sVar518;
  undefined1 auVar509 [12];
  undefined1 auVar511 [16];
  undefined1 auVar512 [16];
  undefined1 auVar513 [16];
  undefined1 auVar514 [16];
  undefined1 auVar515 [16];
  undefined1 auVar516 [16];
  undefined1 auVar517 [16];
  short sVar525;
  undefined1 auVar519 [12];
  undefined1 auVar520 [12];
  short sVar526;
  undefined1 auVar521 [12];
  undefined1 auVar527 [12];
  undefined1 auVar528 [12];
  short sVar539;
  undefined1 auVar529 [16];
  short sVar544;
  undefined1 auVar540 [12];
  undefined1 auVar541 [12];
  undefined1 auVar545 [16];
  undefined1 auVar546 [16];
  undefined1 auVar547 [16];
  void *local_720;
  undefined1 local_718 [16];
  void *local_708;
  int *local_6e8;
  void *local_6c8;
  undefined2 local_698;
  undefined2 uStack_696;
  undefined2 uStack_694;
  undefined2 uStack_692;
  undefined2 uStack_690;
  undefined2 uStack_68e;
  undefined2 uStack_68c;
  undefined2 uStack_68a;
  Mat local_678;
  short local_630 [4];
  void *local_628;
  short local_620 [4];
  void *local_618;
  short local_610 [4];
  short local_608 [4];
  ulong local_600;
  Mat local_5f8;
  ulong local_5b0;
  short d0 [4];
  Allocator *local_588;
  int iStack_580;
  int iStack_57c;
  undefined1 auStack_578 [12];
  size_t local_568;
  Mat local_558;
  short t3 [4];
  short t2 [4];
  short t1 [4];
  short t0 [4];
  short d1 [4];
  Option opt_b;
  size_t local_458;
  int *local_438;
  short w3 [4];
  short local_420 [2];
  short local_41c [2];
  short w2 [4];
  int local_410;
  int local_40c;
  undefined8 local_408;
  undefined8 local_400;
  undefined8 local_3f8;
  undefined8 local_3f0;
  undefined4 uStack_3e8;
  undefined4 local_3e4;
  undefined4 local_3e0;
  undefined4 local_3dc;
  short w1 [4];
  undefined4 uStack_3d0;
  undefined4 uStack_3cc;
  Option opt_q;
  int aiStack_380 [2];
  undefined1 local_378 [16];
  int aiStack_368 [20];
  undefined1 local_318 [16];
  int aiStack_308 [20];
  undefined1 local_2b8 [16];
  int aiStack_2a8 [20];
  undefined1 local_258 [16];
  short asStack_248 [96];
  undefined8 local_188;
  long local_180;
  long local_178;
  size_t local_170;
  undefined8 local_168;
  ulong local_160;
  int local_158 [2];
  int o0 [2];
  short w0 [4];
  Mat local_100;
  short d3 [4];
  short d2 [4];
  undefined7 uVar14;
  undefined7 uVar15;
  undefined6 uVar18;
  undefined6 uVar19;
  undefined5 uVar22;
  undefined5 uVar23;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined3 uVar33;
  undefined3 uVar34;
  undefined3 uVar35;
  undefined2 uVar39;
  undefined2 uVar40;
  undefined2 uVar41;
  undefined4 uVar50;
  undefined3 uVar52;
  undefined2 uVar54;
  undefined3 uVar58;
  undefined2 uVar60;
  undefined4 uVar64;
  undefined3 uVar66;
  undefined2 uVar68;
  undefined3 uVar72;
  undefined2 uVar74;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined4 uVar223;
  undefined6 uVar224;
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar226 [12];
  undefined1 auVar247 [16];
  undefined1 auVar228 [14];
  undefined1 auVar229 [14];
  undefined1 auVar248 [16];
  undefined1 auVar239 [16];
  undefined1 auVar242 [16];
  undefined4 uVar260;
  undefined6 uVar262;
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar265 [12];
  undefined1 auVar282 [16];
  undefined1 auVar277 [16];
  undefined1 auVar267 [14];
  undefined1 auVar268 [14];
  undefined1 auVar283 [16];
  undefined1 auVar278 [16];
  undefined1 auVar280 [16];
  undefined6 uVar294;
  undefined8 uVar295;
  undefined1 auVar296 [12];
  undefined1 auVar300 [14];
  undefined1 auVar301 [14];
  undefined1 auVar306 [16];
  undefined1 auVar308 [16];
  undefined1 auVar302 [16];
  undefined1 auVar304 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar331 [16];
  undefined1 auVar325 [16];
  undefined1 auVar332 [16];
  undefined1 auVar339 [16];
  undefined1 auVar346 [16];
  undefined1 auVar326 [16];
  undefined1 auVar333 [16];
  undefined1 auVar322 [14];
  undefined1 auVar327 [16];
  undefined1 auVar334 [16];
  undefined1 auVar340 [16];
  undefined1 auVar342 [16];
  undefined1 auVar347 [16];
  undefined1 auVar349 [16];
  undefined1 auVar351 [16];
  undefined1 auVar328 [16];
  undefined1 auVar335 [16];
  undefined1 auVar329 [16];
  undefined1 auVar336 [16];
  short sVar361;
  undefined1 auVar371 [14];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  short sVar389;
  short sVar390;
  short sVar391;
  short sVar394;
  short sVar395;
  short sVar396;
  short sVar398;
  undefined1 auVar403 [16];
  undefined1 auVar411 [16];
  undefined1 auVar404 [16];
  undefined1 auVar412 [16];
  undefined1 auVar405 [16];
  undefined1 auVar413 [16];
  undefined1 auVar420 [16];
  undefined1 auVar425 [16];
  undefined1 auVar406 [16];
  undefined1 auVar414 [16];
  undefined1 auVar407 [16];
  undefined1 auVar415 [16];
  undefined1 auVar421 [16];
  undefined1 auVar423 [16];
  undefined1 auVar426 [16];
  undefined1 auVar428 [16];
  undefined1 auVar408 [16];
  undefined1 auVar416 [16];
  undefined1 auVar409 [16];
  undefined1 auVar417 [16];
  undefined1 auVar435 [16];
  undefined1 auVar436 [16];
  undefined1 auVar437 [16];
  undefined1 auVar438 [16];
  undefined1 auVar439 [16];
  undefined1 auVar449 [16];
  undefined1 auVar440 [16];
  undefined1 auVar441 [16];
  short sVar450;
  short sVar451;
  short sVar453;
  short sVar454;
  short sVar456;
  short sVar457;
  short sVar459;
  undefined1 auVar465 [16];
  undefined1 auVar472 [16];
  undefined1 auVar466 [16];
  undefined1 auVar473 [16];
  undefined1 auVar467 [16];
  undefined1 auVar474 [16];
  undefined1 auVar468 [16];
  undefined1 auVar475 [16];
  undefined1 auVar479 [16];
  undefined1 auVar482 [16];
  undefined1 auVar483 [16];
  undefined1 auVar469 [16];
  undefined1 auVar476 [16];
  undefined1 auVar470 [16];
  undefined1 auVar477 [16];
  undefined1 auVar494 [16];
  undefined1 auVar500 [16];
  undefined1 auVar501 [16];
  undefined1 auVar502 [16];
  undefined1 auVar504 [16];
  undefined1 auVar505 [16];
  undefined1 auVar506 [16];
  undefined1 auVar510 [16];
  undefined1 auVar522 [16];
  undefined1 auVar523 [16];
  undefined1 auVar524 [16];
  undefined1 auVar530 [16];
  undefined1 auVar531 [16];
  undefined1 auVar532 [16];
  undefined1 auVar533 [16];
  undefined1 auVar534 [16];
  undefined1 auVar535 [16];
  undefined1 auVar536 [16];
  undefined1 auVar537 [16];
  undefined1 auVar538 [16];
  undefined1 auVar542 [16];
  undefined1 auVar543 [16];
  
  local_100.elempack = bottom_blob->elempack;
  local_100.elemsize = bottom_blob->elemsize;
  local_100.data = bottom_blob->data;
  local_100.refcount = bottom_blob->refcount;
  local_100.allocator = bottom_blob->allocator;
  local_100.dims = bottom_blob->dims;
  local_100.w = bottom_blob->w;
  local_100.h = bottom_blob->h;
  local_100.d = bottom_blob->d;
  local_100.c = bottom_blob->c;
  local_100.cstep = bottom_blob->cstep;
  if (local_100.refcount != (int *)0x0) {
    LOCK();
    *local_100.refcount = *local_100.refcount + 1;
    UNLOCK();
  }
  if (local_100.elempack == 0 || ((int)local_100.elemsize * 8) / local_100.elempack != 8) {
    opt_q.lightmode = opt->lightmode;
    opt_q._1_3_ = *(undefined3 *)&opt->field_0x1;
    opt_q.num_threads = opt->num_threads;
    uVar8 = opt->workspace_allocator;
    uVar11 = opt->openmp_blocktime;
    uVar24 = opt->use_winograd_convolution;
    uVar30 = opt->use_sgemm_convolution;
    uVar36 = opt->use_int8_inference;
    uVar42 = opt->use_vulkan_compute;
    uVar39 = CONCAT11(uVar42,uVar36);
    uVar33 = CONCAT21(uVar39,uVar30);
    uVar27 = CONCAT31(uVar33,uVar24);
    auVar286[0] = opt->use_bf16_storage;
    auVar286[1] = opt->use_fp16_packed;
    auVar286[2] = opt->use_fp16_storage;
    auVar286[3] = opt->use_fp16_arithmetic;
    auVar286[4] = opt->use_int8_packed;
    auVar286[5] = opt->use_int8_storage;
    auVar286[6] = opt->use_int8_arithmetic;
    auVar286[7] = opt->use_packing_layout;
    uVar9 = opt->use_shader_pack8;
    uVar12 = opt->use_subgroup_basic;
    uVar16 = opt->use_subgroup_vote;
    uVar20 = opt->use_subgroup_ballot;
    uVar25 = opt->use_subgroup_shuffle;
    uVar31 = opt->use_image_storage;
    uVar37 = opt->use_tensor_storage;
    uVar43 = opt->use_reserved_0;
    uVar40 = CONCAT11(uVar43,uVar37);
    uVar34 = CONCAT21(uVar40,uVar31);
    uVar28 = CONCAT31(uVar34,uVar25);
    uVar22 = CONCAT41(uVar28,uVar20);
    uVar18 = CONCAT51(uVar22,uVar16);
    uVar14 = CONCAT61(uVar18,uVar12);
    auVar286._8_8_ = CONCAT71(uVar14,uVar9);
    auVar418._0_4_ = opt->flush_denormals;
    auVar418[4] = opt->use_local_pool_allocator;
    auVar418[5] = opt->use_shader_local_memory;
    auVar418[6] = opt->use_cooperative_matrix;
    auVar418[7] = opt->use_winograd23_convolution;
    uVar10 = opt->use_winograd43_convolution;
    uVar13 = opt->use_winograd63_convolution;
    uVar17 = opt->use_reserved_6;
    uVar21 = opt->use_reserved_7;
    uVar26 = opt->use_reserved_8;
    uVar32 = opt->use_reserved_9;
    uVar38 = opt->use_reserved_10;
    uVar44 = opt->use_reserved_11;
    uVar41 = CONCAT11(uVar44,uVar38);
    uVar35 = CONCAT21(uVar41,uVar32);
    uVar29 = CONCAT31(uVar35,uVar26);
    uVar23 = CONCAT41(uVar29,uVar21);
    uVar19 = CONCAT51(uVar23,uVar17);
    uVar15 = CONCAT61(uVar19,uVar13);
    auVar418._8_8_ = CONCAT71(uVar15,uVar10);
    opt_q._48_8_ = auVar418._0_8_;
    opt_q._56_4_ = SUB84(auVar418._8_8_,0);
    opt_q._32_8_ = auVar286._0_8_;
    opt_q._40_4_ = SUB84(auVar286._8_8_,0);
    opt_q.workspace_allocator._0_4_ = (undefined4)uVar8;
    opt_q.workspace_allocator._4_4_ = (int)((ulong)uVar8 >> 0x20);
    opt_q.blob_allocator._0_4_ = SUB84(opt->workspace_allocator,0);
    opt_q.blob_allocator._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    opt_q.openmp_blocktime = uVar11;
    opt_q._28_4_ = uVar27;
    opt_q._44_4_ = uVar28;
    opt_q._60_4_ = uVar29;
    quantize_to_int8(bottom_blob,&local_100,
                     (Mat *)(&this->field_0x238 + (long)this->_vptr_Convolution_x86[-3]),&opt_q);
  }
  local_678.cstep = 0;
  local_678.data = (void *)0x0;
  local_678.refcount._0_4_ = 0;
  local_678.refcount._4_4_ = 0;
  local_678.elemsize = 0;
  local_678.elempack = 0;
  local_678.allocator = (Allocator *)0x0;
  local_678.dims = 0;
  local_678.w = 0;
  local_678.h = 0;
  local_678.d = 0;
  local_678.c = 0;
  Convolution::make_padding
            ((Convolution *)
             ((long)&this->_vptr_Convolution_x86 + (long)this->_vptr_Convolution_x86[-3]),&local_100
             ,&local_678,opt);
  iVar259 = local_678.elempack;
  iVar176 = -100;
  if ((local_678.data == (void *)0x0) || (local_678.cstep * (long)local_678.c == 0))
  goto LAB_0019e56f;
  p_Var45 = this->_vptr_Convolution_x86[-3];
  uVar199 = *(uint *)((long)&(this->weight_winograd23_data).h + (long)p_Var45);
  iVar189 = (~((*(int *)((long)&(this->weight_winograd23_data).d + (long)p_Var45) + -1) *
              *(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var45)) + local_678.w) /
            *(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var45 + 4)) + 1;
  iVar185 = (~((*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var45) + -1) *
              *(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var45)) + local_678.h)
            / *(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var45) + 1;
  iVar142 = *(int *)((long)&(this->weight_winograd43_data).allocator + (long)p_Var45);
  if (opt->use_packing_layout == true) {
    if (iVar142 < 0x65) {
      uVar165 = (uint)((uVar199 & 3) == 0) * 3 + 1;
    }
    else {
      uVar165 = 1;
      if ((uVar199 & 7) == 0) {
        uVar165 = 8;
      }
    }
  }
  else {
    uVar165 = 1;
  }
  uVar148 = uVar165 * 4;
  if (100 < iVar142) {
    uVar148 = uVar165;
  }
  local_608 = (short  [4])(long)local_678.c;
  Mat::create(top_blob,iVar189,iVar185,(int)uVar199 / (int)uVar165,(ulong)uVar148,uVar165,
              opt->blob_allocator);
  if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
  goto LAB_0019e56f;
  if (opt->use_packing_layout == true) {
    iVar169 = (uint)((*(byte *)((long)&(this->weight_winograd23_data).h +
                               (long)this->_vptr_Convolution_x86[-3]) & 3) == 0) * 3 + 1;
  }
  else {
    iVar169 = 1;
  }
  local_5f8.cstep = 0;
  local_5f8.data = (void *)0x0;
  local_5f8.refcount._0_4_ = 0;
  local_5f8.refcount._4_4_ = 0;
  local_5f8.elemsize = 0;
  local_5f8.elempack = 0;
  local_5f8.allocator = (Allocator *)0x0;
  local_5f8.dims = 0;
  local_5f8.w = 0;
  local_5f8.h = 0;
  local_5f8.d = 0;
  local_5f8.c = 0;
  local_3f0 = top_blob;
  local_3dc = iVar142;
  Mat::create(&local_5f8,iVar189,iVar185,
              *(int *)((long)&(this->weight_winograd23_data).h +
                      (long)this->_vptr_Convolution_x86[-3]) / iVar169,(ulong)(uint)(iVar169 * 4),
              iVar169,opt->workspace_allocator);
  iVar185 = local_5f8.c;
  uVar148 = local_5f8.h;
  uVar165 = local_5f8.w;
  uVar199 = local_678.c;
  iVar142 = local_678.w;
  iVar176 = -100;
  if ((local_5f8.data != (void *)0x0) && (local_5f8.cstep * (long)local_5f8.c != 0)) {
    if ((iVar259 != 8) || (iVar169 != 4)) goto LAB_0019c1bb;
    p_Var45 = this->_vptr_Convolution_x86[-3];
    uVar190 = *(uint *)((long)&(this->weight_winograd23_data).d + (long)p_Var45);
    uVar135 = (ulong)uVar190;
    if ((uVar190 == 1) && (*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var45) == 1))
    {
      if ((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var45) != 1) ||
         (((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var45) != 1 ||
           (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var45 + 4)) != 1)) ||
          (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var45) != 1)))) {
        if (((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var45) != 1) ||
            (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var45) != 1)) ||
           ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var45 + 4)) != 2 ||
            (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var45) != 2))))
        goto LAB_0019bb29;
        opt_q.lightmode = false;
        opt_q._1_3_ = 0;
        opt_q.num_threads = 0;
        opt_q.blob_allocator._0_4_ = 0;
        opt_q.blob_allocator._4_4_ = 0;
        opt_q.workspace_allocator._0_4_ = 0;
        opt_q.workspace_allocator._4_4_ = 0;
        opt_q.openmp_blocktime = 0;
        opt_q.use_bf16_storage = false;
        opt_q.use_fp16_packed = false;
        opt_q.use_fp16_storage = false;
        opt_q.use_fp16_arithmetic = false;
        opt_q.use_int8_packed = false;
        opt_q.use_int8_storage = false;
        opt_q.use_int8_arithmetic = false;
        opt_q.use_packing_layout = false;
        opt_q.use_shader_pack8 = false;
        opt_q.use_subgroup_basic = false;
        opt_q.use_subgroup_vote = false;
        opt_q.use_subgroup_ballot = false;
        opt_q.use_subgroup_shuffle = false;
        opt_q.use_image_storage = false;
        opt_q.use_tensor_storage = false;
        opt_q.use_reserved_0 = false;
        opt_q.flush_denormals = 0;
        opt_q.use_local_pool_allocator = false;
        opt_q.use_shader_local_memory = false;
        opt_q.use_cooperative_matrix = false;
        opt_q.use_winograd23_convolution = false;
        opt_q.use_winograd43_convolution = false;
        opt_q.use_winograd63_convolution = false;
        opt_q.use_reserved_6 = false;
        opt_q.use_reserved_7 = false;
        Mat::create((Mat *)&opt_q,local_5f8.w,local_5f8.h,local_678.c,local_678.elemsize,
                    local_678.elempack,opt->workspace_allocator);
        uVar160 = 0;
        uVar135 = (ulong)uVar165;
        if ((int)uVar165 < 1) {
          uVar135 = uVar160;
        }
        uVar172 = (ulong)uVar148;
        if ((int)uVar148 < 1) {
          uVar172 = uVar160;
        }
        uVar175 = (ulong)uVar199;
        if ((int)uVar199 < 1) {
          uVar175 = uVar160;
        }
        for (; uVar160 != uVar175; uVar160 = uVar160 + 1) {
          puVar166 = (undefined8 *)
                     (local_678.cstep * uVar160 * local_678.elemsize + (long)local_678.data);
          puVar167 = (undefined8 *)opt_q._0_8_;
          for (iVar176 = 0; uVar192 = uVar135, iVar176 != (int)uVar172; iVar176 = iVar176 + 1) {
            while (iVar185 = (int)uVar192, uVar192 = (ulong)(iVar185 - 1), iVar185 != 0) {
              *puVar167 = *puVar166;
              puVar166 = puVar166 + 2;
              puVar167 = puVar167 + 1;
            }
            puVar166 = puVar166 + (int)((iVar142 - uVar165) * 2);
          }
        }
        conv1x1s1_sgemm_pack8to4_int8_sse((Mat *)&opt_q,&local_5f8,&this->weight_sgemm_data,opt);
        piVar193 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
        if (piVar193 != (int *)0x0) {
          LOCK();
          *piVar193 = *piVar193 + -1;
          UNLOCK();
          if (*piVar193 == 0) {
            if (opt_q._32_8_ == 0) {
LAB_0019e654:
              free((void *)opt_q._0_8_);
            }
            else {
              (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
            }
          }
        }
        goto LAB_0019c1bb;
      }
      conv1x1s1_sgemm_pack8to4_int8_sse(&local_678,&local_5f8,&this->weight_sgemm_data,opt);
    }
    else {
LAB_0019bb29:
      if ((((opt->use_winograd_convolution == true) && (uVar190 == 3)) &&
          (opt->use_winograd43_convolution != false)) &&
         ((((*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var45) == 3 &&
            (*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var45) == 1)) &&
           (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var45) == 1)) &&
          ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var45 + 4)) == 1 &&
           (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var45) == 1)))))) {
        iVar185 = cpu_support_x86_xop();
        iVar142 = local_678.c;
        iVar176 = local_678.elempack;
        if (iVar185 != 0) {
          conv3x3s1_winograd43_pack8to4_int8_sse_xop
                    (&local_678,&local_5f8,&this->weight_winograd43_data,opt);
          goto LAB_0019e48e;
        }
        local_628 = (void *)CONCAT44(local_628._4_4_,local_5f8.c);
        piVar193 = (int *)CONCAT44(local_678.refcount._4_4_,local_678.refcount._0_4_);
        local_558.data = local_678.data;
        local_558.refcount._0_4_ = local_678.refcount._0_4_;
        local_558.refcount._4_4_ = local_678.refcount._4_4_;
        local_558.elemsize = local_678.elemsize;
        local_558.elempack = local_678.elempack;
        local_558.allocator = local_678.allocator;
        local_558.d = local_678.d;
        local_558.h = local_678.h;
        local_558.dims = local_678.dims;
        local_558.w = local_678.w;
        local_558.c = local_678.c;
        local_558.cstep = local_678.cstep;
        if (piVar193 != (int *)0x0) {
          LOCK();
          *piVar193 = *piVar193 + 1;
          UNLOCK();
        }
        local_718._0_4_ = ((uint)((int)(local_5f8.w + 3U) >> 0x1f) >> 0x1e) + local_5f8.w + 3U;
        local_718._4_4_ = ((uint)((int)(local_5f8.h + 3U) >> 0x1f) >> 0x1e) + local_5f8.h + 3U;
        local_718._8_8_ = 0;
        uVar148 = SUB164(_DAT_004c6870 & local_718,0);
        uVar190 = SUB164(_DAT_004c6870 & local_718,4);
        local_600 = (ulong)uVar190;
        copy_make_border(&local_678,&local_558,0,(uVar190 + 2) - local_678.h,0,
                         (uVar148 + 2) - local_678.w,0,0.0,opt);
        uVar199 = (int)local_718._0_4_ >> 2;
        uVar165 = (int)local_718._4_4_ >> 2;
        local_568 = 0;
        local_610._0_4_ = uVar199 * 6;
        iVar185 = uVar199 * 6 * uVar165;
        local_630._0_4_ = iVar185;
        uVar135 = (long)iVar185 / 6;
        d0[0] = 0;
        d0[1] = 0;
        d0[2] = 0;
        d0[3] = 0;
        local_588 = (Allocator *)0x0;
        iStack_580 = 0;
        iStack_57c = 0;
        auStack_578 = SUB1612((undefined1  [16])0x0,4);
        iVar185 = (int)uVar135;
        Mat::create((Mat *)d0,iVar185,0x24,iVar142,(ulong)(uint)(iVar176 * 2),iVar176,
                    opt->workspace_allocator);
        auVar286 = _DAT_004c6910;
        lVar177 = (long)(iVar185 * 8);
        lVar163 = (long)(iVar185 << 4);
        uVar172 = 0;
        local_5b0 = CONCAT44(local_5b0._4_4_,uVar199);
        uVar160 = 0;
        if (0 < (int)uVar199) {
          uVar160 = (ulong)uVar199;
        }
        uVar175 = (ulong)uVar165;
        if ((int)uVar165 < 1) {
          uVar175 = uVar172;
        }
        uVar192 = 0;
        if (0 < iVar142) {
          uVar192 = (ulong)(uint)iVar142;
        }
        for (; uVar172 != uVar192; uVar172 = uVar172 + 1) {
          local_718._0_8_ =
               (long)local_558.data + local_558.cstep * local_558.elemsize * uVar172 + 0x20;
          for (uVar159 = 0; uVar159 != uVar175; uVar159 = uVar159 + 1) {
            pauVar136 = (undefined1 (*) [16])
                        ((long)((local_610._0_4_ * (int)uVar159) / 6) * 0x10 + (long)d0);
            pauVar194 = (undefined1 (*) [16])local_718._0_8_;
            for (uVar174 = 0; pauVar137 = pauVar194, lVar146 = -0x60, uVar174 != uVar160;
                uVar174 = uVar174 + 1) {
              while( true ) {
                sVar312 = auVar286._0_2_;
                sVar486 = auVar286._2_2_;
                sVar392 = auVar286._4_2_;
                sVar393 = auVar286._6_2_;
                sVar525 = auVar286._8_2_;
                sVar484 = auVar286._10_2_;
                sVar397 = auVar286._12_2_;
                sVar429 = auVar286._14_2_;
                pauVar152 = pauVar136;
                lVar187 = 0x50;
                if (lVar146 == 0) break;
                auVar418 = pauVar137[-2];
                auVar244 = pauVar137[-1];
                auVar350 = *pauVar137;
                auVar409._0_14_ = auVar418._0_14_;
                auVar409[0xe] = auVar418[7];
                auVar409[0xf] = -(auVar418[7] < '\0');
                auVar408._14_2_ = auVar409._14_2_;
                auVar408._0_13_ = auVar418._0_13_;
                auVar408[0xd] = -(auVar418[6] < '\0');
                auVar407._13_3_ = auVar408._13_3_;
                auVar407._0_12_ = auVar418._0_12_;
                auVar407[0xc] = auVar418[6];
                auVar406._12_4_ = auVar407._12_4_;
                auVar406._0_11_ = auVar418._0_11_;
                auVar406[0xb] = -(auVar418[5] < '\0');
                auVar405._11_5_ = auVar406._11_5_;
                auVar405._0_10_ = auVar418._0_10_;
                auVar405[10] = auVar418[5];
                auVar404._10_6_ = auVar405._10_6_;
                auVar404._0_9_ = auVar418._0_9_;
                auVar404[9] = -(auVar418[4] < '\0');
                auVar403._9_7_ = auVar404._9_7_;
                auVar403._0_8_ = auVar418._0_8_;
                auVar403[8] = auVar418[4];
                auVar402._8_8_ = auVar403._8_8_;
                auVar402[7] = -(auVar418[3] < '\0');
                auVar402[6] = auVar418[3];
                auVar402[5] = -(auVar418[2] < '\0');
                auVar402[4] = auVar418[2];
                auVar402[3] = -(auVar418[1] < '\0');
                auVar402[2] = auVar418[1];
                auVar402[1] = -(auVar418[0] < '\0');
                auVar402[0] = auVar418[0];
                sVar539 = CONCAT11(-(auVar418[8] < '\0'),auVar418[8]);
                uVar260 = CONCAT13(-(auVar418[9] < '\0'),CONCAT12(auVar418[9],sVar539));
                uVar262 = CONCAT15(-(auVar418[10] < '\0'),CONCAT14(auVar418[10],uVar260));
                uVar263 = CONCAT17(-(auVar418[0xb] < '\0'),CONCAT16(auVar418[0xb],uVar262));
                auVar265._0_10_ = CONCAT19(-(auVar418[0xc] < '\0'),CONCAT18(auVar418[0xc],uVar263));
                auVar265[10] = auVar418[0xd];
                auVar265[0xb] = -(auVar418[0xd] < '\0');
                auVar267[0xc] = auVar418[0xe];
                auVar267._0_12_ = auVar265;
                auVar267[0xd] = -(auVar418[0xe] < '\0');
                auVar278[0xe] = auVar418[0xf];
                auVar278._0_14_ = auVar267;
                auVar278[0xf] = -(auVar418[0xf] < '\0');
                auVar470._0_14_ = auVar244._0_14_;
                auVar470[0xe] = auVar244[7];
                auVar470[0xf] = -(auVar244[7] < '\0');
                auVar469._14_2_ = auVar470._14_2_;
                auVar469._0_13_ = auVar244._0_13_;
                auVar469[0xd] = -(auVar244[6] < '\0');
                auVar468._13_3_ = auVar469._13_3_;
                auVar468._0_12_ = auVar244._0_12_;
                auVar468[0xc] = auVar244[6];
                auVar467._12_4_ = auVar468._12_4_;
                auVar467._0_11_ = auVar244._0_11_;
                auVar467[0xb] = -(auVar244[5] < '\0');
                auVar466._11_5_ = auVar467._11_5_;
                auVar466._0_10_ = auVar244._0_10_;
                auVar466[10] = auVar244[5];
                auVar465._10_6_ = auVar466._10_6_;
                auVar465._0_9_ = auVar244._0_9_;
                auVar465[9] = -(auVar244[4] < '\0');
                auVar464._9_7_ = auVar465._9_7_;
                auVar464._0_8_ = auVar244._0_8_;
                auVar464[8] = auVar244[4];
                Var78 = CONCAT91(CONCAT81(auVar464._8_8_,-(auVar244[3] < '\0')),auVar244[3]);
                auVar98._2_10_ = Var78;
                auVar98[1] = -(auVar244[2] < '\0');
                auVar98[0] = auVar244[2];
                auVar97._2_12_ = auVar98;
                auVar97[1] = -(auVar244[1] < '\0');
                auVar97[0] = auVar244[1];
                sVar361 = CONCAT11(-(auVar244[0] < '\0'),auVar244[0]);
                sVar485 = CONCAT11(-(auVar244[8] < '\0'),auVar244[8]);
                uVar223 = CONCAT13(-(auVar244[9] < '\0'),CONCAT12(auVar244[9],sVar485));
                uVar224 = CONCAT15(-(auVar244[10] < '\0'),CONCAT14(auVar244[10],uVar223));
                uVar225 = CONCAT17(-(auVar244[0xb] < '\0'),CONCAT16(auVar244[0xb],uVar224));
                auVar226._0_10_ = CONCAT19(-(auVar244[0xc] < '\0'),CONCAT18(auVar244[0xc],uVar225));
                auVar226[10] = auVar244[0xd];
                auVar226[0xb] = -(auVar244[0xd] < '\0');
                auVar228[0xc] = auVar244[0xe];
                auVar228._0_12_ = auVar226;
                auVar228[0xd] = -(auVar244[0xe] < '\0');
                auVar239[0xe] = auVar244[0xf];
                auVar239._0_14_ = auVar228;
                auVar239[0xf] = -(auVar244[0xf] < '\0');
                auVar329._0_14_ = auVar350._0_14_;
                auVar329[0xe] = auVar350[7];
                auVar329[0xf] = -(auVar350[7] < '\0');
                auVar328._14_2_ = auVar329._14_2_;
                auVar328._0_13_ = auVar350._0_13_;
                auVar328[0xd] = -(auVar350[6] < '\0');
                auVar327._13_3_ = auVar328._13_3_;
                auVar327._0_12_ = auVar350._0_12_;
                auVar327[0xc] = auVar350[6];
                auVar326._12_4_ = auVar327._12_4_;
                auVar326._0_11_ = auVar350._0_11_;
                auVar326[0xb] = -(auVar350[5] < '\0');
                auVar325._11_5_ = auVar326._11_5_;
                auVar325._0_10_ = auVar350._0_10_;
                auVar325[10] = auVar350[5];
                auVar324._10_6_ = auVar325._10_6_;
                auVar324._0_9_ = auVar350._0_9_;
                auVar324[9] = -(auVar350[4] < '\0');
                auVar323._9_7_ = auVar324._9_7_;
                auVar323._0_8_ = auVar350._0_8_;
                auVar323[8] = auVar350[4];
                Var81 = CONCAT91(CONCAT81(auVar323._8_8_,-(auVar350[3] < '\0')),auVar350[3]);
                auVar100._2_10_ = Var81;
                auVar100[1] = -(auVar350[2] < '\0');
                auVar100[0] = auVar350[2];
                auVar99._2_12_ = auVar100;
                auVar99[1] = -(auVar350[1] < '\0');
                auVar99[0] = auVar350[1];
                sVar317 = CONCAT11(-(auVar350[0] < '\0'),auVar350[0]);
                sVar544 = CONCAT11(-(auVar350[8] < '\0'),auVar350[8]);
                uVar291 = CONCAT13(-(auVar350[9] < '\0'),CONCAT12(auVar350[9],sVar544));
                uVar294 = CONCAT15(-(auVar350[10] < '\0'),CONCAT14(auVar350[10],uVar291));
                uVar295 = CONCAT17(-(auVar350[0xb] < '\0'),CONCAT16(auVar350[0xb],uVar294));
                auVar296._0_10_ = CONCAT19(-(auVar350[0xc] < '\0'),CONCAT18(auVar350[0xc],uVar295));
                auVar296[10] = auVar350[0xd];
                auVar296[0xb] = -(auVar350[0xd] < '\0');
                auVar300[0xc] = auVar350[0xe];
                auVar300._0_12_ = auVar296;
                auVar300[0xd] = -(auVar350[0xe] < '\0');
                auVar302[0xe] = auVar350[0xf];
                auVar302._0_14_ = auVar300;
                auVar302[0xf] = -(auVar350[0xf] < '\0');
                auVar418 = psllw(auVar402,2);
                sVar353 = auVar99._0_2_;
                sVar354 = auVar100._0_2_;
                sVar355 = (short)Var81;
                sVar356 = auVar323._8_2_;
                sVar358 = auVar325._10_2_;
                sVar359 = auVar327._12_2_;
                auVar442._0_2_ = sVar539 - sVar361;
                sVar450 = (short)((uint)uVar260 >> 0x10);
                sVar389 = auVar97._0_2_;
                auVar442._2_2_ = sVar450 - sVar389;
                sVar451 = (short)((uint6)uVar262 >> 0x20);
                sVar390 = auVar98._0_2_;
                auVar442._4_2_ = sVar451 - sVar390;
                sVar453 = (short)((ulong)uVar263 >> 0x30);
                sVar391 = (short)Var78;
                auVar442._6_2_ = sVar453 - sVar391;
                sVar454 = (short)((unkuint10)auVar265._0_10_ >> 0x40);
                sVar394 = auVar464._8_2_;
                auVar442._8_2_ = sVar454 - sVar394;
                sVar456 = auVar265._10_2_;
                sVar395 = auVar466._10_2_;
                auVar442._10_2_ = sVar456 - sVar395;
                sVar457 = auVar267._12_2_;
                sVar459 = auVar278._14_2_;
                sVar396 = auVar468._12_2_;
                auVar442._12_2_ = sVar457 - sVar396;
                auVar442._14_2_ = sVar459 - auVar469._14_2_;
                in_XMM8._0_2_ = sVar361 * sVar312 + auVar418._0_2_ + sVar317;
                in_XMM8._2_2_ = sVar389 * sVar486 + auVar418._2_2_ + sVar353;
                in_XMM8._4_2_ = sVar390 * sVar392 + auVar418._4_2_ + sVar354;
                in_XMM8._6_2_ = sVar391 * sVar393 + auVar418._6_2_ + sVar355;
                in_XMM8._8_2_ = sVar394 * sVar525 + auVar418._8_2_ + sVar356;
                in_XMM8._10_2_ = sVar395 * sVar484 + auVar418._10_2_ + sVar358;
                in_XMM8._12_2_ = sVar396 * sVar397 + auVar418._12_2_ + sVar359;
                in_XMM8._14_2_ = auVar469._14_2_ * sVar429 + auVar418._14_2_ + auVar328._14_2_;
                sVar507 = (short)((uint)uVar223 >> 0x10);
                sVar518 = (short)((uint6)uVar224 >> 0x20);
                sVar508 = (short)((ulong)uVar225 >> 0x30);
                sVar255 = (short)((unkuint10)auVar226._0_10_ >> 0x40);
                sVar257 = auVar226._10_2_;
                sVar258 = auVar228._12_2_;
                sVar526 = auVar239._14_2_;
                auVar495._0_2_ = sVar361 + sVar539;
                auVar495._2_2_ = sVar389 + sVar450;
                auVar495._4_2_ = sVar390 + sVar451;
                auVar495._6_2_ = sVar391 + sVar453;
                auVar495._8_2_ = sVar394 + sVar454;
                auVar495._10_2_ = sVar395 + sVar456;
                auVar495._12_2_ = sVar396 + sVar457;
                auVar495._14_2_ = auVar469._14_2_ + sVar459;
                auVar418 = psllw(auVar495,2);
                auVar372._0_2_ = (sVar317 + sVar485) - auVar418._0_2_;
                auVar372._2_2_ = (sVar353 + sVar507) - auVar418._2_2_;
                auVar372._4_2_ = (sVar354 + sVar518) - auVar418._4_2_;
                auVar372._6_2_ = (sVar355 + sVar508) - auVar418._6_2_;
                auVar372._8_2_ = (sVar356 + sVar255) - auVar418._8_2_;
                auVar372._10_2_ = (sVar358 + sVar257) - auVar418._10_2_;
                auVar372._12_2_ = (sVar359 + sVar258) - auVar418._12_2_;
                auVar372._14_2_ = (auVar328._14_2_ + sVar526) - auVar418._14_2_;
                auVar418 = psllw(auVar442,2);
                in_XMM7._0_2_ = auVar418._0_2_ + (sVar317 - sVar485);
                in_XMM7._2_2_ = auVar418._2_2_ + (sVar353 - sVar507);
                in_XMM7._4_2_ = auVar418._4_2_ + (sVar354 - sVar518);
                in_XMM7._6_2_ = auVar418._6_2_ + (sVar355 - sVar508);
                in_XMM7._8_2_ = auVar418._8_2_ + (sVar356 - sVar255);
                in_XMM7._10_2_ = auVar418._10_2_ + (sVar358 - sVar257);
                in_XMM7._12_2_ = auVar418._12_2_ + (sVar359 - sVar258);
                in_XMM7._14_2_ = auVar418._14_2_ + (auVar328._14_2_ - sVar526);
                auVar496._0_2_ = (sVar317 - sVar361) + (sVar539 - sVar485) * -2;
                auVar496._2_2_ = (sVar353 - sVar389) + (sVar450 - sVar507) * -2;
                auVar496._4_2_ = (sVar354 - sVar390) + (sVar451 - sVar518) * -2;
                auVar496._6_2_ = (sVar355 - sVar391) + (sVar453 - sVar508) * -2;
                auVar496._8_2_ = (sVar356 - sVar394) + (sVar454 - sVar255) * -2;
                auVar496._10_2_ = (sVar358 - sVar395) + (sVar456 - sVar257) * -2;
                auVar496._12_2_ = (sVar359 - sVar396) + (sVar457 - sVar258) * -2;
                auVar496._14_2_ = (auVar328._14_2_ - auVar469._14_2_) + (sVar459 - sVar526) * -2;
                auVar418 = psllw(auVar278,2);
                auVar240._0_2_ = sVar485 * sVar312 + auVar418._0_2_ + sVar544;
                auVar240._2_2_ = sVar507 * sVar486 + auVar418._2_2_ + (short)((uint)uVar291 >> 0x10)
                ;
                auVar240._4_2_ =
                     sVar518 * sVar392 + auVar418._4_2_ + (short)((uint6)uVar294 >> 0x20);
                auVar240._6_2_ =
                     sVar508 * sVar393 + auVar418._6_2_ + (short)((ulong)uVar295 >> 0x30);
                auVar240._8_2_ =
                     sVar255 * sVar525 +
                     auVar418._8_2_ + (short)((unkuint10)auVar296._0_10_ >> 0x40);
                auVar240._10_2_ = sVar257 * sVar484 + auVar418._10_2_ + auVar296._10_2_;
                auVar240._12_2_ = sVar258 * sVar397 + auVar418._12_2_ + auVar300._12_2_;
                auVar240._14_2_ = sVar526 * sVar429 + auVar418._14_2_ + auVar302._14_2_;
                *(undefined1 (*) [16])((long)aiStack_368 + lVar146) = in_XMM8;
                *(undefined1 (*) [16])((long)aiStack_308 + lVar146) = auVar372;
                *(undefined1 (*) [16])((long)aiStack_2a8 + lVar146) = in_XMM7;
                *(undefined1 (*) [16])((long)asStack_248 + lVar146) = auVar496;
                *(short *)((long)asStack_248 + lVar146 + 0x60) =
                     (sVar539 - sVar485) * 2 + (sVar317 - sVar361);
                *(short *)((long)asStack_248 + lVar146 + 0x62) =
                     (sVar450 - sVar507) * 2 + (sVar353 - sVar389);
                *(short *)((long)asStack_248 + lVar146 + 100) =
                     (sVar451 - sVar518) * 2 + (sVar354 - sVar390);
                *(short *)((long)asStack_248 + lVar146 + 0x66) =
                     (sVar453 - sVar508) * 2 + (sVar355 - sVar391);
                *(short *)((long)asStack_248 + lVar146 + 0x68) =
                     (sVar454 - sVar255) * 2 + (sVar356 - sVar394);
                *(short *)((long)asStack_248 + lVar146 + 0x6a) =
                     (sVar456 - sVar257) * 2 + (sVar358 - sVar395);
                *(short *)((long)asStack_248 + lVar146 + 0x6c) =
                     (sVar457 - sVar258) * 2 + (sVar359 - sVar396);
                *(short *)((long)asStack_248 + lVar146 + 0x6e) =
                     (sVar459 - sVar526) * 2 + (auVar328._14_2_ - auVar469._14_2_);
                *(undefined1 (*) [16])((long)&local_188 + lVar146) = auVar240;
                pauVar137 = (undefined1 (*) [16])(*pauVar137 + (int)((uVar148 + 2) * 8));
                lVar146 = lVar146 + 0x10;
              }
              for (; lVar187 != 0x290; lVar187 = lVar187 + 0x60) {
                auVar418 = *(undefined1 (*) [16])((long)&local_408 + lVar187);
                sVar485 = *(short *)((long)&local_3f8 + lVar187);
                sVar507 = *(short *)((long)&local_3f8 + lVar187 + 2);
                sVar518 = *(short *)((long)&local_3f8 + lVar187 + 4);
                sVar508 = *(short *)((long)&local_3f8 + lVar187 + 6);
                sVar255 = *(short *)((long)&local_3f0 + lVar187);
                sVar257 = *(short *)((long)&local_3f0 + lVar187 + 2);
                sVar258 = *(short *)((long)&local_3f0 + lVar187 + 4);
                sVar526 = *(short *)((long)&local_3f0 + lVar187 + 6);
                sVar539 = *(short *)((long)w1 + lVar187);
                sVar544 = *(short *)((long)w1 + lVar187 + 2);
                sVar317 = *(short *)((long)w1 + lVar187 + 4);
                sVar353 = *(short *)((long)w1 + lVar187 + 6);
                sVar354 = *(short *)((long)&uStack_3d0 + lVar187);
                sVar355 = *(short *)((long)&uStack_3d0 + lVar187 + 2);
                sVar356 = *(short *)((long)&uStack_3cc + lVar187);
                sVar358 = *(short *)((long)&uStack_3cc + lVar187 + 2);
                auVar244 = psllw(*(undefined1 (*) [16])((long)w2 + lVar187),2);
                sVar361 = auVar418._0_2_;
                auVar373._0_2_ = sVar361 - sVar485;
                sVar389 = auVar418._2_2_;
                auVar373._2_2_ = sVar389 - sVar507;
                sVar390 = auVar418._4_2_;
                auVar373._4_2_ = sVar390 - sVar518;
                sVar391 = auVar418._6_2_;
                auVar373._6_2_ = sVar391 - sVar508;
                sVar394 = auVar418._8_2_;
                auVar373._8_2_ = sVar394 - sVar255;
                sVar395 = auVar418._10_2_;
                auVar373._10_2_ = sVar395 - sVar257;
                sVar396 = auVar418._12_2_;
                sVar398 = auVar418._14_2_;
                auVar373._12_2_ = sVar396 - sVar258;
                auVar373._14_2_ = sVar398 - sVar526;
                auVar241._0_2_ = auVar244._0_2_ + sVar539 + sVar485 * sVar312;
                auVar241._2_2_ = auVar244._2_2_ + sVar544 + sVar507 * sVar486;
                auVar241._4_2_ = auVar244._4_2_ + sVar317 + sVar518 * sVar392;
                auVar241._6_2_ = auVar244._6_2_ + sVar353 + sVar508 * sVar393;
                auVar241._8_2_ = auVar244._8_2_ + sVar354 + sVar255 * sVar525;
                auVar241._10_2_ = auVar244._10_2_ + sVar355 + sVar257 * sVar484;
                auVar241._12_2_ = auVar244._12_2_ + sVar356 + sVar258 * sVar397;
                auVar241._14_2_ = auVar244._14_2_ + sVar358 + sVar526 * sVar429;
                sVar359 = *(short *)((long)&uStack_3e8 + lVar187);
                sVar450 = *(short *)((long)&uStack_3e8 + lVar187 + 2);
                sVar451 = *(short *)((long)&local_3e4 + lVar187);
                sVar453 = *(short *)((long)&local_3e4 + lVar187 + 2);
                sVar454 = *(short *)((long)&local_3e0 + lVar187);
                sVar456 = *(short *)((long)&local_3e0 + lVar187 + 2);
                sVar457 = *(short *)((long)w1 + lVar187 + -4);
                sVar459 = *(short *)((long)w1 + lVar187 + -2);
                auVar443._0_2_ = sVar485 + sVar361;
                auVar443._2_2_ = sVar507 + sVar389;
                auVar443._4_2_ = sVar518 + sVar390;
                auVar443._6_2_ = sVar508 + sVar391;
                auVar443._8_2_ = sVar255 + sVar394;
                auVar443._10_2_ = sVar257 + sVar395;
                auVar443._12_2_ = sVar258 + sVar396;
                auVar443._14_2_ = sVar526 + sVar398;
                auVar244 = psllw(auVar443,2);
                auVar303._0_2_ = (sVar539 + sVar359) - auVar244._0_2_;
                auVar303._2_2_ = (sVar544 + sVar450) - auVar244._2_2_;
                auVar303._4_2_ = (sVar317 + sVar451) - auVar244._4_2_;
                auVar303._6_2_ = (sVar353 + sVar453) - auVar244._6_2_;
                auVar303._8_2_ = (sVar354 + sVar454) - auVar244._8_2_;
                auVar303._10_2_ = (sVar355 + sVar456) - auVar244._10_2_;
                auVar303._12_2_ = (sVar356 + sVar457) - auVar244._12_2_;
                auVar303._14_2_ = (sVar358 + sVar459) - auVar244._14_2_;
                auVar244 = psllw(auVar373,2);
                auVar374._0_2_ = auVar244._0_2_ + (sVar539 - sVar359);
                auVar374._2_2_ = auVar244._2_2_ + (sVar544 - sVar450);
                auVar374._4_2_ = auVar244._4_2_ + (sVar317 - sVar451);
                auVar374._6_2_ = auVar244._6_2_ + (sVar353 - sVar453);
                auVar374._8_2_ = auVar244._8_2_ + (sVar354 - sVar454);
                auVar374._10_2_ = auVar244._10_2_ + (sVar355 - sVar456);
                auVar374._12_2_ = auVar244._12_2_ + (sVar356 - sVar457);
                auVar374._14_2_ = auVar244._14_2_ + (sVar358 - sVar459);
                in_XMM8._0_2_ = (sVar539 - sVar485) + (sVar361 - sVar359) * -2;
                in_XMM8._2_2_ = (sVar544 - sVar507) + (sVar389 - sVar450) * -2;
                in_XMM8._4_2_ = (sVar317 - sVar518) + (sVar390 - sVar451) * -2;
                in_XMM8._6_2_ = (sVar353 - sVar508) + (sVar391 - sVar453) * -2;
                in_XMM8._8_2_ = (sVar354 - sVar255) + (sVar394 - sVar454) * -2;
                in_XMM8._10_2_ = (sVar355 - sVar257) + (sVar395 - sVar456) * -2;
                in_XMM8._12_2_ = (sVar356 - sVar258) + (sVar396 - sVar457) * -2;
                in_XMM8._14_2_ = (sVar358 - sVar526) + (sVar398 - sVar459) * -2;
                in_XMM7._0_2_ = (sVar361 - sVar359) * 2 + (sVar539 - sVar485);
                in_XMM7._2_2_ = (sVar389 - sVar450) * 2 + (sVar544 - sVar507);
                in_XMM7._4_2_ = (sVar390 - sVar451) * 2 + (sVar317 - sVar518);
                in_XMM7._6_2_ = (sVar391 - sVar453) * 2 + (sVar353 - sVar508);
                in_XMM7._8_2_ = (sVar394 - sVar454) * 2 + (sVar354 - sVar255);
                in_XMM7._10_2_ = (sVar395 - sVar456) * 2 + (sVar355 - sVar257);
                in_XMM7._12_2_ = (sVar396 - sVar457) * 2 + (sVar356 - sVar258);
                in_XMM7._14_2_ = (sVar398 - sVar459) * 2 + (sVar358 - sVar526);
                auVar418 = psllw(auVar418,2);
                sVar485 = *(short *)(&opt_q.lightmode + lVar187);
                sVar507 = *(short *)(&opt_q.field_0x2 + lVar187);
                sVar518 = *(short *)((long)&opt_q.num_threads + lVar187);
                sVar508 = *(short *)((long)&opt_q.num_threads + lVar187 + 2);
                sVar255 = *(short *)((long)&opt_q.blob_allocator + lVar187);
                sVar257 = *(short *)((long)&opt_q.blob_allocator + lVar187 + 2);
                sVar258 = *(short *)((long)&opt_q.blob_allocator + lVar187 + 4);
                sVar526 = *(short *)((long)&opt_q.blob_allocator + lVar187 + 6);
                *pauVar152 = auVar241;
                *(undefined1 (*) [16])(*pauVar152 + lVar177 * 2) = auVar303;
                *(undefined1 (*) [16])(*pauVar152 + lVar163 * 2) = auVar374;
                *(undefined1 (*) [16])(*pauVar152 + (long)(iVar185 * 0x18) * 2) = in_XMM8;
                *(undefined1 (*) [16])(*pauVar152 + (long)(iVar185 << 5) * 2) = in_XMM7;
                psVar1 = (short *)(*pauVar152 + (long)(iVar185 * 0x28) * 2);
                *psVar1 = sVar359 * sVar312 + auVar418._0_2_ + sVar485;
                psVar1[1] = sVar450 * sVar486 + auVar418._2_2_ + sVar507;
                psVar1[2] = sVar451 * sVar392 + auVar418._4_2_ + sVar518;
                psVar1[3] = sVar453 * sVar393 + auVar418._6_2_ + sVar508;
                psVar1[4] = sVar454 * sVar525 + auVar418._8_2_ + sVar255;
                psVar1[5] = sVar456 * sVar484 + auVar418._10_2_ + sVar257;
                psVar1[6] = sVar457 * sVar397 + auVar418._12_2_ + sVar258;
                psVar1[7] = sVar459 * sVar429 + auVar418._14_2_ + sVar526;
                pauVar152 = (undefined1 (*) [16])(*pauVar152 + (long)(iVar185 * 0x30) * 2);
              }
              pauVar194 = pauVar194 + 2;
              pauVar136 = pauVar136 + 1;
            }
            local_718._0_8_ =
                 (undefined1 *)local_718._0_8_ + (long)local_558.w * local_558.elemsize * 4;
          }
        }
        piVar193 = (int *)CONCAT44(local_558.refcount._4_4_,local_558.refcount._0_4_);
        if (piVar193 != (int *)0x0) {
          LOCK();
          *piVar193 = *piVar193 + -1;
          UNLOCK();
          if (*piVar193 == 0) {
            if (local_558.allocator == (Allocator *)0x0) {
              free(local_558.data);
            }
            else {
              (*(local_558.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_558.cstep = 0;
        local_558.data = (void *)0x0;
        local_558.refcount._0_4_ = 0;
        local_558.refcount._4_4_ = 0;
        local_558.elemsize = 0;
        local_558.elempack = 0;
        local_558.h = 0;
        local_558.d = 0;
        local_558.c = 0;
        local_558.allocator = (Allocator *)0x0;
        local_558.dims = 0;
        local_558.w = 0;
        d1[0] = 0;
        d1[1] = 0;
        d1[2] = 0;
        d1[3] = 0;
        opt_q.workspace_allocator._0_4_ = 0;
        opt_q.workspace_allocator._4_4_ = 0;
        opt_q.openmp_blocktime = 0;
        opt_q.lightmode = false;
        opt_q._1_3_ = 0;
        opt_q.num_threads = 0;
        opt_q.blob_allocator._0_4_ = 0;
        opt_q.blob_allocator._4_4_ = 0;
        opt_q.flush_denormals = 0;
        opt_q.use_local_pool_allocator = false;
        opt_q.use_shader_local_memory = false;
        opt_q.use_cooperative_matrix = false;
        opt_q.use_winograd23_convolution = false;
        opt_q.use_winograd43_convolution = false;
        opt_q.use_winograd63_convolution = false;
        opt_q.use_reserved_6 = false;
        opt_q.use_reserved_7 = false;
        iVar189 = 0;
        if (0xb < (int)local_630._0_4_) {
          iVar189 = (int)((uVar135 & 0xffffffff) >> 1);
        }
        opt_q.use_bf16_storage = false;
        opt_q.use_fp16_packed = false;
        opt_q.use_fp16_storage = false;
        opt_q.use_fp16_arithmetic = false;
        opt_q.use_int8_packed = false;
        opt_q.use_int8_storage = false;
        opt_q.use_int8_arithmetic = false;
        opt_q.use_packing_layout = false;
        opt_q.use_shader_pack8 = false;
        opt_q.use_subgroup_basic = false;
        opt_q.use_subgroup_vote = false;
        opt_q.use_subgroup_ballot = false;
        opt_q.use_subgroup_shuffle = false;
        opt_q.use_image_storage = false;
        opt_q.use_tensor_storage = false;
        opt_q.use_reserved_0 = false;
        Mat::create((Mat *)&opt_q,iVar142 << (0xb < (int)local_630._0_4_),iVar185 - iVar189,0x24,
                    (ulong)(uint)(iVar176 * 2),iVar176,opt->workspace_allocator);
        lVar146 = (long)iVar185;
        for (lVar187 = 0; lVar187 != 0x24; lVar187 = lVar187 + 1) {
          lVar178 = (long)(int)opt_q._44_4_ *
                    CONCAT44(opt_q.workspace_allocator._4_4_,opt_q.workspace_allocator._0_4_);
          for (uVar135 = 0; (long)(uVar135 | 1) < lVar146; uVar135 = uVar135 + 2) {
            puVar167 = (undefined8 *)((uVar135 >> 1) * lVar178 + opt_q._0_8_);
            puVar166 = (undefined8 *)((uVar135 + lVar187 * lVar146) * 0x10 + (long)d0);
            uVar172 = uVar192;
            while (iVar176 = (int)uVar172, uVar172 = (ulong)(iVar176 - 1), iVar176 != 0) {
              uVar225 = puVar166[1];
              auVar286 = *(undefined1 (*) [16])(puVar166 + 2);
              *puVar167 = *puVar166;
              puVar167[1] = uVar225;
              *(undefined1 (*) [16])(puVar167 + 2) = auVar286;
              puVar166 = puVar166 + local_568 * 2;
              puVar167 = puVar167 + 4;
            }
          }
          for (; (long)uVar135 < lVar146; uVar135 = uVar135 + 1) {
            puVar167 = (undefined8 *)
                       ((ulong)(((uint)uVar135 & 1) + ((uint)(uVar135 >> 1) & 0x7fffffff)) * lVar178
                       + opt_q._0_8_);
            puVar166 = (undefined8 *)((uVar135 + lVar187 * lVar146) * 0x10 + (long)d0);
            uVar172 = uVar192;
            while (iVar176 = (int)uVar172, uVar172 = (ulong)(iVar176 - 1), iVar176 != 0) {
              uVar225 = puVar166[1];
              *puVar167 = *puVar166;
              puVar167[1] = uVar225;
              puVar166 = puVar166 + local_568 * 2;
              puVar167 = puVar167 + 2;
            }
          }
        }
        local_568 = 0;
        d0[0] = 0;
        d0[1] = 0;
        d0[2] = 0;
        d0[3] = 0;
        auStack_578 = SUB1612((undefined1  [16])0x0,4);
        local_588 = (Allocator *)0x0;
        iStack_580 = 0;
        iStack_57c = 0;
        Mat::create((Mat *)d1,iVar185,0x24,(int)local_628,0x10,4,opt->workspace_allocator);
        local_620 = (short  [4])0x0;
        uVar135 = 0;
        auVar210 = extraout_XMM0;
        if (0 < (int)local_628) {
          local_620 = (short  [4])((ulong)local_628 & 0xffffffff);
        }
        while (uVar172 = uVar135, (short  [4])uVar172 != local_620) {
          sVar184 = (this->weight_winograd43_data).elemsize;
          local_630 = (short  [4])((long)(this->weight_winograd43_data).w * sVar184);
          pvVar162 = (void *)(sVar184 * (this->weight_winograd43_data).cstep * uVar172 +
                             (long)(this->weight_winograd43_data).data);
          asVar173 = d1;
          for (lVar187 = 0; lVar187 != 0x24; lVar187 = lVar187 + 1) {
            lVar178 = opt_q._0_8_;
            for (uVar135 = 0; (long)(uVar135 | 1) < lVar146; uVar135 = uVar135 + 2) {
              auVar499 = (undefined1  [16])0x0;
              lVar154 = 0;
              iVar142 = 0;
              iVar189 = 0;
              iVar141 = 0;
              iVar176 = 0;
              auVar378 = (undefined1  [16])0x0;
              iVar256 = 0;
              iVar292 = 0;
              iVar310 = 0;
              iVar313 = 0;
              uVar159 = uVar192;
              while( true ) {
                iVar315 = (int)uVar159;
                uVar159 = (ulong)(iVar315 - 1);
                iVar261 = auVar499._4_4_;
                iVar288 = auVar499._8_4_;
                iVar289 = auVar499._12_4_;
                if (iVar315 == 0) break;
                auVar286 = *(undefined1 (*) [16])(lVar178 + lVar154);
                auVar418 = *(undefined1 (*) [16])(lVar178 + 0x10 + lVar154);
                auVar244 = *(undefined1 (*) [16])((long)pvVar162 + lVar154 * 2);
                auVar350 = *(undefined1 (*) [16])((long)pvVar162 + lVar154 * 2 + 0x10);
                auVar388 = *(undefined1 (*) [16])((long)pvVar162 + lVar154 * 2 + 0x20);
                sVar392 = auVar286._6_2_;
                auVar248._0_12_ = auVar286._0_12_;
                auVar248._12_2_ = sVar392;
                auVar248._14_2_ = sVar392;
                auVar247._12_4_ = auVar248._12_4_;
                auVar247._0_10_ = auVar286._0_10_;
                sVar486 = auVar286._4_2_;
                auVar247._10_2_ = sVar486;
                auVar246._10_6_ = auVar247._10_6_;
                auVar246._0_8_ = auVar286._0_8_;
                auVar246._8_2_ = sVar486;
                auVar212 = pshuflw(auVar210,auVar286,0x50);
                sVar525 = auVar286._8_2_;
                uVar223 = CONCAT22(sVar525,sVar525);
                sVar484 = auVar286._10_2_;
                auVar363._0_8_ = CONCAT26(sVar484,CONCAT24(sVar484,uVar223));
                sVar397 = auVar286._12_2_;
                auVar363._8_2_ = sVar397;
                auVar363._10_2_ = sVar397;
                auVar379._14_2_ = auVar286._14_2_;
                auVar379._12_2_ = auVar379._14_2_;
                auVar379._0_12_ = auVar363;
                sVar518 = auVar418._6_2_;
                auVar421._0_12_ = auVar418._0_12_;
                auVar421._12_2_ = sVar518;
                auVar421._14_2_ = sVar518;
                auVar420._12_4_ = auVar421._12_4_;
                auVar420._0_10_ = auVar418._0_10_;
                sVar507 = auVar418._4_2_;
                auVar420._10_2_ = sVar507;
                auVar419._10_6_ = auVar420._10_6_;
                auVar419._0_8_ = auVar418._0_8_;
                auVar419._8_2_ = sVar507;
                auVar480 = pshuflw(in_XMM8,auVar418,0x50);
                sVar255 = auVar418._8_2_;
                uVar291 = CONCAT22(sVar255,sVar255);
                sVar257 = auVar418._10_2_;
                auVar488._0_8_ = CONCAT26(sVar257,CONCAT24(sVar257,uVar291));
                sVar258 = auVar418._12_2_;
                auVar488._8_2_ = sVar258;
                auVar488._10_2_ = sVar258;
                auVar500._14_2_ = auVar418._14_2_;
                auVar500._12_2_ = auVar500._14_2_;
                auVar500._0_12_ = auVar488;
                auVar337._4_4_ = auVar212._0_4_;
                auVar337._0_4_ = auVar212._0_4_;
                auVar337._8_4_ = auVar212._4_4_;
                auVar337._12_4_ = auVar212._4_4_;
                sVar312 = auVar244._6_2_ * auVar212._2_2_;
                auVar344 = pmulhw(auVar337,auVar244);
                auVar478._0_4_ = auVar480._0_4_;
                auVar478._4_4_ = auVar478._0_4_;
                auVar478._8_4_ = auVar480._4_4_;
                auVar478._12_4_ = auVar480._4_4_;
                sVar539 = auVar244._6_2_ * auVar480._2_2_;
                auVar285 = pmulhw(auVar244,auVar478);
                auVar249._4_4_ = auVar246._8_4_;
                auVar249._0_4_ = auVar246._8_4_;
                auVar249._8_4_ = auVar247._12_4_;
                auVar249._12_4_ = auVar247._12_4_;
                sVar544 = auVar350._6_2_ * sVar486;
                auVar252 = pmulhw(auVar249,auVar350);
                auVar422._4_4_ = auVar419._8_4_;
                auVar422._0_4_ = auVar419._8_4_;
                auVar422._8_4_ = auVar420._12_4_;
                auVar422._12_4_ = auVar420._12_4_;
                sVar526 = auVar350._6_2_ * sVar507;
                auVar447 = pmulhw(auVar350,auVar422);
                uVar260 = (undefined4)((ulong)auVar363._0_8_ >> 0x20);
                auVar545._4_4_ = uVar223;
                auVar545._0_4_ = uVar223;
                auVar545._8_4_ = uVar260;
                auVar545._12_4_ = uVar260;
                sVar485 = auVar388._6_2_ * sVar525;
                auVar547 = pmulhw(auVar545,auVar388);
                uVar223 = (undefined4)((ulong)auVar488._0_8_ >> 0x20);
                auVar511._4_4_ = uVar291;
                auVar511._0_4_ = uVar291;
                auVar511._8_4_ = uVar223;
                auVar511._12_4_ = uVar223;
                sVar429 = auVar388._6_2_ * sVar255;
                in_XMM7 = pmulhw(auVar388,auVar511);
                auVar208._4_4_ = auVar363._8_4_;
                auVar208._0_4_ = auVar363._8_4_;
                auVar208._8_4_ = auVar379._12_4_;
                auVar208._12_4_ = auVar379._12_4_;
                auVar286 = *(undefined1 (*) [16])((long)pvVar162 + lVar154 * 2 + 0x30);
                sVar393 = auVar286._6_2_ * sVar397;
                auVar418 = pmulhw(auVar208,auVar286);
                auVar209._4_4_ = auVar488._8_4_;
                auVar209._0_4_ = auVar488._8_4_;
                auVar209._8_4_ = auVar500._12_4_;
                auVar209._12_4_ = auVar500._12_4_;
                sVar508 = auVar286._6_2_ * sVar258;
                auVar515 = pmulhw(auVar286,auVar209);
                iVar315 = CONCAT22(auVar344._6_2_,sVar312);
                Var78 = CONCAT64(CONCAT42(iVar315,auVar344._4_2_),
                                 CONCAT22(auVar244._4_2_ * auVar212._0_2_,sVar312));
                auVar105._4_8_ = (long)((unkuint10)Var78 >> 0x10);
                auVar105._2_2_ = auVar344._2_2_;
                auVar105._0_2_ = auVar244._2_2_ * auVar212._2_2_;
                local_718._0_4_ = CONCAT22(auVar344._8_2_,auVar244._8_2_ * auVar212._4_2_);
                auVar298._0_8_ =
                     CONCAT26(auVar344._10_2_,
                              CONCAT24(auVar244._10_2_ * auVar212._6_2_,local_718._0_4_));
                auVar298._8_2_ = auVar244._12_2_ * auVar212._4_2_;
                auVar298._10_2_ = auVar344._12_2_;
                auVar306._12_2_ = auVar244._14_2_ * auVar212._6_2_;
                auVar306._0_12_ = auVar298;
                auVar306._14_2_ = auVar344._14_2_;
                local_718._0_4_ = auVar378._0_4_ + local_718._0_4_;
                local_718._4_4_ = auVar378._4_4_ + (int)((ulong)auVar298._0_8_ >> 0x20);
                local_718._8_4_ = auVar378._8_4_ + auVar298._8_4_;
                local_718._12_4_ = auVar378._12_4_ + auVar306._12_4_;
                iVar290 = CONCAT22(auVar285._6_2_,sVar539);
                Var81 = CONCAT64(CONCAT42(iVar290,auVar285._4_2_),
                                 CONCAT22(auVar244._4_2_ * auVar480._0_2_,sVar539));
                auVar106._4_8_ = (long)((unkuint10)Var81 >> 0x10);
                auVar106._2_2_ = auVar285._2_2_;
                auVar106._0_2_ = auVar244._2_2_ * auVar480._2_2_;
                iVar360 = CONCAT22(auVar285._8_2_,auVar244._8_2_ * auVar480._4_2_);
                auVar527._0_8_ =
                     CONCAT26(auVar285._10_2_,CONCAT24(auVar244._10_2_ * auVar480._6_2_,iVar360));
                auVar527._8_2_ = auVar244._12_2_ * auVar480._4_2_;
                auVar527._10_2_ = auVar285._12_2_;
                auVar537._12_2_ = auVar244._14_2_ * auVar480._6_2_;
                auVar537._0_12_ = auVar527;
                auVar537._14_2_ = auVar285._14_2_;
                iVar293 = CONCAT22(auVar252._6_2_,sVar544);
                Var84 = CONCAT64(CONCAT42(iVar293,auVar252._4_2_),
                                 CONCAT22(auVar350._4_2_ * sVar486,sVar544));
                auVar107._4_8_ = (long)((unkuint10)Var84 >> 0x10);
                auVar107._2_2_ = auVar252._2_2_;
                auVar107._0_2_ = auVar350._2_2_ * sVar486;
                iVar430 = CONCAT22(auVar252._8_2_,auVar350._8_2_ * sVar392);
                auVar540._0_8_ =
                     CONCAT26(auVar252._10_2_,CONCAT24(auVar350._10_2_ * sVar392,iVar430));
                auVar540._8_2_ = auVar350._12_2_ * sVar392;
                auVar540._10_2_ = auVar252._12_2_;
                auVar542._12_2_ = auVar350._14_2_ * sVar392;
                auVar542._0_12_ = auVar540;
                auVar542._14_2_ = auVar252._14_2_;
                iVar311 = CONCAT22(auVar447._6_2_,sVar526);
                Var132 = CONCAT64(CONCAT42(iVar311,auVar447._4_2_),
                                  CONCAT22(auVar350._4_2_ * sVar507,sVar526));
                auVar108._4_8_ = (long)((unkuint10)Var132 >> 0x10);
                auVar108._2_2_ = auVar447._2_2_;
                auVar108._0_2_ = auVar350._2_2_ * sVar507;
                iVar357 = CONCAT22(auVar447._8_2_,auVar350._8_2_ * sVar518);
                auVar520._0_8_ =
                     CONCAT26(auVar447._10_2_,CONCAT24(auVar350._10_2_ * sVar518,iVar357));
                auVar520._8_2_ = auVar350._12_2_ * sVar518;
                auVar520._10_2_ = auVar447._12_2_;
                auVar523._12_2_ = auVar350._14_2_ * sVar518;
                auVar523._0_12_ = auVar520;
                auVar523._14_2_ = auVar447._14_2_;
                iVar314 = CONCAT22(auVar547._6_2_,sVar485);
                Var133 = CONCAT64(CONCAT42(iVar314,auVar547._4_2_),
                                  CONCAT22(auVar388._4_2_ * sVar525,sVar485));
                auVar109._4_8_ = (long)((unkuint10)Var133 >> 0x10);
                auVar109._2_2_ = auVar547._2_2_;
                auVar109._0_2_ = auVar388._2_2_ * sVar525;
                iVar316 = CONCAT22(auVar547._8_2_,auVar388._8_2_ * sVar484);
                auVar461._0_8_ =
                     CONCAT26(auVar547._10_2_,CONCAT24(auVar388._10_2_ * sVar484,iVar316));
                auVar461._8_2_ = auVar388._12_2_ * sVar484;
                auVar461._10_2_ = auVar547._12_2_;
                auVar479._12_2_ = auVar388._14_2_ * sVar484;
                auVar479._0_12_ = auVar461;
                auVar479._14_2_ = auVar547._14_2_;
                in_XMM8._0_4_ = iVar316 + iVar430 + local_718._0_4_;
                in_XMM8._4_4_ =
                     (int)((ulong)auVar461._0_8_ >> 0x20) + (int)((ulong)auVar540._0_8_ >> 0x20) +
                     local_718._4_4_;
                in_XMM8._8_4_ = auVar461._8_4_ + auVar540._8_4_ + local_718._8_4_;
                in_XMM8._12_4_ = auVar479._12_4_ + auVar542._12_4_ + local_718._12_4_;
                iVar316 = CONCAT22(in_XMM7._6_2_,sVar429);
                Var134 = CONCAT64(CONCAT42(iVar316,in_XMM7._4_2_),
                                  CONCAT22(auVar388._4_2_ * sVar255,sVar429));
                auVar110._4_8_ = (long)((unkuint10)Var134 >> 0x10);
                auVar110._2_2_ = in_XMM7._2_2_;
                auVar110._0_2_ = auVar388._2_2_ * sVar255;
                auVar210._0_4_ =
                     CONCAT22(in_XMM7._0_2_,auVar388._0_2_ * sVar255) +
                     CONCAT22(auVar447._0_2_,auVar350._0_2_ * sVar507) +
                     iVar142 + CONCAT22(auVar285._0_2_,auVar244._0_2_ * auVar480._0_2_);
                auVar210._4_4_ = auVar110._0_4_ + auVar108._0_4_ + iVar189 + auVar106._0_4_;
                auVar210._8_4_ =
                     (int)((unkuint10)Var134 >> 0x10) + (int)((unkuint10)Var132 >> 0x10) +
                     iVar141 + (int)((unkuint10)Var81 >> 0x10);
                auVar210._12_4_ = iVar316 + iVar311 + iVar176 + iVar290;
                iVar290 = CONCAT22(in_XMM7._8_2_,auVar388._8_2_ * sVar257);
                auVar399._0_8_ =
                     CONCAT26(in_XMM7._10_2_,CONCAT24(auVar388._10_2_ * sVar257,iVar290));
                auVar399._8_2_ = auVar388._12_2_ * sVar257;
                auVar399._10_2_ = in_XMM7._12_2_;
                auVar423._12_2_ = auVar388._14_2_ * sVar257;
                auVar423._0_12_ = auVar399;
                auVar423._14_2_ = in_XMM7._14_2_;
                local_698 = auVar418._0_2_;
                uStack_696 = auVar418._2_2_;
                uStack_694 = auVar418._4_2_;
                uStack_692 = auVar418._6_2_;
                uStack_690 = auVar418._8_2_;
                uStack_68e = auVar418._10_2_;
                uStack_68c = auVar418._12_2_;
                uStack_68a = auVar418._14_2_;
                iVar176 = CONCAT22(uStack_692,sVar393);
                Var81 = CONCAT64(CONCAT42(iVar176,uStack_694),
                                 CONCAT22(auVar286._4_2_ * sVar397,sVar393));
                auVar111._4_8_ = (long)((unkuint10)Var81 >> 0x10);
                auVar111._2_2_ = uStack_696;
                auVar111._0_2_ = auVar286._2_2_ * sVar397;
                iVar256 = CONCAT22(local_698,auVar286._0_2_ * sVar397) +
                          CONCAT22(auVar547._0_2_,auVar388._0_2_ * sVar525) +
                          CONCAT22(auVar252._0_2_,auVar350._0_2_ * sVar486) +
                          iVar256 + CONCAT22(auVar344._0_2_,auVar244._0_2_ * auVar212._0_2_);
                iVar292 = auVar111._0_4_ +
                          auVar109._0_4_ + auVar107._0_4_ + iVar292 + auVar105._0_4_;
                iVar310 = (int)((unkuint10)Var81 >> 0x10) +
                          (int)((unkuint10)Var133 >> 0x10) + (int)((unkuint10)Var84 >> 0x10) +
                          iVar310 + (int)((unkuint10)Var78 >> 0x10);
                iVar313 = iVar176 + iVar314 + iVar293 + iVar313 + iVar315;
                iVar176 = CONCAT22(uStack_690,auVar286._8_2_ * auVar379._14_2_);
                auVar364._0_8_ =
                     CONCAT26(uStack_68e,CONCAT24(auVar286._10_2_ * auVar379._14_2_,iVar176));
                auVar364._8_2_ = auVar286._12_2_ * auVar379._14_2_;
                auVar364._10_2_ = uStack_68c;
                auVar380._12_2_ = auVar286._14_2_ * auVar379._14_2_;
                auVar380._0_12_ = auVar364;
                auVar380._14_2_ = uStack_68a;
                auVar378._0_4_ = iVar176 + in_XMM8._0_4_;
                auVar378._4_4_ = (int)((ulong)auVar364._0_8_ >> 0x20) + in_XMM8._4_4_;
                auVar378._8_4_ = auVar364._8_4_ + in_XMM8._8_4_;
                auVar378._12_4_ = auVar380._12_4_ + in_XMM8._12_4_;
                iVar176 = CONCAT22(auVar515._6_2_,sVar508);
                Var78 = CONCAT64(CONCAT42(iVar176,auVar515._4_2_),
                                 CONCAT22(auVar286._4_2_ * sVar258,sVar508));
                auVar112._4_8_ = (long)((unkuint10)Var78 >> 0x10);
                auVar112._2_2_ = auVar515._2_2_;
                auVar112._0_2_ = auVar286._2_2_ * sVar258;
                iVar142 = CONCAT22(auVar515._0_2_,auVar286._0_2_ * sVar258) + auVar210._0_4_;
                iVar189 = auVar112._0_4_ + auVar210._4_4_;
                iVar141 = (int)((unkuint10)Var78 >> 0x10) + auVar210._8_4_;
                iVar176 = iVar176 + auVar210._12_4_;
                iVar315 = CONCAT22(auVar515._8_2_,auVar286._8_2_ * auVar500._14_2_);
                auVar489._0_8_ =
                     CONCAT26(auVar515._10_2_,CONCAT24(auVar286._10_2_ * auVar500._14_2_,iVar315));
                auVar489._8_2_ = auVar286._12_2_ * auVar500._14_2_;
                auVar489._10_2_ = auVar515._12_2_;
                auVar501._12_2_ = auVar286._14_2_ * auVar500._14_2_;
                auVar501._0_12_ = auVar489;
                auVar501._14_2_ = auVar515._14_2_;
                auVar499._0_4_ = iVar315 + iVar290 + iVar357 + auVar499._0_4_ + iVar360;
                auVar499._4_4_ =
                     (int)((ulong)auVar489._0_8_ >> 0x20) +
                     (int)((ulong)auVar399._0_8_ >> 0x20) + (int)((ulong)auVar520._0_8_ >> 0x20) +
                     iVar261 + (int)((ulong)auVar527._0_8_ >> 0x20);
                auVar499._8_4_ =
                     auVar489._8_4_ + auVar399._8_4_ + auVar520._8_4_ + iVar288 + auVar527._8_4_;
                auVar499._12_4_ =
                     auVar501._12_4_ + auVar423._12_4_ + auVar523._12_4_ + iVar289 + auVar537._12_4_
                ;
                lVar154 = lVar154 + 0x20;
              }
              auVar307._0_4_ = iVar256 + auVar378._0_4_;
              auVar307._4_4_ = iVar292 + auVar378._4_4_;
              auVar307._8_4_ = iVar310 + auVar378._8_4_;
              auVar307._12_4_ = iVar313 + auVar378._12_4_;
              auVar250._0_4_ = iVar142 + auVar499._0_4_;
              auVar250._4_4_ = iVar189 + iVar261;
              auVar250._8_4_ = iVar141 + iVar288;
              auVar250._12_4_ = iVar176 + iVar289;
              *(undefined1 (*) [16])asVar173 = auVar307;
              *(undefined1 (*) [16])((long)asVar173 + 0x10) = auVar250;
              asVar173 = (short  [4])((long)asVar173 + 0x20);
              lVar178 = lVar178 + CONCAT44(opt_q.workspace_allocator._4_4_,
                                           opt_q.workspace_allocator._0_4_) *
                                  (long)(int)opt_q._44_4_;
            }
            while (uVar199 = (uint)uVar135, (int)uVar199 < iVar185) {
              auVar251 = (undefined1  [16])0x0;
              lVar178 = 0;
              iVar176 = 0;
              iVar142 = 0;
              iVar189 = 0;
              iVar141 = 0;
              uVar159 = uVar192;
              while( true ) {
                iVar256 = (int)uVar159;
                uVar159 = (ulong)(iVar256 - 1);
                iVar292 = auVar251._4_4_;
                iVar313 = auVar251._12_4_;
                iVar310 = auVar251._8_4_;
                if (iVar256 == 0) break;
                auVar286 = *(undefined1 (*) [16])
                            ((ulong)((uVar199 & 1) + ((uint)(uVar135 >> 1) & 0x7fffffff)) *
                             (long)(int)opt_q._44_4_ *
                             CONCAT44(opt_q.workspace_allocator._4_4_,
                                      opt_q.workspace_allocator._0_4_) + opt_q._0_8_ + lVar178);
                auVar418 = *(undefined1 (*) [16])((long)pvVar162 + lVar178 * 4);
                auVar244 = *(undefined1 (*) [16])((long)pvVar162 + lVar178 * 4 + 0x10);
                auVar350 = *(undefined1 (*) [16])((long)pvVar162 + lVar178 * 4 + 0x20);
                auVar388 = *(undefined1 (*) [16])((long)pvVar162 + lVar178 * 4 + 0x30);
                sVar392 = auVar286._6_2_;
                auVar340._0_12_ = auVar286._0_12_;
                auVar340._12_2_ = sVar392;
                auVar340._14_2_ = sVar392;
                auVar339._12_4_ = auVar340._12_4_;
                auVar339._0_10_ = auVar286._0_10_;
                sVar486 = auVar286._4_2_;
                auVar339._10_2_ = sVar486;
                auVar338._10_6_ = auVar339._10_6_;
                auVar338._0_8_ = auVar286._0_8_;
                auVar338._8_2_ = sVar486;
                auVar285 = pshuflw(in_XMM7,auVar286,0x50);
                sVar525 = auVar286._8_2_;
                uVar223 = CONCAT22(sVar525,sVar525);
                sVar484 = auVar286._10_2_;
                auVar365._0_8_ = CONCAT26(sVar484,CONCAT24(sVar484,uVar223));
                sVar397 = auVar286._12_2_;
                auVar365._8_2_ = sVar397;
                auVar365._10_2_ = sVar397;
                auVar381._14_2_ = auVar286._14_2_;
                auVar381._12_2_ = auVar381._14_2_;
                auVar381._0_12_ = auVar365;
                auVar446._0_4_ = auVar285._0_4_;
                auVar446._4_4_ = auVar446._0_4_;
                auVar446._8_4_ = auVar285._4_4_;
                auVar446._12_4_ = auVar285._4_4_;
                sVar485 = auVar418._6_2_ * auVar285._2_2_;
                auVar344 = pmulhw(auVar418,auVar446);
                auVar341._4_4_ = auVar338._8_4_;
                auVar341._0_4_ = auVar338._8_4_;
                auVar341._8_4_ = auVar339._12_4_;
                auVar341._12_4_ = auVar339._12_4_;
                sVar429 = auVar244._6_2_ * sVar486;
                auVar252 = pmulhw(auVar244,auVar341);
                uVar260 = (undefined4)((ulong)auVar365._0_8_ >> 0x20);
                auVar512._4_4_ = uVar223;
                auVar512._0_4_ = uVar223;
                auVar512._8_4_ = uVar260;
                auVar512._12_4_ = uVar260;
                sVar312 = auVar350._6_2_ * sVar525;
                auVar212 = pmulhw(auVar350,auVar512);
                auVar513._4_4_ = auVar365._8_4_;
                auVar513._0_4_ = auVar365._8_4_;
                auVar513._8_4_ = auVar381._12_4_;
                auVar513._12_4_ = auVar381._12_4_;
                sVar393 = auVar388._6_2_ * sVar397;
                auVar286 = pmulhw(auVar388,auVar513);
                iVar256 = CONCAT22(auVar344._6_2_,sVar485);
                Var78 = CONCAT64(CONCAT42(iVar256,auVar344._4_2_),
                                 CONCAT22(auVar418._4_2_ * auVar285._0_2_,sVar485));
                auVar113._4_8_ = (long)((unkuint10)Var78 >> 0x10);
                auVar113._2_2_ = auVar344._2_2_;
                auVar113._0_2_ = auVar418._2_2_ * auVar285._2_2_;
                iVar293 = CONCAT22(auVar344._8_2_,auVar418._8_2_ * auVar285._4_2_);
                auVar490._0_8_ =
                     CONCAT26(auVar344._10_2_,CONCAT24(auVar418._10_2_ * auVar285._6_2_,iVar293));
                auVar490._8_2_ = auVar418._12_2_ * auVar285._4_2_;
                auVar490._10_2_ = auVar344._12_2_;
                auVar502._12_2_ = auVar418._14_2_ * auVar285._6_2_;
                auVar502._0_12_ = auVar490;
                auVar502._14_2_ = auVar344._14_2_;
                iVar315 = CONCAT22(auVar252._6_2_,sVar429);
                Var81 = CONCAT64(CONCAT42(iVar315,auVar252._4_2_),
                                 CONCAT22(auVar244._4_2_ * sVar486,sVar429));
                auVar114._4_8_ = (long)((unkuint10)Var81 >> 0x10);
                auVar114._2_2_ = auVar252._2_2_;
                auVar114._0_2_ = auVar244._2_2_ * sVar486;
                in_XMM8._0_4_ = CONCAT22(auVar252._0_2_,auVar244._0_2_ * sVar486);
                in_XMM8._4_12_ = auVar114;
                iVar290 = CONCAT22(auVar252._8_2_,auVar244._8_2_ * sVar392);
                auVar431._0_8_ =
                     CONCAT26(auVar252._10_2_,CONCAT24(auVar244._10_2_ * sVar392,iVar290));
                auVar431._8_2_ = auVar244._12_2_ * sVar392;
                auVar431._10_2_ = auVar252._12_2_;
                in_XMM7._12_2_ = auVar244._14_2_ * sVar392;
                in_XMM7._0_12_ = auVar431;
                in_XMM7._14_2_ = auVar252._14_2_;
                iVar261 = CONCAT22(auVar212._6_2_,sVar312);
                Var84 = CONCAT64(CONCAT42(iVar261,auVar212._4_2_),
                                 CONCAT22(auVar350._4_2_ * sVar525,sVar312));
                auVar115._4_8_ = (long)((unkuint10)Var84 >> 0x10);
                auVar115._2_2_ = auVar212._2_2_;
                auVar115._0_2_ = auVar350._2_2_ * sVar525;
                iVar289 = CONCAT22(auVar212._8_2_,auVar350._8_2_ * sVar484);
                auVar319._0_8_ =
                     CONCAT26(auVar212._10_2_,CONCAT24(auVar350._10_2_ * sVar484,iVar289));
                auVar319._8_2_ = auVar350._12_2_ * sVar484;
                auVar319._10_2_ = auVar212._12_2_;
                auVar342._12_2_ = auVar350._14_2_ * sVar484;
                auVar342._0_12_ = auVar319;
                auVar342._14_2_ = auVar212._14_2_;
                iVar288 = CONCAT22(auVar286._6_2_,sVar393);
                Var132 = CONCAT64(CONCAT42(iVar288,auVar286._4_2_),
                                  CONCAT22(auVar388._4_2_ * sVar397,sVar393));
                auVar116._4_8_ = (long)((unkuint10)Var132 >> 0x10);
                auVar116._2_2_ = auVar286._2_2_;
                auVar116._0_2_ = auVar388._2_2_ * sVar397;
                iVar176 = CONCAT22(auVar286._0_2_,auVar388._0_2_ * sVar397) +
                          CONCAT22(auVar212._0_2_,auVar350._0_2_ * sVar525) + in_XMM8._0_4_ +
                          iVar176 + CONCAT22(auVar344._0_2_,auVar418._0_2_ * auVar285._0_2_);
                iVar142 = auVar116._0_4_ +
                          auVar115._0_4_ + auVar114._0_4_ + iVar142 + auVar113._0_4_;
                iVar189 = (int)((unkuint10)Var132 >> 0x10) +
                          (int)((unkuint10)Var84 >> 0x10) + (int)((unkuint10)Var81 >> 0x10) +
                          iVar189 + (int)((unkuint10)Var78 >> 0x10);
                iVar141 = iVar288 + iVar261 + iVar315 + iVar141 + iVar256;
                iVar256 = CONCAT22(auVar286._8_2_,auVar388._8_2_ * auVar381._14_2_);
                auVar366._0_8_ =
                     CONCAT26(auVar286._10_2_,CONCAT24(auVar388._10_2_ * auVar381._14_2_,iVar256));
                auVar366._8_2_ = auVar388._12_2_ * auVar381._14_2_;
                auVar366._10_2_ = auVar286._12_2_;
                auVar382._12_2_ = auVar388._14_2_ * auVar381._14_2_;
                auVar382._0_12_ = auVar366;
                auVar382._14_2_ = auVar286._14_2_;
                auVar251._0_4_ = iVar256 + iVar289 + iVar290 + auVar251._0_4_ + iVar293;
                auVar251._4_4_ =
                     (int)((ulong)auVar366._0_8_ >> 0x20) +
                     (int)((ulong)auVar319._0_8_ >> 0x20) + (int)((ulong)auVar431._0_8_ >> 0x20) +
                     iVar292 + (int)((ulong)auVar490._0_8_ >> 0x20);
                auVar251._8_4_ =
                     auVar366._8_4_ + auVar319._8_4_ + auVar431._8_4_ + iVar310 + auVar490._8_4_;
                auVar251._12_4_ =
                     auVar382._12_4_ + auVar342._12_4_ + in_XMM7._12_4_ + iVar313 + auVar502._12_4_;
                lVar178 = lVar178 + 0x10;
              }
              auVar210._0_4_ = iVar176 + auVar251._0_4_;
              auVar210._4_4_ = iVar142 + iVar292;
              auVar210._8_4_ = iVar189 + iVar310;
              auVar210._12_4_ = iVar141 + iVar313;
              *(undefined1 (*) [16])asVar173 = auVar210;
              asVar173 = (short  [4])((long)asVar173 + 0x10);
              uVar135 = (ulong)(uVar199 + 1);
            }
            pvVar162 = (void *)((long)pvVar162 + (long)local_630);
          }
          local_618 = (void *)uVar172;
          uVar135 = uVar172 + 1;
        }
        piVar193 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
        if (piVar193 != (int *)0x0) {
          LOCK();
          *piVar193 = *piVar193 + -1;
          UNLOCK();
          if (*piVar193 == 0) {
            if (opt_q._32_8_ == 0) {
              free((void *)opt_q._0_8_);
            }
            else {
              (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
            }
          }
        }
        local_568 = 0;
        d0[0] = 0;
        d0[1] = 0;
        d0[2] = 0;
        d0[3] = 0;
        auStack_578 = SUB1612((undefined1  [16])0x0,4);
        local_588 = (Allocator *)0x0;
        iStack_580 = 0;
        iStack_57c = 0;
        local_458 = 0;
        opt_b.lightmode = false;
        opt_b._1_3_ = 0;
        opt_b.num_threads = 0;
        opt_b.blob_allocator._0_4_ = 0;
        opt_b.blob_allocator._4_4_ = 0;
        opt_b.workspace_allocator = (Allocator *)0x0;
        opt_b.openmp_blocktime = 0;
        opt_b.use_bf16_storage = false;
        opt_b.use_fp16_packed = false;
        opt_b.use_fp16_storage = false;
        opt_b.use_fp16_arithmetic = false;
        opt_b.use_int8_packed = false;
        opt_b.use_int8_storage = false;
        opt_b.use_int8_arithmetic = false;
        opt_b.use_packing_layout = false;
        opt_b.use_shader_pack8 = false;
        opt_b.use_subgroup_basic = false;
        opt_b.use_subgroup_vote = false;
        opt_b.use_subgroup_ballot = false;
        opt_b.use_subgroup_shuffle = false;
        opt_b.use_image_storage = false;
        opt_b.use_tensor_storage = false;
        opt_b.use_reserved_0 = false;
        opt_b.flush_denormals = 0;
        opt_b.use_local_pool_allocator = false;
        opt_b.use_shader_local_memory = false;
        opt_b.use_cooperative_matrix = false;
        opt_b.use_winograd23_convolution = false;
        opt_b.use_winograd43_convolution = false;
        opt_b.use_winograd63_convolution = false;
        opt_b.use_reserved_6 = false;
        opt_b.use_reserved_7 = false;
        auVar211._4_4_ = -(uint)(uVar148 == local_5f8.w);
        auVar211._0_4_ = -(uint)(uVar148 == local_5f8.w);
        auVar211._8_4_ = -(uint)(uVar190 == local_5f8.h);
        auVar211._12_4_ = -(uint)(uVar190 == local_5f8.h);
        iVar176 = movmskpd((int)&local_588,auVar211);
        if (iVar176 == 3) {
          piVar193 = (int *)CONCAT44(local_5f8.refcount._4_4_,local_5f8.refcount._0_4_);
          if (piVar193 != (int *)0x0) {
            LOCK();
            *piVar193 = *piVar193 + 1;
            UNLOCK();
          }
          opt_b._0_8_ = local_5f8.data;
          opt_b.blob_allocator._0_4_ = local_5f8.refcount._0_4_;
          opt_b.blob_allocator._4_4_ = local_5f8.refcount._4_4_;
          opt_b.workspace_allocator = (Allocator *)local_5f8.elemsize;
          opt_b.openmp_blocktime = local_5f8.elempack;
          opt_b._32_8_ = local_5f8.allocator;
          opt_b.use_shader_pack8 = (bool)(undefined1)local_5f8.dims;
          opt_b.use_subgroup_basic = (bool)local_5f8.dims._1_1_;
          opt_b.use_subgroup_vote = (bool)local_5f8.dims._2_1_;
          opt_b.use_subgroup_ballot = (bool)local_5f8.dims._3_1_;
          opt_b.use_subgroup_shuffle = (bool)(undefined1)local_5f8.w;
          opt_b.use_image_storage = (bool)local_5f8.w._1_1_;
          opt_b.use_tensor_storage = (bool)local_5f8.w._2_1_;
          opt_b.use_reserved_0 = (bool)local_5f8.w._3_1_;
          opt_b.flush_denormals = local_5f8.h;
          opt_b.use_local_pool_allocator = (bool)(undefined1)local_5f8.d;
          opt_b.use_shader_local_memory = (bool)local_5f8.d._1_1_;
          opt_b.use_cooperative_matrix = (bool)local_5f8.d._2_1_;
          opt_b.use_winograd23_convolution = (bool)local_5f8.d._3_1_;
          opt_b.use_winograd43_convolution = (bool)(undefined1)local_5f8.c;
          opt_b.use_winograd63_convolution = (bool)local_5f8.c._1_1_;
          opt_b.use_reserved_6 = (bool)local_5f8.c._2_1_;
          opt_b.use_reserved_7 = (bool)local_5f8.c._3_1_;
          local_458 = local_5f8.cstep;
        }
        else {
          Mat::create((Mat *)&opt_b,uVar148,(int)local_600,(int)local_628,0x10,4,
                      opt->workspace_allocator);
        }
        for (uVar135 = 0; (short  [4])uVar135 != local_620; uVar135 = uVar135 + 1) {
          pauVar194 = (undefined1 (*) [16])
                      (opt_b._0_8_ + local_458 * (long)opt_b.workspace_allocator * uVar135 + 0x30);
          for (uVar172 = 0; uVar172 != uVar175; uVar172 = uVar172 + 1) {
            piVar193 = (int *)((long)((local_610._0_4_ * (int)uVar172) / 6) * 0x10 + (long)d1);
            local_718._0_8_ = pauVar194;
            pauVar136 = pauVar194;
            for (uVar192 = 0; piVar138 = piVar193, lVar146 = -0x50, uVar192 != uVar160;
                uVar192 = uVar192 + 1) {
              for (; lVar146 != 0; lVar146 = lVar146 + 0x10) {
                iVar176 = piVar138[1];
                iVar142 = piVar138[2];
                iVar189 = piVar138[3];
                piVar2 = piVar138 + iVar185 * 4;
                piVar3 = piVar138 + lVar177;
                piVar4 = piVar138 + iVar185 * 0xc;
                piVar5 = piVar138 + lVar163;
                piVar6 = piVar138 + iVar185 * 0x14;
                iVar141 = *piVar6;
                iVar256 = piVar6[1];
                iVar292 = piVar6[2];
                iVar310 = piVar6[3];
                iVar430 = *piVar3 + *piVar2;
                iVar452 = piVar3[1] + piVar2[1];
                iVar455 = piVar3[2] + piVar2[2];
                iVar458 = piVar3[3] + piVar2[3];
                iVar289 = *piVar2 - *piVar3;
                iVar290 = piVar2[1] - piVar3[1];
                iVar293 = piVar2[2] - piVar3[2];
                iVar311 = piVar2[3] - piVar3[3];
                iVar314 = *piVar5 + *piVar4;
                iVar316 = piVar5[1] + piVar4[1];
                iVar357 = piVar5[2] + piVar4[2];
                iVar360 = piVar5[3] + piVar4[3];
                iVar313 = *piVar4 - *piVar5;
                iVar315 = piVar4[1] - piVar5[1];
                iVar261 = piVar4[2] - piVar5[2];
                iVar288 = piVar4[3] - piVar5[3];
                *(int *)(local_378 + lVar146) = *piVar138 + iVar430 + iVar314;
                *(int *)(local_378 + lVar146 + 4) = iVar176 + iVar452 + iVar316;
                *(int *)(local_378 + lVar146 + 8) = iVar142 + iVar455 + iVar357;
                *(int *)(local_378 + lVar146 + 0xc) = iVar189 + iVar458 + iVar360;
                *(int *)(local_318 + lVar146) = iVar313 * 2 + iVar289;
                *(int *)(local_318 + lVar146 + 4) = iVar315 * 2 + iVar290;
                *(int *)(local_318 + lVar146 + 8) = iVar261 * 2 + iVar293;
                *(int *)(local_318 + lVar146 + 0xc) = iVar288 * 2 + iVar311;
                *(int *)(local_2b8 + lVar146) = iVar314 * 4 + iVar430;
                *(int *)(local_2b8 + lVar146 + 4) = iVar316 * 4 + iVar452;
                *(int *)(local_2b8 + lVar146 + 8) = iVar357 * 4 + iVar455;
                *(int *)(local_2b8 + lVar146 + 0xc) = iVar360 * 4 + iVar458;
                *(int *)(local_258 + lVar146) = iVar313 * 8 + iVar141 * 4 + iVar289;
                *(int *)(local_258 + lVar146 + 4) = iVar315 * 8 + iVar256 * 4 + iVar290;
                *(int *)(local_258 + lVar146 + 8) = iVar261 * 8 + iVar292 * 4 + iVar293;
                *(int *)(local_258 + lVar146 + 0xc) = iVar288 * 8 + iVar310 * 4 + iVar311;
                piVar138 = piVar138 + iVar185 * 0x18;
              }
              piVar2 = piVar138 + iVar185 * 0x14;
              piVar3 = piVar138 + iVar185 * 4;
              piVar4 = piVar138 + lVar177;
              iVar176 = (*piVar3 - *piVar4) * 4;
              iVar142 = (piVar3[1] - piVar4[1]) * 4;
              iVar189 = (piVar3[2] - piVar4[2]) * 4;
              iVar141 = (piVar3[3] - piVar4[3]) * 4;
              in_XMM7 = *(undefined1 (*) [16])(piVar138 + iVar185 * 0xc);
              piVar5 = piVar138 + lVar163;
              iVar315 = in_XMM7._0_4_ - *piVar5;
              iVar261 = in_XMM7._4_4_ - piVar5[1];
              iVar288 = in_XMM7._8_4_ - piVar5[2];
              iVar289 = in_XMM7._12_4_ - piVar5[3];
              local_258._0_4_ = iVar315 * 0x20 + *piVar2 * 0x10 + iVar176;
              local_258._4_4_ = iVar261 * 0x20 + piVar2[1] * 0x10 + iVar142;
              local_258._8_4_ = iVar288 * 0x20 + piVar2[2] * 0x10 + iVar189;
              local_258._12_4_ = iVar289 * 0x20 + piVar2[3] * 0x10 + iVar141;
              iVar290 = *piVar5 + in_XMM7._0_4_;
              iVar293 = piVar5[1] + in_XMM7._4_4_;
              iVar311 = piVar5[2] + in_XMM7._8_4_;
              iVar314 = piVar5[3] + in_XMM7._12_4_;
              iVar256 = *piVar4 + *piVar3;
              iVar292 = piVar4[1] + piVar3[1];
              iVar310 = piVar4[2] + piVar3[2];
              iVar313 = piVar4[3] + piVar3[3];
              in_XMM8._0_4_ = iVar290 * 0x10;
              in_XMM8._4_4_ = iVar293 * 0x10;
              in_XMM8._8_4_ = iVar311 * 0x10;
              in_XMM8._12_4_ = iVar314 * 0x10;
              local_2b8._0_4_ = iVar256 * 4 + in_XMM8._0_4_;
              local_2b8._4_4_ = iVar292 * 4 + in_XMM8._4_4_;
              local_2b8._8_4_ = iVar310 * 4 + in_XMM8._8_4_;
              local_2b8._12_4_ = iVar313 * 4 + in_XMM8._12_4_;
              local_318._0_4_ = iVar315 * 8 + iVar176;
              local_318._4_4_ = iVar261 * 8 + iVar142;
              local_318._8_4_ = iVar288 * 8 + iVar189;
              local_318._12_4_ = iVar289 * 8 + iVar141;
              local_378._0_4_ = (*piVar138 + iVar256 + iVar290) * 4;
              local_378._4_4_ = (piVar138[1] + iVar292 + iVar293) * 4;
              local_378._8_4_ = (piVar138[2] + iVar310 + iVar311) * 4;
              local_378._12_4_ = (piVar138[3] + iVar313 + iVar314) * 4;
              pauVar137 = pauVar136;
              for (lVar146 = 0x50; lVar146 != 0x1d0; lVar146 = lVar146 + 0x60) {
                iVar176 = *(int *)((long)&local_408 + lVar146 + 4);
                iVar142 = *(int *)((long)&local_400 + lVar146 + 4);
                iVar189 = *(int *)((long)&local_3f8 + lVar146 + 4);
                iVar141 = *(int *)((long)&local_3f0 + lVar146 + 4);
                iVar256 = *(int *)((long)w1 + lVar146 + -4);
                iVar292 = *(int *)((long)w1 + lVar146 + 4);
                iVar290 = *(int *)((long)&local_3f8 + lVar146) +
                          *(int *)((long)&local_408 + lVar146);
                iVar293 = iVar189 + iVar176;
                iVar311 = *(int *)((long)&local_3f0 + lVar146) +
                          *(int *)((long)&local_400 + lVar146);
                iVar314 = iVar141 + iVar142;
                iVar310 = *(int *)((long)&local_408 + lVar146) -
                          *(int *)((long)&local_3f8 + lVar146);
                iVar176 = iVar176 - iVar189;
                iVar313 = *(int *)((long)&local_400 + lVar146) -
                          *(int *)((long)&local_3f0 + lVar146);
                iVar142 = iVar142 - iVar141;
                iVar315 = *(int *)((long)w1 + lVar146) + *(int *)((long)&uStack_3e8 + lVar146);
                iVar261 = iVar292 + *(int *)((long)&local_3e4 + lVar146);
                iVar288 = *(int *)((long)&uStack_3d0 + lVar146) +
                          *(int *)((long)&local_3e0 + lVar146);
                iVar289 = *(int *)((long)&uStack_3cc + lVar146) + iVar256;
                iVar189 = *(int *)((long)&uStack_3e8 + lVar146) - *(int *)((long)w1 + lVar146);
                iVar292 = *(int *)((long)&local_3e4 + lVar146) - iVar292;
                iVar141 = *(int *)((long)&local_3e0 + lVar146) -
                          *(int *)((long)&uStack_3d0 + lVar146);
                iVar256 = iVar256 - *(int *)((long)&uStack_3cc + lVar146);
                auVar287._0_4_ =
                     (int)((float)(*(int *)((long)w2 + lVar146) + iVar290 + iVar315) * 0.0017361111)
                ;
                auVar287._4_4_ =
                     (int)((float)(*(int *)((long)w2 + lVar146 + 4) + iVar293 + iVar261) *
                          0.0017361111);
                auVar287._8_4_ =
                     (int)((float)(*(int *)((long)&local_410 + lVar146) + iVar311 + iVar288) *
                          0.0017361111);
                auVar287._12_4_ =
                     (int)((float)(*(int *)((long)&local_40c + lVar146) + iVar314 + iVar289) *
                          0.0017361111);
                auVar352._0_4_ = (int)((float)(iVar189 * 2 + iVar310) * 0.0017361111);
                auVar352._4_4_ = (int)((float)(iVar292 * 2 + iVar176) * 0.0017361111);
                auVar352._8_4_ = (int)((float)(iVar141 * 2 + iVar313) * 0.0017361111);
                auVar352._12_4_ = (int)((float)(iVar256 * 2 + iVar142) * 0.0017361111);
                auVar309._0_4_ = (int)((float)(iVar315 * 4 + iVar290) * 0.0017361111);
                auVar309._4_4_ = (int)((float)(iVar261 * 4 + iVar293) * 0.0017361111);
                auVar309._8_4_ = (int)((float)(iVar288 * 4 + iVar311) * 0.0017361111);
                auVar309._12_4_ = (int)((float)(iVar289 * 4 + iVar314) * 0.0017361111);
                auVar254._0_4_ =
                     (int)((float)(iVar189 * 8 + iVar310 + *(int *)(&opt_q.lightmode + lVar146)) *
                          0.0017361111);
                auVar254._4_4_ =
                     (int)((float)(iVar292 * 8 +
                                  iVar176 + *(int *)((long)&opt_q.num_threads + lVar146)) *
                          0.0017361111);
                auVar254._8_4_ =
                     (int)((float)(iVar141 * 8 +
                                  iVar313 + *(int *)((long)&opt_q.blob_allocator + lVar146)) *
                          0.0017361111);
                auVar254._12_4_ =
                     (int)((float)(iVar256 * 8 +
                                  iVar142 + *(int *)((long)&opt_q.blob_allocator + lVar146 + 4)) *
                          0.0017361111);
                pauVar137[-3] = auVar287;
                pauVar137[-2] = auVar352;
                pauVar137[-1] = auVar309;
                *pauVar137 = auVar254;
                pauVar137 = (undefined1 (*) [16])(*pauVar137 + (long)((int)local_5b0 << 4) * 4);
              }
              piVar193 = piVar193 + 4;
              pauVar136 = pauVar136 + 4;
            }
            pauVar194 = (undefined1 (*) [16])
                        (*pauVar194 + (long)(int)opt_b._44_4_ * (long)opt_b.workspace_allocator * 4)
            ;
          }
        }
        copy_cut_border((Mat *)&opt_b,&local_5f8,0,opt_b.flush_denormals - local_5f8.h,0,
                        opt_b._44_4_ - local_5f8.w,opt);
        piVar193 = (int *)CONCAT44(opt_b.blob_allocator._4_4_,opt_b.blob_allocator._0_4_);
        if (piVar193 != (int *)0x0) {
          LOCK();
          *piVar193 = *piVar193 + -1;
          UNLOCK();
          if (*piVar193 == 0) {
            if (opt_b._32_8_ == 0) {
              free((void *)opt_b._0_8_);
            }
            else {
              (**(code **)(*(long *)opt_b._32_8_ + 0x18))();
            }
          }
        }
        piVar193 = (int *)CONCAT44(local_558.refcount._4_4_,local_558.refcount._0_4_);
        if (piVar193 != (int *)0x0) {
          LOCK();
          *piVar193 = *piVar193 + -1;
          UNLOCK();
          if (*piVar193 == 0) {
            if (local_558.allocator == (Allocator *)0x0) {
              free(local_558.data);
            }
            else {
              (*(local_558.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
      else {
        uVar140 = *(uint *)((long)&(this->weight_winograd23_data).c + (long)p_Var45);
        uVar160 = (ulong)uVar140;
        iVar176 = *(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var45);
        iVar189 = *(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var45);
        iVar141 = *(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var45 + 4));
        iVar256 = *(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var45);
        local_718._0_4_ = local_678.w;
        lVar163 = (long)local_5f8.w;
        if (opt->use_sgemm_convolution == true) {
          opt_q.lightmode = false;
          opt_q._1_3_ = 0;
          opt_q.num_threads = 0;
          opt_q.blob_allocator._0_4_ = 0;
          opt_q.blob_allocator._4_4_ = 0;
          opt_q.workspace_allocator._0_4_ = 0;
          opt_q.workspace_allocator._4_4_ = 0;
          opt_q.openmp_blocktime = 0;
          opt_q.use_bf16_storage = false;
          opt_q.use_fp16_packed = false;
          opt_q.use_fp16_storage = false;
          opt_q.use_fp16_arithmetic = false;
          opt_q.use_int8_packed = false;
          opt_q.use_int8_storage = false;
          opt_q.use_int8_arithmetic = false;
          opt_q.use_packing_layout = false;
          opt_q.use_shader_pack8 = false;
          opt_q.use_subgroup_basic = false;
          opt_q.use_subgroup_vote = false;
          opt_q.use_subgroup_ballot = false;
          opt_q.use_subgroup_shuffle = false;
          opt_q.use_image_storage = false;
          opt_q.use_tensor_storage = false;
          opt_q.use_reserved_0 = false;
          opt_q.flush_denormals = 0;
          opt_q.use_local_pool_allocator = false;
          opt_q.use_shader_local_memory = false;
          opt_q.use_cooperative_matrix = false;
          opt_q.use_winograd23_convolution = false;
          opt_q.use_winograd43_convolution = false;
          opt_q.use_winograd63_convolution = false;
          opt_q.use_reserved_6 = false;
          opt_q.use_reserved_7 = false;
          Mat::create((Mat *)&opt_q,local_5f8.h * local_5f8.w,uVar140 * uVar190,local_678.c,8,8,
                      opt->workspace_allocator);
          iVar185 = iVar141 * uVar165;
          if ((int)uVar165 < 1) {
            uVar165 = 0;
          }
          if ((int)uVar148 < 1) {
            uVar148 = 0;
          }
          if ((int)uVar190 < 1) {
            uVar135 = 0;
          }
          if ((int)uVar140 < 1) {
            uVar160 = 0;
          }
          if ((int)uVar199 < 1) {
            uVar199 = 0;
          }
          for (uVar172 = 0; uVar172 != uVar199; uVar172 = uVar172 + 1) {
            pvVar162 = (void *)(local_678.cstep * uVar172 * local_678.elemsize +
                               (long)local_678.data);
            local_718._0_8_ = pvVar162;
            puVar167 = (undefined8 *)opt_q._0_8_;
            for (uVar175 = 0; uVar175 != uVar160; uVar175 = uVar175 + 1) {
              for (uVar192 = 0; uVar192 != uVar135; uVar192 = uVar192 + 1) {
                puVar166 = (undefined8 *)
                           ((long)pvVar162 +
                           uVar192 * (long)iVar176 * 8 +
                           local_678.elemsize * (long)local_678.w * (long)iVar189 * uVar175);
                for (uVar190 = 0; uVar140 = uVar165, uVar190 != uVar148; uVar190 = uVar190 + 1) {
                  while (uVar140 != 0) {
                    *puVar167 = *puVar166;
                    puVar167 = puVar167 + 1;
                    puVar166 = puVar166 + iVar141;
                    uVar140 = uVar140 - 1;
                  }
                  puVar166 = puVar166 + ((long)(iVar142 * iVar256) - (long)iVar185);
                }
              }
            }
          }
          im2col_sgemm_pack8to4_int8_sse((Mat *)&opt_q,&local_5f8,&this->weight_sgemm_data,opt);
          piVar193 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
          if (piVar193 != (int *)0x0) {
            LOCK();
            *piVar193 = *piVar193 + -1;
            UNLOCK();
            if (*piVar193 == 0) {
              if (opt_q._32_8_ == 0) goto LAB_0019e654;
              (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
            }
          }
        }
        else {
          uVar156 = uVar140 * uVar190;
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)&opt_q,(long)(int)uVar156,
                     (allocator_type *)&local_558);
          local_718._0_4_ = iVar142 * iVar189 - iVar176 * uVar190;
          uVar139 = 0;
          if ((int)uVar190 < 1) {
            uVar135 = 0;
          }
          if ((int)uVar140 < 1) {
            uVar140 = 0;
          }
          iVar189 = 0;
          uVar160 = uVar135;
          iVar142 = 0;
          for (; uVar139 != uVar140; uVar139 = uVar139 + 1) {
            for (lVar177 = (long)iVar142; (int)uVar160 != lVar177; lVar177 = lVar177 + 1) {
              *(int *)(opt_q._0_8_ + lVar177 * 4) = iVar189;
              iVar189 = iVar189 + iVar176;
            }
            iVar189 = iVar189 + local_718._0_4_;
            uVar160 = (ulong)(uint)((int)uVar160 + (int)uVar135);
            iVar142 = iVar142 + (int)uVar135;
          }
          uVar160 = 0;
          uVar135 = (ulong)uVar156;
          if ((int)uVar156 < 1) {
            uVar135 = uVar160;
          }
          uVar172 = (ulong)uVar199;
          if ((int)uVar199 < 1) {
            uVar172 = uVar160;
          }
          uVar175 = 0;
          if (0 < (int)uVar165) {
            uVar175 = (ulong)uVar165;
          }
          uVar192 = (ulong)uVar148;
          if ((int)uVar148 < 1) {
            uVar192 = uVar160;
          }
          uVar159 = (ulong)(uint)iVar185;
          if (iVar185 < 1) {
            uVar159 = uVar160;
          }
          for (; uVar160 != uVar159; uVar160 = uVar160 + 1) {
            local_718._0_8_ =
                 (void *)(local_5f8.cstep * uVar160 * local_5f8.elemsize + (long)local_5f8.data);
            for (uVar174 = 0; uVar174 != uVar192; uVar174 = uVar174 + 1) {
              for (uVar191 = 0; uVar191 != uVar175; uVar191 = uVar191 + 1) {
                pvVar162 = (void *)((this->weight_data_tm).cstep * uVar160 *
                                    (this->weight_data_tm).elemsize +
                                   (long)(this->weight_data_tm).data);
                iVar292 = 0;
                iVar310 = 0;
                iVar313 = 0;
                iVar315 = 0;
                auVar244 = (undefined1  [16])0x0;
                auVar350 = (undefined1  [16])0x0;
                iVar176 = 0;
                iVar142 = 0;
                iVar185 = 0;
                iVar189 = 0;
                for (uVar151 = 0; uVar151 != uVar172; uVar151 = uVar151 + 1) {
                  for (lVar177 = 0; uVar135 * 4 != lVar177; lVar177 = lVar177 + 4) {
                    uVar180 = *(ulong *)((long)local_678.data +
                                        (long)*(int *)(opt_q._0_8_ + lVar177) * 8 +
                                        local_678.cstep * local_678.elemsize * uVar151 +
                                        (long)(iVar141 * 8 * (int)uVar191) +
                                        (long)local_678.w * uVar174 * (long)iVar256 *
                                        local_678.elemsize);
                    cVar217 = (char)(uVar180 >> 8);
                    cVar218 = (char)(uVar180 >> 0x10);
                    cVar219 = (char)(uVar180 >> 0x18);
                    cVar220 = (char)(uVar180 >> 0x20);
                    cVar221 = (char)(uVar180 >> 0x28);
                    cVar222 = (char)(uVar180 >> 0x30);
                    auVar536._8_6_ = 0;
                    auVar536._0_8_ = uVar180;
                    auVar536[0xe] = (char)(uVar180 >> 0x38);
                    auVar536[0xf] = -((long)uVar180 < 0);
                    auVar535._14_2_ = auVar536._14_2_;
                    auVar535._8_5_ = 0;
                    auVar535._0_8_ = uVar180;
                    auVar535[0xd] = -(cVar222 < '\0');
                    auVar534._13_3_ = auVar535._13_3_;
                    auVar534._8_4_ = 0;
                    auVar534._0_8_ = uVar180;
                    auVar534[0xc] = cVar222;
                    auVar533._12_4_ = auVar534._12_4_;
                    auVar533._8_3_ = 0;
                    auVar533._0_8_ = uVar180;
                    auVar533[0xb] = -(cVar221 < '\0');
                    auVar532._11_5_ = auVar533._11_5_;
                    auVar532._8_2_ = 0;
                    auVar532._0_8_ = uVar180;
                    auVar532[10] = cVar221;
                    auVar531._10_6_ = auVar532._10_6_;
                    auVar531[8] = 0;
                    auVar531._0_8_ = uVar180;
                    auVar531[9] = -(cVar220 < '\0');
                    auVar530._9_7_ = auVar531._9_7_;
                    auVar530[8] = cVar220;
                    auVar530._0_8_ = uVar180;
                    Var78 = CONCAT91(CONCAT81(auVar530._8_8_,-(cVar219 < '\0')),cVar219);
                    auVar77._2_10_ = Var78;
                    auVar77[1] = -(cVar218 < '\0');
                    auVar77[0] = cVar218;
                    auVar76._2_12_ = auVar77;
                    auVar76[1] = -(cVar217 < '\0');
                    auVar76[0] = cVar217;
                    auVar529._0_2_ = CONCAT11(-((char)uVar180 < '\0'),(char)uVar180);
                    auVar529._2_14_ = auVar76;
                    auVar286 = *(undefined1 (*) [16])((long)pvVar162 + lVar177 * 8);
                    auVar418 = *(undefined1 (*) [16])((long)pvVar162 + lVar177 * 8 + 0x10);
                    auVar441._0_14_ = auVar286._0_14_;
                    auVar441[0xe] = auVar286[7];
                    auVar441[0xf] = -(auVar286[7] < '\0');
                    auVar440._14_2_ = auVar441._14_2_;
                    auVar440._0_13_ = auVar286._0_13_;
                    auVar440[0xd] = -(auVar286[6] < '\0');
                    auVar439._13_3_ = auVar440._13_3_;
                    auVar439._0_12_ = auVar286._0_12_;
                    auVar439[0xc] = auVar286[6];
                    auVar438._12_4_ = auVar439._12_4_;
                    auVar438._0_11_ = auVar286._0_11_;
                    auVar438[0xb] = -(auVar286[5] < '\0');
                    auVar437._11_5_ = auVar438._11_5_;
                    auVar437._0_10_ = auVar286._0_10_;
                    auVar437[10] = auVar286[5];
                    auVar436._10_6_ = auVar437._10_6_;
                    auVar436._0_9_ = auVar286._0_9_;
                    auVar436[9] = -(auVar286[4] < '\0');
                    auVar435._9_7_ = auVar436._9_7_;
                    auVar435._0_8_ = auVar286._0_8_;
                    auVar435[8] = auVar286[4];
                    Var81 = CONCAT91(CONCAT81(auVar435._8_8_,-(auVar286[3] < '\0')),auVar286[3]);
                    auVar80._2_10_ = Var81;
                    auVar80[1] = -(auVar286[2] < '\0');
                    auVar80[0] = auVar286[2];
                    auVar79._2_12_ = auVar80;
                    auVar79[1] = -(auVar286[1] < '\0');
                    auVar79[0] = auVar286[1];
                    auVar434._0_2_ = CONCAT11(-(auVar286[0] < '\0'),auVar286[0]);
                    auVar434._2_14_ = auVar79;
                    sVar486 = CONCAT11(-(auVar286[8] < '\0'),auVar286[8]);
                    uVar260 = CONCAT13(-(auVar286[9] < '\0'),CONCAT12(auVar286[9],sVar486));
                    uVar262 = CONCAT15(-(auVar286[10] < '\0'),CONCAT14(auVar286[10],uVar260));
                    uVar263 = CONCAT17(-(auVar286[0xb] < '\0'),CONCAT16(auVar286[0xb],uVar262));
                    auVar362._0_10_ =
                         CONCAT19(-(auVar286[0xc] < '\0'),CONCAT18(auVar286[0xc],uVar263));
                    auVar362[10] = auVar286[0xd];
                    auVar362[0xb] = -(auVar286[0xd] < '\0');
                    auVar371[0xc] = auVar286[0xe];
                    auVar371._0_12_ = auVar362;
                    auVar371[0xd] = -(auVar286[0xe] < '\0');
                    auVar212[0xe] = auVar286[0xf];
                    auVar212._0_14_ = auVar371;
                    auVar212[0xf] = -(auVar286[0xf] < '\0');
                    auVar285._0_14_ = auVar418._0_14_;
                    auVar285[0xe] = auVar418[7];
                    auVar285[0xf] = -(auVar418[7] < '\0');
                    auVar344._14_2_ = auVar285._14_2_;
                    auVar344._0_13_ = auVar418._0_13_;
                    auVar344[0xd] = -(auVar418[6] < '\0');
                    auVar447._13_3_ = auVar344._13_3_;
                    auVar447._0_12_ = auVar418._0_12_;
                    auVar447[0xc] = auVar418[6];
                    auVar480._12_4_ = auVar447._12_4_;
                    auVar480._0_11_ = auVar418._0_11_;
                    auVar480[0xb] = -(auVar418[5] < '\0');
                    auVar515._11_5_ = auVar480._11_5_;
                    auVar515._0_10_ = auVar418._0_10_;
                    auVar515[10] = auVar418[5];
                    auVar547._10_6_ = auVar515._10_6_;
                    auVar547._0_9_ = auVar418._0_9_;
                    auVar547[9] = -(auVar418[4] < '\0');
                    auVar401._9_7_ = auVar547._9_7_;
                    auVar401._0_8_ = auVar418._0_8_;
                    auVar401[8] = auVar418[4];
                    Var84 = CONCAT91(CONCAT81(auVar401._8_8_,-(auVar418[3] < '\0')),auVar418[3]);
                    auVar83._2_10_ = Var84;
                    auVar83[1] = -(auVar418[2] < '\0');
                    auVar83[0] = auVar418[2];
                    auVar82._2_12_ = auVar83;
                    auVar82[1] = -(auVar418[1] < '\0');
                    auVar82[0] = auVar418[1];
                    auVar252._0_2_ = CONCAT11(-(auVar418[0] < '\0'),auVar418[0]);
                    auVar252._2_14_ = auVar82;
                    sVar312 = CONCAT11(-(auVar418[8] < '\0'),auVar418[8]);
                    uVar223 = CONCAT13(-(auVar418[9] < '\0'),CONCAT12(auVar418[9],sVar312));
                    uVar224 = CONCAT15(-(auVar418[10] < '\0'),CONCAT14(auVar418[10],uVar223));
                    uVar225 = CONCAT17(-(auVar418[0xb] < '\0'),CONCAT16(auVar418[0xb],uVar224));
                    auVar318._0_10_ =
                         CONCAT19(-(auVar418[0xc] < '\0'),CONCAT18(auVar418[0xc],uVar225));
                    auVar318[10] = auVar418[0xd];
                    auVar318[0xb] = -(auVar418[0xd] < '\0');
                    auVar322[0xc] = auVar418[0xe];
                    auVar322._0_12_ = auVar318;
                    auVar322[0xd] = -(auVar418[0xe] < '\0');
                    auVar388[0xe] = auVar418[0xf];
                    auVar388._0_14_ = auVar322;
                    auVar388[0xf] = -(auVar418[0xf] < '\0');
                    sVar392 = auVar76._0_2_;
                    sVar393 = auVar77._0_2_;
                    sVar525 = (short)Var78;
                    sVar484 = sVar525 * (short)Var81;
                    sVar397 = auVar530._8_2_;
                    sVar429 = auVar532._10_2_;
                    sVar485 = auVar534._12_2_;
                    in_XMM7 = pmulhw(auVar434,auVar529);
                    sVar507 = sVar525 * (short)((ulong)uVar263 >> 0x30);
                    auVar418 = pmulhw(auVar212,auVar529);
                    sVar518 = sVar525 * (short)Var84;
                    auVar285 = pmulhw(auVar252,auVar529);
                    sVar525 = sVar525 * (short)((ulong)uVar225 >> 0x30);
                    auVar286 = pmulhw(auVar388,auVar529);
                    iVar261 = CONCAT22(in_XMM7._6_2_,sVar484);
                    Var78 = CONCAT64(CONCAT42(iVar261,in_XMM7._4_2_),
                                     CONCAT22(sVar393 * auVar80._0_2_,sVar484));
                    auVar85._4_8_ = (long)((unkuint10)Var78 >> 0x10);
                    auVar85._2_2_ = in_XMM7._2_2_;
                    auVar85._0_2_ = sVar392 * auVar79._0_2_;
                    iVar288 = CONCAT22(auVar418._6_2_,sVar507);
                    Var81 = CONCAT64(CONCAT42(iVar288,auVar418._4_2_),
                                     CONCAT22(sVar393 * (short)((uint6)uVar262 >> 0x20),sVar507));
                    auVar86._4_8_ = (long)((unkuint10)Var81 >> 0x10);
                    auVar86._2_2_ = auVar418._2_2_;
                    auVar86._0_2_ = sVar392 * (short)((uint)uVar260 >> 0x10);
                    iVar316 = auVar350._4_4_;
                    iVar357 = auVar350._8_4_;
                    iVar360 = auVar350._12_4_;
                    iVar289 = CONCAT22(auVar285._6_2_,sVar518);
                    Var84 = CONCAT64(CONCAT42(iVar289,auVar285._4_2_),
                                     CONCAT22(sVar393 * auVar83._0_2_,sVar518));
                    auVar87._4_8_ = (long)((unkuint10)Var84 >> 0x10);
                    auVar87._2_2_ = auVar285._2_2_;
                    auVar87._0_2_ = sVar392 * auVar82._0_2_;
                    iVar293 = auVar244._4_4_;
                    iVar311 = auVar244._8_4_;
                    iVar314 = auVar244._12_4_;
                    iVar290 = CONCAT22(auVar286._6_2_,sVar525);
                    Var132 = CONCAT64(CONCAT42(iVar290,auVar286._4_2_),
                                      CONCAT22(sVar393 * (short)((uint6)uVar224 >> 0x20),sVar525));
                    auVar88._4_8_ = (long)((unkuint10)Var132 >> 0x10);
                    auVar88._2_2_ = auVar286._2_2_;
                    auVar88._0_2_ = sVar392 * (short)((uint)uVar223 >> 0x10);
                    iVar430 = CONCAT22(in_XMM7._8_2_,sVar397 * auVar435._8_2_);
                    auVar460._0_8_ =
                         CONCAT26(in_XMM7._10_2_,CONCAT24(sVar429 * auVar437._10_2_,iVar430));
                    auVar460._8_2_ = sVar485 * auVar439._12_2_;
                    auVar460._10_2_ = in_XMM7._12_2_;
                    in_XMM8._12_2_ = auVar535._14_2_ * auVar440._14_2_;
                    in_XMM8._0_12_ = auVar460;
                    in_XMM8._14_2_ = in_XMM7._14_2_;
                    iVar176 = iVar176 + CONCAT22(in_XMM7._0_2_,auVar529._0_2_ * auVar434._0_2_) +
                              iVar430;
                    iVar142 = iVar142 + auVar85._0_4_ + (int)((ulong)auVar460._0_8_ >> 0x20);
                    iVar185 = iVar185 + (int)((unkuint10)Var78 >> 0x10) + auVar460._8_4_;
                    iVar189 = iVar189 + iVar261 + in_XMM8._12_4_;
                    iVar261 = CONCAT22(auVar418._8_2_,
                                       sVar397 * (short)((unkuint10)auVar362._0_10_ >> 0x40));
                    auVar487._0_8_ =
                         CONCAT26(auVar418._10_2_,CONCAT24(sVar429 * auVar362._10_2_,iVar261));
                    auVar487._8_2_ = sVar485 * auVar371._12_2_;
                    auVar487._10_2_ = auVar418._12_2_;
                    auVar494._12_2_ = auVar535._14_2_ * auVar212._14_2_;
                    auVar494._0_12_ = auVar487;
                    auVar494._14_2_ = auVar418._14_2_;
                    auVar350._0_4_ =
                         auVar350._0_4_ + CONCAT22(auVar418._0_2_,auVar529._0_2_ * sVar486) +
                         iVar261;
                    auVar350._4_4_ = iVar316 + auVar86._0_4_ + (int)((ulong)auVar487._0_8_ >> 0x20);
                    auVar350._8_4_ = iVar357 + (int)((unkuint10)Var81 >> 0x10) + auVar487._8_4_;
                    auVar350._12_4_ = iVar360 + iVar288 + auVar494._12_4_;
                    iVar261 = CONCAT22(auVar285._8_2_,sVar397 * auVar401._8_2_);
                    auVar509._0_8_ =
                         CONCAT26(auVar285._10_2_,CONCAT24(sVar429 * auVar515._10_2_,iVar261));
                    auVar509._8_2_ = sVar485 * auVar447._12_2_;
                    auVar509._10_2_ = auVar285._12_2_;
                    auVar510._12_2_ = auVar535._14_2_ * auVar344._14_2_;
                    auVar510._0_12_ = auVar509;
                    auVar510._14_2_ = auVar285._14_2_;
                    auVar244._0_4_ =
                         auVar244._0_4_ + CONCAT22(auVar285._0_2_,auVar529._0_2_ * auVar252._0_2_) +
                         iVar261;
                    auVar244._4_4_ = iVar293 + auVar87._0_4_ + (int)((ulong)auVar509._0_8_ >> 0x20);
                    auVar244._8_4_ = iVar311 + (int)((unkuint10)Var84 >> 0x10) + auVar509._8_4_;
                    auVar244._12_4_ = iVar314 + iVar289 + auVar510._12_4_;
                    iVar261 = CONCAT22(auVar286._8_2_,
                                       sVar397 * (short)((unkuint10)auVar318._0_10_ >> 0x40));
                    auVar519._0_8_ =
                         CONCAT26(auVar286._10_2_,CONCAT24(sVar429 * auVar318._10_2_,iVar261));
                    auVar519._8_2_ = sVar485 * auVar322._12_2_;
                    auVar519._10_2_ = auVar286._12_2_;
                    auVar522._12_2_ = auVar535._14_2_ * auVar388._14_2_;
                    auVar522._0_12_ = auVar519;
                    auVar522._14_2_ = auVar286._14_2_;
                    iVar292 = iVar292 + CONCAT22(auVar286._0_2_,auVar529._0_2_ * sVar312) + iVar261;
                    iVar310 = iVar310 + auVar88._0_4_ + (int)((ulong)auVar519._0_8_ >> 0x20);
                    iVar313 = iVar313 + (int)((unkuint10)Var132 >> 0x10) + auVar519._8_4_;
                    iVar315 = iVar315 + iVar290 + auVar522._12_4_;
                  }
                  pvVar162 = (void *)((long)pvVar162 + uVar135 * 0x20);
                }
                piVar193 = (int *)(local_718._0_8_ + uVar191 * 0x10);
                *piVar193 = iVar189 + iVar185 + iVar142 + iVar176;
                piVar193[1] = auVar350._12_4_ + auVar350._8_4_ + auVar350._4_4_ + auVar350._0_4_;
                piVar193[2] = auVar244._12_4_ + auVar244._8_4_ + auVar244._4_4_ + auVar244._0_4_;
                piVar193[3] = iVar315 + iVar313 + iVar310 + iVar292;
              }
              local_718._0_8_ = local_718._0_8_ + lVar163 * 0x10;
            }
          }
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    ((_Vector_base<int,_std::allocator<int>_> *)&opt_q);
        }
      }
LAB_0019c1bb:
      iVar189 = local_5f8.c;
      uVar199 = local_5f8.h;
      iVar185 = local_5f8.w;
      iVar142 = local_678.c;
      iVar176 = local_678.w;
      if ((iVar259 == 1) && (iVar169 == 4)) {
        p_Var45 = this->_vptr_Convolution_x86[-3];
        uVar165 = *(uint *)((long)&(this->weight_winograd23_data).d + (long)p_Var45);
        uVar135 = (ulong)uVar165;
        if (uVar165 == 7) {
          if ((((*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var45) != 7) ||
               (*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var45) != 1)) ||
              (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var45) != 1)) ||
             ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var45 + 4)) != 2 ||
              (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var45) != 2))))
          goto LAB_0019ca49;
          opt_q.lightmode = false;
          opt_q._1_3_ = 0;
          opt_q.num_threads = 0;
          opt_q.blob_allocator._0_4_ = 0;
          opt_q.blob_allocator._4_4_ = 0;
          opt_q.workspace_allocator._0_4_ = 0;
          opt_q.workspace_allocator._4_4_ = 0;
          opt_q.openmp_blocktime = 0;
          opt_q.use_bf16_storage = false;
          opt_q.use_fp16_packed = false;
          opt_q.use_fp16_storage = false;
          opt_q.use_fp16_arithmetic = false;
          opt_q.use_int8_packed = false;
          opt_q.use_int8_storage = false;
          opt_q.use_int8_arithmetic = false;
          opt_q.use_packing_layout = false;
          opt_q.use_shader_pack8 = false;
          opt_q.use_subgroup_basic = false;
          opt_q.use_subgroup_vote = false;
          opt_q.use_subgroup_ballot = false;
          opt_q.use_subgroup_shuffle = false;
          opt_q.use_image_storage = false;
          opt_q.use_tensor_storage = false;
          opt_q.use_reserved_0 = false;
          opt_q.flush_denormals = 0;
          opt_q.use_local_pool_allocator = false;
          opt_q.use_shader_local_memory = false;
          opt_q.use_cooperative_matrix = false;
          opt_q.use_winograd23_convolution = false;
          opt_q.use_winograd43_convolution = false;
          opt_q.use_winograd63_convolution = false;
          opt_q.use_reserved_6 = false;
          opt_q.use_reserved_7 = false;
          Mat::create((Mat *)&opt_q,local_5f8.h * local_5f8.w,0x31,local_678.c,1,1,
                      opt->workspace_allocator);
          uVar160 = 0;
          uVar135 = (ulong)uVar199;
          if ((int)uVar199 < 1) {
            uVar135 = uVar160;
          }
          uVar172 = (ulong)(uint)iVar142;
          if (iVar142 < 1) {
            uVar172 = uVar160;
          }
          for (; uVar160 != uVar172; uVar160 = uVar160 + 1) {
            lVar163 = opt_q._0_8_;
            for (lVar177 = 0; lVar177 != 7; lVar177 = lVar177 + 1) {
              for (lVar146 = 0; lVar146 != 7; lVar146 = lVar146 + 1) {
                puVar150 = (undefined1 *)
                           ((long)local_678.data +
                           lVar146 + (long)local_678.w * local_678.elemsize * lVar177 +
                                     local_678.cstep * uVar160 * local_678.elemsize);
                for (iVar142 = 0; iVar142 != (int)uVar135; iVar142 = iVar142 + 1) {
                  puVar170 = puVar150 + (iVar176 - iVar185) * 2;
                  puVar179 = puVar150;
                  for (lVar187 = 0; (int)lVar187 + 3 < iVar185; lVar187 = lVar187 + 4) {
                    *(undefined1 *)(lVar163 + lVar187) = *puVar179;
                    *(undefined1 *)(lVar163 + 1 + lVar187) = puVar179[2];
                    *(undefined1 *)(lVar163 + 2 + lVar187) = puVar179[4];
                    *(undefined1 *)(lVar163 + 3 + lVar187) = puVar179[6];
                    puVar179 = puVar179 + 8;
                    puVar170 = puVar170 + 8;
                  }
                  for (; (int)lVar187 + 1 < iVar185; lVar187 = lVar187 + 2) {
                    *(undefined1 *)(lVar163 + lVar187) = *puVar179;
                    *(undefined1 *)(lVar163 + 1 + lVar187) = puVar179[2];
                    puVar179 = puVar179 + 4;
                    puVar170 = puVar170 + 4;
                  }
                  for (; (int)lVar187 < iVar185; lVar187 = lVar187 + 1) {
                    *(undefined1 *)(lVar163 + lVar187) = puVar150[lVar187 * 2];
                    puVar170 = puVar170 + 2;
                  }
                  lVar163 = lVar163 + lVar187;
                  puVar150 = puVar170;
                }
              }
            }
          }
          im2col_sgemm_pack1to4_int8_sse((Mat *)&opt_q,&local_5f8,&this->weight_sgemm_data,opt);
          piVar193 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
          if (piVar193 != (int *)0x0) {
            LOCK();
            *piVar193 = *piVar193 + -1;
            UNLOCK();
            if (*piVar193 == 0) {
              if (opt_q._32_8_ == 0) goto LAB_0019e857;
              (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
            }
          }
        }
        else if (uVar165 == 3) {
          if (*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var45) != 3)
          goto LAB_0019ca49;
          if (((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var45) != 1) ||
              (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var45) != 1)) ||
             ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var45 + 4)) != 1 ||
              (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var45) != 1)))) {
            if ((((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var45) != 1) ||
                 (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var45) != 1)) ||
                (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var45 + 4)) != 2))
               || (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var45) != 2))
            goto LAB_0019ca49;
            opt_q.lightmode = false;
            opt_q._1_3_ = 0;
            opt_q.num_threads = 0;
            opt_q.blob_allocator._0_4_ = 0;
            opt_q.blob_allocator._4_4_ = 0;
            opt_q.workspace_allocator._0_4_ = 0;
            opt_q.workspace_allocator._4_4_ = 0;
            opt_q.openmp_blocktime = 0;
            opt_q.use_bf16_storage = false;
            opt_q.use_fp16_packed = false;
            opt_q.use_fp16_storage = false;
            opt_q.use_fp16_arithmetic = false;
            opt_q.use_int8_packed = false;
            opt_q.use_int8_storage = false;
            opt_q.use_int8_arithmetic = false;
            opt_q.use_packing_layout = false;
            opt_q.use_shader_pack8 = false;
            opt_q.use_subgroup_basic = false;
            opt_q.use_subgroup_vote = false;
            opt_q.use_subgroup_ballot = false;
            opt_q.use_subgroup_shuffle = false;
            opt_q.use_image_storage = false;
            opt_q.use_tensor_storage = false;
            opt_q.use_reserved_0 = false;
            opt_q.flush_denormals = 0;
            opt_q.use_local_pool_allocator = false;
            opt_q.use_shader_local_memory = false;
            opt_q.use_cooperative_matrix = false;
            opt_q.use_winograd23_convolution = false;
            opt_q.use_winograd43_convolution = false;
            opt_q.use_winograd63_convolution = false;
            opt_q.use_reserved_6 = false;
            opt_q.use_reserved_7 = false;
            Mat::create((Mat *)&opt_q,local_5f8.h * local_5f8.w,9,local_678.c,1,1,
                        opt->workspace_allocator);
            uVar160 = 0;
            uVar135 = (ulong)uVar199;
            if ((int)uVar199 < 1) {
              uVar135 = uVar160;
            }
            uVar172 = (ulong)(uint)iVar142;
            if (iVar142 < 1) {
              uVar172 = uVar160;
            }
            for (; uVar160 != uVar172; uVar160 = uVar160 + 1) {
              lVar163 = opt_q._0_8_;
              for (lVar177 = 0; lVar177 != 3; lVar177 = lVar177 + 1) {
                for (lVar146 = 0; lVar146 != 3; lVar146 = lVar146 + 1) {
                  puVar150 = (undefined1 *)
                             ((long)local_678.data +
                             lVar146 + (long)local_678.w * local_678.elemsize * lVar177 +
                                       local_678.cstep * uVar160 * local_678.elemsize);
                  for (iVar142 = 0; iVar142 != (int)uVar135; iVar142 = iVar142 + 1) {
                    puVar170 = puVar150 + (iVar176 - iVar185) * 2;
                    puVar179 = puVar150;
                    for (lVar187 = 0; (int)lVar187 + 3 < iVar185; lVar187 = lVar187 + 4) {
                      *(undefined1 *)(lVar163 + lVar187) = *puVar179;
                      *(undefined1 *)(lVar163 + 1 + lVar187) = puVar179[2];
                      *(undefined1 *)(lVar163 + 2 + lVar187) = puVar179[4];
                      *(undefined1 *)(lVar163 + 3 + lVar187) = puVar179[6];
                      puVar179 = puVar179 + 8;
                      puVar170 = puVar170 + 8;
                    }
                    for (; (int)lVar187 + 1 < iVar185; lVar187 = lVar187 + 2) {
                      *(undefined1 *)(lVar163 + lVar187) = *puVar179;
                      *(undefined1 *)(lVar163 + 1 + lVar187) = puVar179[2];
                      puVar179 = puVar179 + 4;
                      puVar170 = puVar170 + 4;
                    }
                    for (; (int)lVar187 < iVar185; lVar187 = lVar187 + 1) {
                      *(undefined1 *)(lVar163 + lVar187) = puVar150[lVar187 * 2];
                      puVar170 = puVar170 + 2;
                    }
                    lVar163 = lVar163 + lVar187;
                    puVar150 = puVar170;
                  }
                }
              }
            }
            im2col_sgemm_pack1to4_int8_sse((Mat *)&opt_q,&local_5f8,&this->weight_sgemm_data,opt);
            piVar193 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
            if (piVar193 != (int *)0x0) {
              LOCK();
              *piVar193 = *piVar193 + -1;
              UNLOCK();
              if (*piVar193 == 0) {
                if (opt_q._32_8_ == 0) goto LAB_0019e857;
                (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
              }
            }
            goto LAB_0019cfba;
          }
          opt_q.lightmode = false;
          opt_q._1_3_ = 0;
          opt_q.num_threads = 0;
          opt_q.blob_allocator._0_4_ = 0;
          opt_q.blob_allocator._4_4_ = 0;
          opt_q.workspace_allocator._0_4_ = 0;
          opt_q.workspace_allocator._4_4_ = 0;
          opt_q.openmp_blocktime = 0;
          opt_q.use_bf16_storage = false;
          opt_q.use_fp16_packed = false;
          opt_q.use_fp16_storage = false;
          opt_q.use_fp16_arithmetic = false;
          opt_q.use_int8_packed = false;
          opt_q.use_int8_storage = false;
          opt_q.use_int8_arithmetic = false;
          opt_q.use_packing_layout = false;
          opt_q.use_shader_pack8 = false;
          opt_q.use_subgroup_basic = false;
          opt_q.use_subgroup_vote = false;
          opt_q.use_subgroup_ballot = false;
          opt_q.use_subgroup_shuffle = false;
          opt_q.use_image_storage = false;
          opt_q.use_tensor_storage = false;
          opt_q.use_reserved_0 = false;
          opt_q.flush_denormals = 0;
          opt_q.use_local_pool_allocator = false;
          opt_q.use_shader_local_memory = false;
          opt_q.use_cooperative_matrix = false;
          opt_q.use_winograd23_convolution = false;
          opt_q.use_winograd43_convolution = false;
          opt_q.use_winograd63_convolution = false;
          opt_q.use_reserved_6 = false;
          opt_q.use_reserved_7 = false;
          Mat::create((Mat *)&opt_q,local_5f8.h * local_5f8.w,9,local_678.c,1,1,
                      opt->workspace_allocator);
          uVar160 = 0;
          uVar135 = (ulong)uVar199;
          if ((int)uVar199 < 1) {
            uVar135 = uVar160;
          }
          uVar172 = (ulong)(uint)iVar142;
          if (iVar142 < 1) {
            uVar172 = uVar160;
          }
          for (; uVar160 != uVar172; uVar160 = uVar160 + 1) {
            lVar163 = opt_q._0_8_;
            for (lVar177 = 0; lVar177 != 3; lVar177 = lVar177 + 1) {
              for (lVar146 = 0; lVar146 != 3; lVar146 = lVar146 + 1) {
                lVar187 = (long)local_678.data +
                          lVar146 + (long)local_678.w * local_678.elemsize * lVar177 +
                                    local_678.cstep * uVar160 * local_678.elemsize;
                for (iVar142 = 0; iVar142 != (int)uVar135; iVar142 = iVar142 + 1) {
                  for (lVar178 = 0; (int)lVar178 + 3 < iVar185; lVar178 = lVar178 + 4) {
                    *(undefined1 *)(lVar163 + lVar178) = *(undefined1 *)(lVar187 + lVar178);
                    *(undefined1 *)(lVar163 + 1 + lVar178) = *(undefined1 *)(lVar187 + 1 + lVar178);
                    *(undefined1 *)(lVar163 + 2 + lVar178) = *(undefined1 *)(lVar187 + 2 + lVar178);
                    *(undefined1 *)(lVar163 + 3 + lVar178) = *(undefined1 *)(lVar187 + 3 + lVar178);
                  }
                  for (; (int)lVar178 + 1 < iVar185; lVar178 = lVar178 + 2) {
                    *(undefined1 *)(lVar163 + lVar178) = *(undefined1 *)(lVar187 + lVar178);
                    *(undefined1 *)(lVar163 + 1 + lVar178) = *(undefined1 *)(lVar187 + 1 + lVar178);
                  }
                  for (; (int)lVar178 < iVar185; lVar178 = lVar178 + 1) {
                    *(undefined1 *)(lVar163 + lVar178) = *(undefined1 *)(lVar187 + lVar178);
                  }
                  lVar187 = lVar187 + (iVar176 - iVar185) + lVar178;
                  lVar163 = lVar163 + lVar178;
                }
              }
            }
          }
          im2col_sgemm_pack1to4_int8_sse((Mat *)&opt_q,&local_5f8,&this->weight_sgemm_data,opt);
          piVar193 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
          if (piVar193 == (int *)0x0) goto LAB_0019cfba;
          LOCK();
          *piVar193 = *piVar193 + -1;
          UNLOCK();
          if (*piVar193 != 0) goto LAB_0019cfba;
          if (opt_q._32_8_ != 0) {
            (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
            goto LAB_0019cfba;
          }
LAB_0019e857:
          free((void *)opt_q._0_8_);
        }
        else {
          if ((uVar165 == 1) &&
             (*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var45) == 1)) {
            if (((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var45) == 1) &&
                ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var45) == 1 &&
                 (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var45 + 4)) == 1))
                )) && (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var45) == 1)) {
              conv1x1s1_sgemm_pack1to4_int8_sse(&local_678,&local_5f8,&this->weight_sgemm_data,opt);
              goto LAB_0019e48e;
            }
            if ((((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var45) == 1) &&
                 (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var45) == 1)) &&
                (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var45 + 4)) == 2))
               && (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var45) == 2)) {
              opt_q.lightmode = false;
              opt_q._1_3_ = 0;
              opt_q.num_threads = 0;
              opt_q.blob_allocator._0_4_ = 0;
              opt_q.blob_allocator._4_4_ = 0;
              opt_q.workspace_allocator._0_4_ = 0;
              opt_q.workspace_allocator._4_4_ = 0;
              opt_q.openmp_blocktime = 0;
              opt_q.use_bf16_storage = false;
              opt_q.use_fp16_packed = false;
              opt_q.use_fp16_storage = false;
              opt_q.use_fp16_arithmetic = false;
              opt_q.use_int8_packed = false;
              opt_q.use_int8_storage = false;
              opt_q.use_int8_arithmetic = false;
              opt_q.use_packing_layout = false;
              opt_q.use_shader_pack8 = false;
              opt_q.use_subgroup_basic = false;
              opt_q.use_subgroup_vote = false;
              opt_q.use_subgroup_ballot = false;
              opt_q.use_subgroup_shuffle = false;
              opt_q.use_image_storage = false;
              opt_q.use_tensor_storage = false;
              opt_q.use_reserved_0 = false;
              opt_q.flush_denormals = 0;
              opt_q.use_local_pool_allocator = false;
              opt_q.use_shader_local_memory = false;
              opt_q.use_cooperative_matrix = false;
              opt_q.use_winograd23_convolution = false;
              opt_q.use_winograd43_convolution = false;
              opt_q.use_winograd63_convolution = false;
              opt_q.use_reserved_6 = false;
              opt_q.use_reserved_7 = false;
              Mat::create((Mat *)&opt_q,local_5f8.w,local_5f8.h,local_678.c,local_678.elemsize,
                          local_678.elempack,opt->workspace_allocator);
              uVar135 = 0;
              if ((int)uVar199 < 1) {
                uVar199 = 0;
              }
              uVar160 = (ulong)(uint)iVar142;
              if (iVar142 < 1) {
                uVar160 = uVar135;
              }
              for (; uVar135 != uVar160; uVar135 = uVar135 + 1) {
                puVar150 = (undefined1 *)
                           (local_678.cstep * uVar135 * local_678.elemsize + (long)local_678.data);
                lVar163 = opt_q._0_8_;
                for (uVar165 = 0; uVar165 != uVar199; uVar165 = uVar165 + 1) {
                  puVar170 = puVar150 + (iVar176 - iVar185) * 2;
                  puVar179 = puVar150;
                  for (lVar177 = 0; (int)lVar177 + 3 < iVar185; lVar177 = lVar177 + 4) {
                    *(undefined1 *)(lVar163 + lVar177) = *puVar179;
                    *(undefined1 *)(lVar163 + 1 + lVar177) = puVar179[2];
                    *(undefined1 *)(lVar163 + 2 + lVar177) = puVar179[4];
                    *(undefined1 *)(lVar163 + 3 + lVar177) = puVar179[6];
                    puVar179 = puVar179 + 8;
                    puVar170 = puVar170 + 8;
                  }
                  for (; (int)lVar177 + 1 < iVar185; lVar177 = lVar177 + 2) {
                    *(undefined1 *)(lVar163 + lVar177) = *puVar179;
                    *(undefined1 *)(lVar163 + 1 + lVar177) = puVar179[2];
                    puVar179 = puVar179 + 4;
                    puVar170 = puVar170 + 4;
                  }
                  for (; (int)lVar177 < iVar185; lVar177 = lVar177 + 1) {
                    *(undefined1 *)(lVar163 + lVar177) = puVar150[lVar177 * 2];
                    puVar170 = puVar170 + 2;
                  }
                  lVar163 = lVar163 + lVar177;
                  puVar150 = puVar170;
                }
              }
              conv1x1s1_sgemm_pack1to4_int8_sse
                        ((Mat *)&opt_q,&local_5f8,&this->weight_sgemm_data,opt);
              piVar193 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
              if (piVar193 != (int *)0x0) {
                LOCK();
                *piVar193 = *piVar193 + -1;
                UNLOCK();
                if (*piVar193 == 0) {
                  if (opt_q._32_8_ == 0) goto LAB_0019e857;
                  (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
                }
              }
              goto LAB_0019cfba;
            }
          }
LAB_0019ca49:
          uVar148 = *(uint *)((long)&(this->weight_winograd23_data).c + (long)p_Var45);
          iVar141 = *(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var45);
          iVar256 = *(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var45);
          iVar292 = *(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var45 + 4));
          lVar163 = (long)iVar292;
          iVar310 = *(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var45);
          lVar177 = (long)local_5f8.w;
          uVar190 = uVar148 * uVar165;
          if (opt->use_sgemm_convolution == true) {
            opt_q.lightmode = false;
            opt_q._1_3_ = 0;
            opt_q.num_threads = 0;
            opt_q.blob_allocator._0_4_ = 0;
            opt_q.blob_allocator._4_4_ = 0;
            opt_q.workspace_allocator._0_4_ = 0;
            opt_q.workspace_allocator._4_4_ = 0;
            opt_q.openmp_blocktime = 0;
            opt_q.use_bf16_storage = false;
            opt_q.use_fp16_packed = false;
            opt_q.use_fp16_storage = false;
            opt_q.use_fp16_arithmetic = false;
            opt_q.use_int8_packed = false;
            opt_q.use_int8_storage = false;
            opt_q.use_int8_arithmetic = false;
            opt_q.use_packing_layout = false;
            opt_q.use_shader_pack8 = false;
            opt_q.use_subgroup_basic = false;
            opt_q.use_subgroup_vote = false;
            opt_q.use_subgroup_ballot = false;
            opt_q.use_subgroup_shuffle = false;
            opt_q.use_image_storage = false;
            opt_q.use_tensor_storage = false;
            opt_q.use_reserved_0 = false;
            opt_q.flush_denormals = 0;
            opt_q.use_local_pool_allocator = false;
            opt_q.use_shader_local_memory = false;
            opt_q.use_cooperative_matrix = false;
            opt_q.use_winograd23_convolution = false;
            opt_q.use_winograd43_convolution = false;
            opt_q.use_winograd63_convolution = false;
            opt_q.use_reserved_6 = false;
            opt_q.use_reserved_7 = false;
            Mat::create((Mat *)&opt_q,local_5f8.h * local_5f8.w,uVar190,local_678.c,1,1,
                        opt->workspace_allocator);
            lVar177 = (long)(iVar292 * 2);
            uVar160 = 0;
            if ((int)uVar199 < 1) {
              uVar199 = 0;
            }
            if ((int)uVar165 < 1) {
              uVar135 = uVar160;
            }
            uVar172 = (ulong)uVar148;
            if ((int)uVar148 < 1) {
              uVar172 = uVar160;
            }
            uVar175 = (ulong)(uint)iVar142;
            if (iVar142 < 1) {
              uVar175 = uVar160;
            }
            for (; uVar160 != uVar175; uVar160 = uVar160 + 1) {
              lVar146 = opt_q._0_8_;
              for (uVar192 = 0; uVar192 != uVar172; uVar192 = uVar192 + 1) {
                for (uVar159 = 0; uVar159 != uVar135; uVar159 = uVar159 + 1) {
                  puVar150 = (undefined1 *)
                             ((long)local_678.data +
                             uVar159 * (long)iVar141 +
                             (long)local_678.w * local_678.elemsize * (long)iVar256 * uVar192 +
                             local_678.cstep * uVar160 * local_678.elemsize);
                  for (uVar165 = 0; uVar165 != uVar199; uVar165 = uVar165 + 1) {
                    lVar178 = 0;
                    puVar170 = puVar150;
                    for (lVar187 = 0; (int)lVar187 + 3 < iVar185; lVar187 = lVar187 + 4) {
                      *(undefined1 *)(lVar146 + lVar187) = *puVar170;
                      *(undefined1 *)(lVar146 + 1 + lVar187) = puVar170[lVar163];
                      *(undefined1 *)(lVar146 + 2 + lVar187) = puVar170[lVar177];
                      *(undefined1 *)(lVar146 + 3 + lVar187) = puVar170[iVar292 * 3];
                      puVar170 = puVar170 + iVar292 * 4;
                      lVar178 = lVar178 + iVar292 * 4;
                    }
                    for (; (int)lVar187 + 1 < iVar185; lVar187 = lVar187 + 2) {
                      *(undefined1 *)(lVar146 + lVar187) = *puVar170;
                      *(undefined1 *)(lVar146 + 1 + lVar187) = puVar170[lVar163];
                      puVar170 = puVar170 + lVar177;
                      lVar178 = lVar178 + lVar177;
                    }
                    for (; (int)lVar187 < iVar185; lVar187 = lVar187 + 1) {
                      *(undefined1 *)(lVar146 + lVar187) = puVar150[lVar178];
                      lVar178 = lVar178 + lVar163;
                    }
                    puVar150 = puVar150 + lVar178 + (iVar176 * iVar310 - iVar185 * iVar292);
                    lVar146 = lVar146 + lVar187;
                  }
                }
              }
            }
            im2col_sgemm_pack1to4_int8_sse((Mat *)&opt_q,&local_5f8,&this->weight_sgemm_data,opt);
            piVar193 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
            if (piVar193 != (int *)0x0) {
              LOCK();
              *piVar193 = *piVar193 + -1;
              UNLOCK();
              if (*piVar193 == 0) {
                if (opt_q._32_8_ == 0) goto LAB_0019e857;
                (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
              }
            }
          }
          else {
            uVar160 = (ulong)(uint)local_5f8.c;
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)&opt_q,(long)(int)uVar190,
                       (allocator_type *)&local_558);
            local_718._0_4_ = iVar176 * iVar256 - iVar141 * uVar165;
            uVar140 = 0;
            if ((int)uVar165 < 1) {
              uVar135 = 0;
            }
            if ((int)uVar148 < 1) {
              uVar148 = 0;
            }
            iVar292 = (int)uVar135;
            iVar256 = 0;
            iVar176 = 0;
            for (; uVar140 != uVar148; uVar140 = uVar140 + 1) {
              for (lVar146 = (long)iVar176; (int)uVar135 != lVar146; lVar146 = lVar146 + 1) {
                *(int *)(opt_q._0_8_ + lVar146 * 4) = iVar256;
                iVar256 = iVar256 + iVar141;
              }
              iVar256 = iVar256 + local_718._0_4_;
              uVar135 = (ulong)(uint)((int)uVar135 + iVar292);
              iVar176 = iVar176 + iVar292;
            }
            uVar172 = 0;
            uVar135 = (ulong)uVar190;
            if ((int)uVar190 < 1) {
              uVar135 = uVar172;
            }
            uVar175 = (ulong)(uint)iVar142;
            if (iVar142 < 1) {
              uVar175 = uVar172;
            }
            uVar192 = 0;
            if (0 < iVar185) {
              uVar192 = (ulong)(uint)iVar185;
            }
            uVar159 = (ulong)uVar199;
            if ((int)uVar199 < 1) {
              uVar159 = uVar172;
            }
            if (iVar189 < 1) {
              uVar160 = uVar172;
            }
            for (; uVar172 != uVar160; uVar172 = uVar172 + 1) {
              local_718._0_8_ =
                   (void *)(local_5f8.cstep * uVar172 * local_5f8.elemsize + (long)local_5f8.data);
              for (uVar174 = 0; uVar174 != uVar159; uVar174 = uVar174 + 1) {
                for (uVar191 = 0; uVar191 != uVar192; uVar191 = uVar191 + 1) {
                  pvVar162 = (void *)((this->weight_data_tm).cstep * uVar172 *
                                      (this->weight_data_tm).elemsize +
                                     (long)(this->weight_data_tm).data);
                  iVar176 = 0;
                  iVar142 = 0;
                  iVar185 = 0;
                  iVar189 = 0;
                  for (uVar151 = 0; uVar151 != uVar175; uVar151 = uVar151 + 1) {
                    for (uVar180 = 0; uVar135 != uVar180; uVar180 = uVar180 + 1) {
                      auVar286 = ZEXT416((uint)(int)*(char *)((long)local_678.data +
                                                             (long)*(int *)(opt_q._0_8_ +
                                                                           uVar180 * 4) +
                                                             local_678.cstep * local_678.elemsize *
                                                             uVar151 + uVar191 * lVar163 +
                                                                       (long)local_678.w *
                                                                       uVar174 * (long)iVar310 *
                                                                       local_678.elemsize));
                      auVar286 = pshuflw(auVar286,auVar286,0);
                      auVar230._0_4_ = auVar286._0_4_;
                      auVar230._4_4_ = auVar230._0_4_;
                      auVar230._8_4_ = auVar230._0_4_;
                      auVar230._12_4_ = auVar230._0_4_;
                      uVar7 = *(ulong *)((long)pvVar162 + uVar180 * 4);
                      cVar217 = (char)(uVar7 >> 8);
                      cVar218 = (char)(uVar7 >> 0x10);
                      cVar219 = (char)(uVar7 >> 0x18);
                      cVar220 = (char)(uVar7 >> 0x20);
                      cVar221 = (char)(uVar7 >> 0x28);
                      cVar222 = (char)(uVar7 >> 0x30);
                      auVar276._8_6_ = 0;
                      auVar276._0_8_ = uVar7;
                      auVar276[0xe] = (char)(uVar7 >> 0x38);
                      auVar276[0xf] = -((long)uVar7 < 0);
                      auVar275._14_2_ = auVar276._14_2_;
                      auVar275._8_5_ = 0;
                      auVar275._0_8_ = uVar7;
                      auVar275[0xd] = -(cVar222 < '\0');
                      auVar274._13_3_ = auVar275._13_3_;
                      auVar274._8_4_ = 0;
                      auVar274._0_8_ = uVar7;
                      auVar274[0xc] = cVar222;
                      auVar273._12_4_ = auVar274._12_4_;
                      auVar273._8_3_ = 0;
                      auVar273._0_8_ = uVar7;
                      auVar273[0xb] = -(cVar221 < '\0');
                      auVar272._11_5_ = auVar273._11_5_;
                      auVar272._8_2_ = 0;
                      auVar272._0_8_ = uVar7;
                      auVar272[10] = cVar221;
                      auVar271._10_6_ = auVar272._10_6_;
                      auVar271[8] = 0;
                      auVar271._0_8_ = uVar7;
                      auVar271[9] = -(cVar220 < '\0');
                      auVar270._9_7_ = auVar271._9_7_;
                      auVar270[8] = cVar220;
                      auVar270._0_8_ = uVar7;
                      Var78 = CONCAT91(CONCAT81(auVar270._8_8_,-(cVar219 < '\0')),cVar219);
                      auVar90._2_10_ = Var78;
                      auVar90[1] = -(cVar218 < '\0');
                      auVar90[0] = cVar218;
                      auVar89._2_12_ = auVar90;
                      auVar89[1] = -(cVar217 < '\0');
                      auVar89[0] = cVar217;
                      auVar269._0_2_ = CONCAT11(-((char)uVar7 < '\0'),(char)uVar7);
                      auVar269._2_14_ = auVar89;
                      sVar312 = auVar286._2_2_ * (short)Var78;
                      auVar418 = pmulhw(auVar269,auVar230);
                      iVar141 = CONCAT22(auVar418._6_2_,sVar312);
                      Var78 = CONCAT64(CONCAT42(iVar141,auVar418._4_2_),
                                       CONCAT22(auVar286._0_2_ * auVar90._0_2_,sVar312));
                      auVar91._4_8_ = (long)((unkuint10)Var78 >> 0x10);
                      auVar91._2_2_ = auVar418._2_2_;
                      auVar91._0_2_ = auVar286._2_2_ * auVar89._0_2_;
                      iVar176 = iVar176 + CONCAT22(auVar418._0_2_,auVar286._0_2_ * auVar269._0_2_);
                      iVar142 = iVar142 + auVar91._0_4_;
                      iVar185 = iVar185 + (int)((unkuint10)Var78 >> 0x10);
                      iVar189 = iVar189 + iVar141;
                    }
                    pvVar162 = (void *)((long)pvVar162 + uVar135 * 4);
                  }
                  piVar193 = (int *)(local_718._0_8_ + uVar191 * 0x10);
                  *piVar193 = iVar176;
                  piVar193[1] = iVar142;
                  piVar193[2] = iVar185;
                  piVar193[3] = iVar189;
                }
                local_718._0_8_ = local_718._0_8_ + lVar177 * 0x10;
              }
            }
            std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                      ((_Vector_base<int,_std::allocator<int>_> *)&opt_q);
          }
        }
      }
LAB_0019cfba:
      iVar189 = local_5f8.c;
      uVar199 = local_5f8.h;
      iVar185 = local_5f8.w;
      sVar184 = local_678.cstep;
      iVar142 = local_678.c;
      iVar176 = local_678.w;
      if ((iVar259 == 8) && (iVar169 == 1)) {
        p_Var45 = this->_vptr_Convolution_x86[-3];
        uVar165 = *(uint *)((long)&(this->weight_winograd23_data).d + (long)p_Var45);
        uVar135 = (ulong)uVar165;
        if ((uVar165 == 1) &&
           (*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var45) == 1)) {
          if ((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var45) == 1) &&
             (((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var45) == 1 &&
               (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var45 + 4)) == 1))
              && (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var45) == 1)))) {
            conv1x1s1_sgemm_pack8to1_int8_sse(&local_678,&local_5f8,&this->weight_sgemm_data,opt);
          }
          else {
            if ((((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var45) != 1) ||
                 (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var45) != 1)) ||
                (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var45 + 4)) != 2))
               || (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var45) != 2))
            goto LAB_0019d237;
            opt_q.lightmode = false;
            opt_q._1_3_ = 0;
            opt_q.num_threads = 0;
            opt_q.blob_allocator._0_4_ = 0;
            opt_q.blob_allocator._4_4_ = 0;
            opt_q.workspace_allocator._0_4_ = 0;
            opt_q.workspace_allocator._4_4_ = 0;
            opt_q.openmp_blocktime = 0;
            opt_q.use_bf16_storage = false;
            opt_q.use_fp16_packed = false;
            opt_q.use_fp16_storage = false;
            opt_q.use_fp16_arithmetic = false;
            opt_q.use_int8_packed = false;
            opt_q.use_int8_storage = false;
            opt_q.use_int8_arithmetic = false;
            opt_q.use_packing_layout = false;
            opt_q.use_shader_pack8 = false;
            opt_q.use_subgroup_basic = false;
            opt_q.use_subgroup_vote = false;
            opt_q.use_subgroup_ballot = false;
            opt_q.use_subgroup_shuffle = false;
            opt_q.use_image_storage = false;
            opt_q.use_tensor_storage = false;
            opt_q.use_reserved_0 = false;
            opt_q.flush_denormals = 0;
            opt_q.use_local_pool_allocator = false;
            opt_q.use_shader_local_memory = false;
            opt_q.use_cooperative_matrix = false;
            opt_q.use_winograd23_convolution = false;
            opt_q.use_winograd43_convolution = false;
            opt_q.use_winograd63_convolution = false;
            opt_q.use_reserved_6 = false;
            opt_q.use_reserved_7 = false;
            Mat::create((Mat *)&opt_q,local_5f8.w,local_5f8.h,local_678.c,local_678.elemsize,
                        local_678.elempack,opt->workspace_allocator);
            uVar160 = 0;
            uVar135 = (ulong)(uint)iVar185;
            if (iVar185 < 1) {
              uVar135 = uVar160;
            }
            if ((int)uVar199 < 1) {
              uVar199 = 0;
            }
            uVar172 = (ulong)(uint)iVar142;
            if (iVar142 < 1) {
              uVar172 = uVar160;
            }
            for (; uVar160 != uVar172; uVar160 = uVar160 + 1) {
              puVar166 = (undefined8 *)
                         (local_678.cstep * uVar160 * local_678.elemsize + (long)local_678.data);
              puVar167 = (undefined8 *)opt_q._0_8_;
              for (uVar165 = 0; uVar175 = uVar135, uVar165 != uVar199; uVar165 = uVar165 + 1) {
                while (iVar259 = (int)uVar175, uVar175 = (ulong)(iVar259 - 1), iVar259 != 0) {
                  *puVar167 = *puVar166;
                  puVar166 = puVar166 + 2;
                  puVar167 = puVar167 + 1;
                }
                puVar166 = puVar166 + (iVar176 - iVar185) * 2;
              }
            }
            conv1x1s1_sgemm_pack8to1_int8_sse((Mat *)&opt_q,&local_5f8,&this->weight_sgemm_data,opt)
            ;
            piVar193 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
            if (piVar193 != (int *)0x0) {
              LOCK();
              *piVar193 = *piVar193 + -1;
              UNLOCK();
              if (*piVar193 == 0) {
                pvVar162 = (void *)opt_q._0_8_;
                if (opt_q._32_8_ == 0) goto LAB_001a214b;
                (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
              }
            }
          }
        }
        else {
LAB_0019d237:
          if (((opt->use_winograd_convolution == true) && (uVar165 == 3)) &&
             ((opt->use_winograd43_convolution != false &&
              ((((*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var45) == 3 &&
                 (*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var45) == 1)) &&
                (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var45) == 1)) &&
               ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var45 + 4)) == 1 &&
                (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var45) == 1)))))))) {
            iVar185 = cpu_support_x86_xop();
            iVar142 = local_5f8.c;
            iVar259 = local_678.c;
            iVar176 = local_678.elempack;
            if (iVar185 == 0) {
              uVar135 = (ulong)local_5f8.c;
              piVar193 = (int *)CONCAT44(local_678.refcount._4_4_,local_678.refcount._0_4_);
              local_558.data = local_678.data;
              local_558.refcount._0_4_ = local_678.refcount._0_4_;
              local_558.refcount._4_4_ = local_678.refcount._4_4_;
              local_558.elemsize = local_678.elemsize;
              local_558.elempack = local_678.elempack;
              local_558.allocator = local_678.allocator;
              local_558.d = local_678.d;
              local_558.h = local_678.h;
              local_558.dims = local_678.dims;
              local_558.w = local_678.w;
              local_558.c = local_678.c;
              local_558.cstep = local_678.cstep;
              if (piVar193 != (int *)0x0) {
                LOCK();
                *piVar193 = *piVar193 + 1;
                UNLOCK();
              }
              auVar279._0_4_ = ((uint)((int)(local_5f8.w + 3U) >> 0x1f) >> 0x1e) + local_5f8.w + 3U;
              auVar279._4_4_ = ((uint)((int)(local_5f8.h + 3U) >> 0x1f) >> 0x1e) + local_5f8.h + 3U;
              auVar279._8_8_ = 0;
              uVar148 = SUB164(_DAT_004c6870 & auVar279,0);
              uVar190 = SUB164(_DAT_004c6870 & auVar279,4);
              local_600 = (ulong)uVar148;
              copy_make_border(&local_678,&local_558,0,(uVar190 + 2) - local_678.h,0,
                               (uVar148 + 2) - local_678.w,0,0.0,opt);
              uVar199 = auVar279._0_4_ >> 2;
              uVar165 = auVar279._4_4_ >> 2;
              local_568 = 0;
              iVar189 = uVar199 * 6;
              iVar169 = iVar189 * uVar165;
              d0[0] = 0;
              d0[1] = 0;
              d0[2] = 0;
              d0[3] = 0;
              local_588 = (Allocator *)0x0;
              iStack_580 = 0;
              iStack_57c = 0;
              auStack_578 = SUB1612((undefined1  [16])0x0,4);
              iVar141 = (int)((long)iVar169 / 6);
              Mat::create((Mat *)d0,iVar141,0x24,iVar259,(ulong)(uint)(iVar176 * 2),iVar176,
                          opt->workspace_allocator);
              iVar185 = local_678.c;
              auVar286 = _DAT_004c6910;
              asVar145[0] = 0;
              asVar145[1] = 0;
              asVar145[2] = 0;
              asVar145[3] = 0;
              asVar173[2] = 0;
              asVar173[3] = 0;
              asVar173[0] = (short)uVar199;
              asVar173[1] = (short)(uVar199 >> 0x10);
              if ((int)uVar199 < 1) {
                asVar173 = asVar145;
              }
              local_608[2] = 0;
              local_608[3] = 0;
              local_608[0] = (short)uVar165;
              local_608[1] = (short)(uVar165 >> 0x10);
              if ((int)uVar165 < 1) {
                local_608 = asVar145;
              }
              asVar198[0] = 0;
              asVar198[1] = 0;
              asVar198[2] = 0;
              asVar198[3] = 0;
              if (0 < iVar259) {
                asVar198[2] = 0;
                asVar198[3] = 0;
                local_678.c._0_2_ = (undefined2)iVar259;
                local_678.c._2_2_ = SUB42(iVar259,2);
                asVar198[0] = (undefined2)local_678.c;
                asVar198[1] = local_678.c._2_2_;
              }
              for (; asVar145 != asVar198; asVar145 = (short  [4])((long)asVar145 + 1)) {
                pauVar194 = (undefined1 (*) [16])
                            ((long)local_558.data +
                            local_558.cstep * local_558.elemsize * (long)asVar145 + 0x20);
                asVar144[0] = 0;
                asVar144[1] = 0;
                asVar144[2] = 0;
                asVar144[3] = 0;
                for (; asVar144 != local_608; asVar144 = (short  [4])((long)asVar144 + 1)) {
                  pauVar137 = (undefined1 (*) [16])
                              ((long)((iVar189 * asVar144._0_4_) / 6) * 0x10 + (long)d0);
                  asVar195[0] = 0;
                  asVar195[1] = 0;
                  asVar195[2] = 0;
                  asVar195[3] = 0;
                  pauVar136 = pauVar194;
                  for (; lVar163 = -0x60, pauVar152 = pauVar136, asVar195 != asVar173;
                      asVar195 = (short  [4])((long)asVar195 + 1)) {
                    while( true ) {
                      sVar312 = auVar286._0_2_;
                      sVar486 = auVar286._2_2_;
                      sVar392 = auVar286._4_2_;
                      sVar393 = auVar286._6_2_;
                      sVar525 = auVar286._8_2_;
                      sVar484 = auVar286._10_2_;
                      sVar397 = auVar286._12_2_;
                      sVar429 = auVar286._14_2_;
                      pauVar143 = pauVar137;
                      lVar177 = 0x50;
                      if (lVar163 == 0) break;
                      auVar418 = pauVar152[-2];
                      auVar244 = pauVar152[-1];
                      auVar350 = *pauVar152;
                      auVar417._0_14_ = auVar418._0_14_;
                      auVar417[0xe] = auVar418[7];
                      auVar417[0xf] = -(auVar418[7] < '\0');
                      auVar416._14_2_ = auVar417._14_2_;
                      auVar416._0_13_ = auVar418._0_13_;
                      auVar416[0xd] = -(auVar418[6] < '\0');
                      auVar415._13_3_ = auVar416._13_3_;
                      auVar415._0_12_ = auVar418._0_12_;
                      auVar415[0xc] = auVar418[6];
                      auVar414._12_4_ = auVar415._12_4_;
                      auVar414._0_11_ = auVar418._0_11_;
                      auVar414[0xb] = -(auVar418[5] < '\0');
                      auVar413._11_5_ = auVar414._11_5_;
                      auVar413._0_10_ = auVar418._0_10_;
                      auVar413[10] = auVar418[5];
                      auVar412._10_6_ = auVar413._10_6_;
                      auVar412._0_9_ = auVar418._0_9_;
                      auVar412[9] = -(auVar418[4] < '\0');
                      auVar411._9_7_ = auVar412._9_7_;
                      auVar411._0_8_ = auVar418._0_8_;
                      auVar411[8] = auVar418[4];
                      auVar410._8_8_ = auVar411._8_8_;
                      auVar410[7] = -(auVar418[3] < '\0');
                      auVar410[6] = auVar418[3];
                      auVar410[5] = -(auVar418[2] < '\0');
                      auVar410[4] = auVar418[2];
                      auVar410[3] = -(auVar418[1] < '\0');
                      auVar410[2] = auVar418[1];
                      auVar410[1] = -(auVar418[0] < '\0');
                      auVar410[0] = auVar418[0];
                      sVar539 = CONCAT11(-(auVar418[8] < '\0'),auVar418[8]);
                      uVar260 = CONCAT13(-(auVar418[9] < '\0'),CONCAT12(auVar418[9],sVar539));
                      uVar262 = CONCAT15(-(auVar418[10] < '\0'),CONCAT14(auVar418[10],uVar260));
                      uVar263 = CONCAT17(-(auVar418[0xb] < '\0'),CONCAT16(auVar418[0xb],uVar262));
                      auVar266._0_10_ =
                           CONCAT19(-(auVar418[0xc] < '\0'),CONCAT18(auVar418[0xc],uVar263));
                      auVar266[10] = auVar418[0xd];
                      auVar266[0xb] = -(auVar418[0xd] < '\0');
                      auVar268[0xc] = auVar418[0xe];
                      auVar268._0_12_ = auVar266;
                      auVar268[0xd] = -(auVar418[0xe] < '\0');
                      auVar280[0xe] = auVar418[0xf];
                      auVar280._0_14_ = auVar268;
                      auVar280[0xf] = -(auVar418[0xf] < '\0');
                      auVar477._0_14_ = auVar244._0_14_;
                      auVar477[0xe] = auVar244[7];
                      auVar477[0xf] = -(auVar244[7] < '\0');
                      auVar476._14_2_ = auVar477._14_2_;
                      auVar476._0_13_ = auVar244._0_13_;
                      auVar476[0xd] = -(auVar244[6] < '\0');
                      auVar475._13_3_ = auVar476._13_3_;
                      auVar475._0_12_ = auVar244._0_12_;
                      auVar475[0xc] = auVar244[6];
                      auVar474._12_4_ = auVar475._12_4_;
                      auVar474._0_11_ = auVar244._0_11_;
                      auVar474[0xb] = -(auVar244[5] < '\0');
                      auVar473._11_5_ = auVar474._11_5_;
                      auVar473._0_10_ = auVar244._0_10_;
                      auVar473[10] = auVar244[5];
                      auVar472._10_6_ = auVar473._10_6_;
                      auVar472._0_9_ = auVar244._0_9_;
                      auVar472[9] = -(auVar244[4] < '\0');
                      auVar471._9_7_ = auVar472._9_7_;
                      auVar471._0_8_ = auVar244._0_8_;
                      auVar471[8] = auVar244[4];
                      Var78 = CONCAT91(CONCAT81(auVar471._8_8_,-(auVar244[3] < '\0')),auVar244[3]);
                      auVar102._2_10_ = Var78;
                      auVar102[1] = -(auVar244[2] < '\0');
                      auVar102[0] = auVar244[2];
                      auVar101._2_12_ = auVar102;
                      auVar101[1] = -(auVar244[1] < '\0');
                      auVar101[0] = auVar244[1];
                      sVar361 = CONCAT11(-(auVar244[0] < '\0'),auVar244[0]);
                      sVar485 = CONCAT11(-(auVar244[8] < '\0'),auVar244[8]);
                      uVar223 = CONCAT13(-(auVar244[9] < '\0'),CONCAT12(auVar244[9],sVar485));
                      uVar224 = CONCAT15(-(auVar244[10] < '\0'),CONCAT14(auVar244[10],uVar223));
                      uVar225 = CONCAT17(-(auVar244[0xb] < '\0'),CONCAT16(auVar244[0xb],uVar224));
                      auVar227._0_10_ =
                           CONCAT19(-(auVar244[0xc] < '\0'),CONCAT18(auVar244[0xc],uVar225));
                      auVar227[10] = auVar244[0xd];
                      auVar227[0xb] = -(auVar244[0xd] < '\0');
                      auVar229[0xc] = auVar244[0xe];
                      auVar229._0_12_ = auVar227;
                      auVar229[0xd] = -(auVar244[0xe] < '\0');
                      auVar242[0xe] = auVar244[0xf];
                      auVar242._0_14_ = auVar229;
                      auVar242[0xf] = -(auVar244[0xf] < '\0');
                      auVar336._0_14_ = auVar350._0_14_;
                      auVar336[0xe] = auVar350[7];
                      auVar336[0xf] = -(auVar350[7] < '\0');
                      auVar335._14_2_ = auVar336._14_2_;
                      auVar335._0_13_ = auVar350._0_13_;
                      auVar335[0xd] = -(auVar350[6] < '\0');
                      auVar334._13_3_ = auVar335._13_3_;
                      auVar334._0_12_ = auVar350._0_12_;
                      auVar334[0xc] = auVar350[6];
                      auVar333._12_4_ = auVar334._12_4_;
                      auVar333._0_11_ = auVar350._0_11_;
                      auVar333[0xb] = -(auVar350[5] < '\0');
                      auVar332._11_5_ = auVar333._11_5_;
                      auVar332._0_10_ = auVar350._0_10_;
                      auVar332[10] = auVar350[5];
                      auVar331._10_6_ = auVar332._10_6_;
                      auVar331._0_9_ = auVar350._0_9_;
                      auVar331[9] = -(auVar350[4] < '\0');
                      auVar330._9_7_ = auVar331._9_7_;
                      auVar330._0_8_ = auVar350._0_8_;
                      auVar330[8] = auVar350[4];
                      Var81 = CONCAT91(CONCAT81(auVar330._8_8_,-(auVar350[3] < '\0')),auVar350[3]);
                      auVar104._2_10_ = Var81;
                      auVar104[1] = -(auVar350[2] < '\0');
                      auVar104[0] = auVar350[2];
                      auVar103._2_12_ = auVar104;
                      auVar103[1] = -(auVar350[1] < '\0');
                      auVar103[0] = auVar350[1];
                      sVar317 = CONCAT11(-(auVar350[0] < '\0'),auVar350[0]);
                      sVar544 = CONCAT11(-(auVar350[8] < '\0'),auVar350[8]);
                      uVar291 = CONCAT13(-(auVar350[9] < '\0'),CONCAT12(auVar350[9],sVar544));
                      uVar294 = CONCAT15(-(auVar350[10] < '\0'),CONCAT14(auVar350[10],uVar291));
                      uVar295 = CONCAT17(-(auVar350[0xb] < '\0'),CONCAT16(auVar350[0xb],uVar294));
                      auVar297._0_10_ =
                           CONCAT19(-(auVar350[0xc] < '\0'),CONCAT18(auVar350[0xc],uVar295));
                      auVar297[10] = auVar350[0xd];
                      auVar297[0xb] = -(auVar350[0xd] < '\0');
                      auVar301[0xc] = auVar350[0xe];
                      auVar301._0_12_ = auVar297;
                      auVar301[0xd] = -(auVar350[0xe] < '\0');
                      auVar304[0xe] = auVar350[0xf];
                      auVar304._0_14_ = auVar301;
                      auVar304[0xf] = -(auVar350[0xf] < '\0');
                      auVar418 = psllw(auVar410,2);
                      sVar353 = auVar103._0_2_;
                      sVar354 = auVar104._0_2_;
                      sVar355 = (short)Var81;
                      sVar356 = auVar330._8_2_;
                      sVar358 = auVar332._10_2_;
                      sVar359 = auVar334._12_2_;
                      auVar444._0_2_ = sVar539 - sVar361;
                      sVar450 = (short)((uint)uVar260 >> 0x10);
                      sVar389 = auVar101._0_2_;
                      auVar444._2_2_ = sVar450 - sVar389;
                      sVar451 = (short)((uint6)uVar262 >> 0x20);
                      sVar390 = auVar102._0_2_;
                      auVar444._4_2_ = sVar451 - sVar390;
                      sVar453 = (short)((ulong)uVar263 >> 0x30);
                      sVar391 = (short)Var78;
                      auVar444._6_2_ = sVar453 - sVar391;
                      sVar454 = (short)((unkuint10)auVar266._0_10_ >> 0x40);
                      sVar394 = auVar471._8_2_;
                      auVar444._8_2_ = sVar454 - sVar394;
                      sVar456 = auVar266._10_2_;
                      sVar395 = auVar473._10_2_;
                      auVar444._10_2_ = sVar456 - sVar395;
                      sVar457 = auVar268._12_2_;
                      sVar459 = auVar280._14_2_;
                      sVar396 = auVar475._12_2_;
                      auVar444._12_2_ = sVar457 - sVar396;
                      auVar444._14_2_ = sVar459 - auVar476._14_2_;
                      in_XMM8._0_2_ = sVar361 * sVar312 + auVar418._0_2_ + sVar317;
                      in_XMM8._2_2_ = sVar389 * sVar486 + auVar418._2_2_ + sVar353;
                      in_XMM8._4_2_ = sVar390 * sVar392 + auVar418._4_2_ + sVar354;
                      in_XMM8._6_2_ = sVar391 * sVar393 + auVar418._6_2_ + sVar355;
                      in_XMM8._8_2_ = sVar394 * sVar525 + auVar418._8_2_ + sVar356;
                      in_XMM8._10_2_ = sVar395 * sVar484 + auVar418._10_2_ + sVar358;
                      in_XMM8._12_2_ = sVar396 * sVar397 + auVar418._12_2_ + sVar359;
                      in_XMM8._14_2_ = auVar476._14_2_ * sVar429 + auVar418._14_2_ + auVar335._14_2_
                      ;
                      sVar507 = (short)((uint)uVar223 >> 0x10);
                      sVar518 = (short)((uint6)uVar224 >> 0x20);
                      sVar508 = (short)((ulong)uVar225 >> 0x30);
                      sVar255 = (short)((unkuint10)auVar227._0_10_ >> 0x40);
                      sVar257 = auVar227._10_2_;
                      sVar258 = auVar229._12_2_;
                      sVar526 = auVar242._14_2_;
                      auVar497._0_2_ = sVar361 + sVar539;
                      auVar497._2_2_ = sVar389 + sVar450;
                      auVar497._4_2_ = sVar390 + sVar451;
                      auVar497._6_2_ = sVar391 + sVar453;
                      auVar497._8_2_ = sVar394 + sVar454;
                      auVar497._10_2_ = sVar395 + sVar456;
                      auVar497._12_2_ = sVar396 + sVar457;
                      auVar497._14_2_ = auVar476._14_2_ + sVar459;
                      auVar418 = psllw(auVar497,2);
                      auVar375._0_2_ = (sVar317 + sVar485) - auVar418._0_2_;
                      auVar375._2_2_ = (sVar353 + sVar507) - auVar418._2_2_;
                      auVar375._4_2_ = (sVar354 + sVar518) - auVar418._4_2_;
                      auVar375._6_2_ = (sVar355 + sVar508) - auVar418._6_2_;
                      auVar375._8_2_ = (sVar356 + sVar255) - auVar418._8_2_;
                      auVar375._10_2_ = (sVar358 + sVar257) - auVar418._10_2_;
                      auVar375._12_2_ = (sVar359 + sVar258) - auVar418._12_2_;
                      auVar375._14_2_ = (auVar335._14_2_ + sVar526) - auVar418._14_2_;
                      auVar418 = psllw(auVar444,2);
                      in_XMM7._0_2_ = auVar418._0_2_ + (sVar317 - sVar485);
                      in_XMM7._2_2_ = auVar418._2_2_ + (sVar353 - sVar507);
                      in_XMM7._4_2_ = auVar418._4_2_ + (sVar354 - sVar518);
                      in_XMM7._6_2_ = auVar418._6_2_ + (sVar355 - sVar508);
                      in_XMM7._8_2_ = auVar418._8_2_ + (sVar356 - sVar255);
                      in_XMM7._10_2_ = auVar418._10_2_ + (sVar358 - sVar257);
                      in_XMM7._12_2_ = auVar418._12_2_ + (sVar359 - sVar258);
                      in_XMM7._14_2_ = auVar418._14_2_ + (auVar335._14_2_ - sVar526);
                      auVar498._0_2_ = (sVar317 - sVar361) + (sVar539 - sVar485) * -2;
                      auVar498._2_2_ = (sVar353 - sVar389) + (sVar450 - sVar507) * -2;
                      auVar498._4_2_ = (sVar354 - sVar390) + (sVar451 - sVar518) * -2;
                      auVar498._6_2_ = (sVar355 - sVar391) + (sVar453 - sVar508) * -2;
                      auVar498._8_2_ = (sVar356 - sVar394) + (sVar454 - sVar255) * -2;
                      auVar498._10_2_ = (sVar358 - sVar395) + (sVar456 - sVar257) * -2;
                      auVar498._12_2_ = (sVar359 - sVar396) + (sVar457 - sVar258) * -2;
                      auVar498._14_2_ =
                           (auVar335._14_2_ - auVar476._14_2_) + (sVar459 - sVar526) * -2;
                      auVar418 = psllw(auVar280,2);
                      auVar243._0_2_ = sVar485 * sVar312 + auVar418._0_2_ + sVar544;
                      auVar243._2_2_ =
                           sVar507 * sVar486 + auVar418._2_2_ + (short)((uint)uVar291 >> 0x10);
                      auVar243._4_2_ =
                           sVar518 * sVar392 + auVar418._4_2_ + (short)((uint6)uVar294 >> 0x20);
                      auVar243._6_2_ =
                           sVar508 * sVar393 + auVar418._6_2_ + (short)((ulong)uVar295 >> 0x30);
                      auVar243._8_2_ =
                           sVar255 * sVar525 +
                           auVar418._8_2_ + (short)((unkuint10)auVar297._0_10_ >> 0x40);
                      auVar243._10_2_ = sVar257 * sVar484 + auVar418._10_2_ + auVar297._10_2_;
                      auVar243._12_2_ = sVar258 * sVar397 + auVar418._12_2_ + auVar301._12_2_;
                      auVar243._14_2_ = sVar526 * sVar429 + auVar418._14_2_ + auVar304._14_2_;
                      *(undefined1 (*) [16])((long)aiStack_368 + lVar163) = in_XMM8;
                      *(undefined1 (*) [16])((long)aiStack_308 + lVar163) = auVar375;
                      *(undefined1 (*) [16])((long)aiStack_2a8 + lVar163) = in_XMM7;
                      *(undefined1 (*) [16])((long)asStack_248 + lVar163) = auVar498;
                      *(short *)((long)asStack_248 + lVar163 + 0x60) =
                           (sVar539 - sVar485) * 2 + (sVar317 - sVar361);
                      *(short *)((long)asStack_248 + lVar163 + 0x62) =
                           (sVar450 - sVar507) * 2 + (sVar353 - sVar389);
                      *(short *)((long)asStack_248 + lVar163 + 100) =
                           (sVar451 - sVar518) * 2 + (sVar354 - sVar390);
                      *(short *)((long)asStack_248 + lVar163 + 0x66) =
                           (sVar453 - sVar508) * 2 + (sVar355 - sVar391);
                      *(short *)((long)asStack_248 + lVar163 + 0x68) =
                           (sVar454 - sVar255) * 2 + (sVar356 - sVar394);
                      *(short *)((long)asStack_248 + lVar163 + 0x6a) =
                           (sVar456 - sVar257) * 2 + (sVar358 - sVar395);
                      *(short *)((long)asStack_248 + lVar163 + 0x6c) =
                           (sVar457 - sVar258) * 2 + (sVar359 - sVar396);
                      *(short *)((long)asStack_248 + lVar163 + 0x6e) =
                           (sVar459 - sVar526) * 2 + (auVar335._14_2_ - auVar476._14_2_);
                      *(undefined1 (*) [16])((long)&local_188 + lVar163) = auVar243;
                      lVar163 = lVar163 + 0x10;
                      pauVar152 = (undefined1 (*) [16])(*pauVar152 + (int)((uVar148 + 2) * 8));
                    }
                    for (; lVar177 != 0x290; lVar177 = lVar177 + 0x60) {
                      auVar418 = *(undefined1 (*) [16])((long)&local_408 + lVar177);
                      sVar485 = *(short *)((long)&local_3f8 + lVar177);
                      sVar507 = *(short *)((long)&local_3f8 + lVar177 + 2);
                      sVar518 = *(short *)((long)&local_3f8 + lVar177 + 4);
                      sVar508 = *(short *)((long)&local_3f8 + lVar177 + 6);
                      sVar255 = *(short *)((long)&local_3f0 + lVar177);
                      sVar257 = *(short *)((long)&local_3f0 + lVar177 + 2);
                      sVar258 = *(short *)((long)&local_3f0 + lVar177 + 4);
                      sVar526 = *(short *)((long)&local_3f0 + lVar177 + 6);
                      sVar539 = *(short *)((long)w1 + lVar177);
                      sVar544 = *(short *)((long)w1 + lVar177 + 2);
                      sVar317 = *(short *)((long)w1 + lVar177 + 4);
                      sVar353 = *(short *)((long)w1 + lVar177 + 6);
                      sVar354 = *(short *)((long)&uStack_3d0 + lVar177);
                      sVar355 = *(short *)((long)&uStack_3d0 + lVar177 + 2);
                      sVar356 = *(short *)((long)&uStack_3cc + lVar177);
                      sVar358 = *(short *)((long)&uStack_3cc + lVar177 + 2);
                      auVar244 = psllw(*(undefined1 (*) [16])((long)w2 + lVar177),2);
                      sVar361 = auVar418._0_2_;
                      auVar376._0_2_ = sVar361 - sVar485;
                      sVar389 = auVar418._2_2_;
                      auVar376._2_2_ = sVar389 - sVar507;
                      sVar390 = auVar418._4_2_;
                      auVar376._4_2_ = sVar390 - sVar518;
                      sVar391 = auVar418._6_2_;
                      auVar376._6_2_ = sVar391 - sVar508;
                      sVar394 = auVar418._8_2_;
                      auVar376._8_2_ = sVar394 - sVar255;
                      sVar395 = auVar418._10_2_;
                      auVar376._10_2_ = sVar395 - sVar257;
                      sVar396 = auVar418._12_2_;
                      sVar398 = auVar418._14_2_;
                      auVar376._12_2_ = sVar396 - sVar258;
                      auVar376._14_2_ = sVar398 - sVar526;
                      auVar245._0_2_ = auVar244._0_2_ + sVar539 + sVar485 * sVar312;
                      auVar245._2_2_ = auVar244._2_2_ + sVar544 + sVar507 * sVar486;
                      auVar245._4_2_ = auVar244._4_2_ + sVar317 + sVar518 * sVar392;
                      auVar245._6_2_ = auVar244._6_2_ + sVar353 + sVar508 * sVar393;
                      auVar245._8_2_ = auVar244._8_2_ + sVar354 + sVar255 * sVar525;
                      auVar245._10_2_ = auVar244._10_2_ + sVar355 + sVar257 * sVar484;
                      auVar245._12_2_ = auVar244._12_2_ + sVar356 + sVar258 * sVar397;
                      auVar245._14_2_ = auVar244._14_2_ + sVar358 + sVar526 * sVar429;
                      sVar359 = *(short *)((long)&uStack_3e8 + lVar177);
                      sVar450 = *(short *)((long)&uStack_3e8 + lVar177 + 2);
                      sVar451 = *(short *)((long)&local_3e4 + lVar177);
                      sVar453 = *(short *)((long)&local_3e4 + lVar177 + 2);
                      sVar454 = *(short *)((long)&local_3e0 + lVar177);
                      sVar456 = *(short *)((long)&local_3e0 + lVar177 + 2);
                      sVar457 = *(short *)((long)w1 + lVar177 + -4);
                      sVar459 = *(short *)((long)w1 + lVar177 + -2);
                      auVar445._0_2_ = sVar485 + sVar361;
                      auVar445._2_2_ = sVar507 + sVar389;
                      auVar445._4_2_ = sVar518 + sVar390;
                      auVar445._6_2_ = sVar508 + sVar391;
                      auVar445._8_2_ = sVar255 + sVar394;
                      auVar445._10_2_ = sVar257 + sVar395;
                      auVar445._12_2_ = sVar258 + sVar396;
                      auVar445._14_2_ = sVar526 + sVar398;
                      auVar244 = psllw(auVar445,2);
                      auVar305._0_2_ = (sVar539 + sVar359) - auVar244._0_2_;
                      auVar305._2_2_ = (sVar544 + sVar450) - auVar244._2_2_;
                      auVar305._4_2_ = (sVar317 + sVar451) - auVar244._4_2_;
                      auVar305._6_2_ = (sVar353 + sVar453) - auVar244._6_2_;
                      auVar305._8_2_ = (sVar354 + sVar454) - auVar244._8_2_;
                      auVar305._10_2_ = (sVar355 + sVar456) - auVar244._10_2_;
                      auVar305._12_2_ = (sVar356 + sVar457) - auVar244._12_2_;
                      auVar305._14_2_ = (sVar358 + sVar459) - auVar244._14_2_;
                      auVar244 = psllw(auVar376,2);
                      auVar377._0_2_ = auVar244._0_2_ + (sVar539 - sVar359);
                      auVar377._2_2_ = auVar244._2_2_ + (sVar544 - sVar450);
                      auVar377._4_2_ = auVar244._4_2_ + (sVar317 - sVar451);
                      auVar377._6_2_ = auVar244._6_2_ + (sVar353 - sVar453);
                      auVar377._8_2_ = auVar244._8_2_ + (sVar354 - sVar454);
                      auVar377._10_2_ = auVar244._10_2_ + (sVar355 - sVar456);
                      auVar377._12_2_ = auVar244._12_2_ + (sVar356 - sVar457);
                      auVar377._14_2_ = auVar244._14_2_ + (sVar358 - sVar459);
                      in_XMM8._0_2_ = (sVar539 - sVar485) + (sVar361 - sVar359) * -2;
                      in_XMM8._2_2_ = (sVar544 - sVar507) + (sVar389 - sVar450) * -2;
                      in_XMM8._4_2_ = (sVar317 - sVar518) + (sVar390 - sVar451) * -2;
                      in_XMM8._6_2_ = (sVar353 - sVar508) + (sVar391 - sVar453) * -2;
                      in_XMM8._8_2_ = (sVar354 - sVar255) + (sVar394 - sVar454) * -2;
                      in_XMM8._10_2_ = (sVar355 - sVar257) + (sVar395 - sVar456) * -2;
                      in_XMM8._12_2_ = (sVar356 - sVar258) + (sVar396 - sVar457) * -2;
                      in_XMM8._14_2_ = (sVar358 - sVar526) + (sVar398 - sVar459) * -2;
                      in_XMM7._0_2_ = (sVar361 - sVar359) * 2 + (sVar539 - sVar485);
                      in_XMM7._2_2_ = (sVar389 - sVar450) * 2 + (sVar544 - sVar507);
                      in_XMM7._4_2_ = (sVar390 - sVar451) * 2 + (sVar317 - sVar518);
                      in_XMM7._6_2_ = (sVar391 - sVar453) * 2 + (sVar353 - sVar508);
                      in_XMM7._8_2_ = (sVar394 - sVar454) * 2 + (sVar354 - sVar255);
                      in_XMM7._10_2_ = (sVar395 - sVar456) * 2 + (sVar355 - sVar257);
                      in_XMM7._12_2_ = (sVar396 - sVar457) * 2 + (sVar356 - sVar258);
                      in_XMM7._14_2_ = (sVar398 - sVar459) * 2 + (sVar358 - sVar526);
                      auVar418 = psllw(auVar418,2);
                      sVar485 = *(short *)(&opt_q.lightmode + lVar177);
                      sVar507 = *(short *)(&opt_q.field_0x2 + lVar177);
                      sVar518 = *(short *)((long)&opt_q.num_threads + lVar177);
                      sVar508 = *(short *)((long)&opt_q.num_threads + lVar177 + 2);
                      sVar255 = *(short *)((long)&opt_q.blob_allocator + lVar177);
                      sVar257 = *(short *)((long)&opt_q.blob_allocator + lVar177 + 2);
                      sVar258 = *(short *)((long)&opt_q.blob_allocator + lVar177 + 4);
                      sVar526 = *(short *)((long)&opt_q.blob_allocator + lVar177 + 6);
                      *pauVar143 = auVar245;
                      *(undefined1 (*) [16])(*pauVar143 + (long)(iVar141 * 8) * 2) = auVar305;
                      *(undefined1 (*) [16])(*pauVar143 + (long)(iVar141 << 4) * 2) = auVar377;
                      *(undefined1 (*) [16])(*pauVar143 + (long)(iVar141 * 0x18) * 2) = in_XMM8;
                      *(undefined1 (*) [16])(*pauVar143 + (long)(iVar141 << 5) * 2) = in_XMM7;
                      psVar1 = (short *)(*pauVar143 + (long)(iVar141 * 0x28) * 2);
                      *psVar1 = sVar359 * sVar312 + auVar418._0_2_ + sVar485;
                      psVar1[1] = sVar450 * sVar486 + auVar418._2_2_ + sVar507;
                      psVar1[2] = sVar451 * sVar392 + auVar418._4_2_ + sVar518;
                      psVar1[3] = sVar453 * sVar393 + auVar418._6_2_ + sVar508;
                      psVar1[4] = sVar454 * sVar525 + auVar418._8_2_ + sVar255;
                      psVar1[5] = sVar456 * sVar484 + auVar418._10_2_ + sVar257;
                      psVar1[6] = sVar457 * sVar397 + auVar418._12_2_ + sVar258;
                      psVar1[7] = sVar459 * sVar429 + auVar418._14_2_ + sVar526;
                      pauVar143 = (undefined1 (*) [16])(*pauVar143 + (long)(iVar141 * 0x30) * 2);
                    }
                    pauVar136 = pauVar136 + 2;
                    pauVar137 = pauVar137 + 1;
                  }
                  pauVar194 = (undefined1 (*) [16])
                              (*pauVar194 + (long)local_558.w * local_558.elemsize * 4);
                }
              }
              piVar193 = (int *)CONCAT44(local_558.refcount._4_4_,local_558.refcount._0_4_);
              local_678.c = iVar185;
              if (piVar193 != (int *)0x0) {
                LOCK();
                *piVar193 = *piVar193 + -1;
                UNLOCK();
                if (*piVar193 == 0) {
                  if (local_558.allocator == (Allocator *)0x0) {
                    free(local_558.data);
                  }
                  else {
                    (*(local_558.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              local_558.cstep = 0;
              local_558.data = (void *)0x0;
              local_558.refcount._0_4_ = 0;
              local_558.refcount._4_4_ = 0;
              local_558.elemsize = 0;
              local_558.elempack = 0;
              local_558.h = 0;
              local_558.d = 0;
              local_558.c = 0;
              local_558.allocator = (Allocator *)0x0;
              local_558.dims = 0;
              local_558.w = 0;
              d1[0] = 0;
              d1[1] = 0;
              d1[2] = 0;
              d1[3] = 0;
              opt_q.workspace_allocator._0_4_ = 0;
              opt_q.workspace_allocator._4_4_ = 0;
              opt_q.openmp_blocktime = 0;
              opt_q.lightmode = false;
              opt_q._1_3_ = 0;
              opt_q.num_threads = 0;
              opt_q.blob_allocator._0_4_ = 0;
              opt_q.blob_allocator._4_4_ = 0;
              opt_q.flush_denormals = 0;
              opt_q.use_local_pool_allocator = false;
              opt_q.use_shader_local_memory = false;
              opt_q.use_cooperative_matrix = false;
              opt_q.use_winograd23_convolution = false;
              opt_q.use_winograd43_convolution = false;
              opt_q.use_winograd63_convolution = false;
              opt_q.use_reserved_6 = false;
              opt_q.use_reserved_7 = false;
              iVar185 = 0;
              if (0xb < iVar169) {
                iVar185 = (int)(((long)iVar169 / 6 & 0xffffffffU) >> 1);
              }
              opt_q.use_bf16_storage = false;
              opt_q.use_fp16_packed = false;
              opt_q.use_fp16_storage = false;
              opt_q.use_fp16_arithmetic = false;
              opt_q.use_int8_packed = false;
              opt_q.use_int8_storage = false;
              opt_q.use_int8_arithmetic = false;
              opt_q.use_packing_layout = false;
              opt_q.use_shader_pack8 = false;
              opt_q.use_subgroup_basic = false;
              opt_q.use_subgroup_vote = false;
              opt_q.use_subgroup_ballot = false;
              opt_q.use_subgroup_shuffle = false;
              opt_q.use_image_storage = false;
              opt_q.use_tensor_storage = false;
              opt_q.use_reserved_0 = false;
              Mat::create((Mat *)&opt_q,iVar259 << (0xb < iVar169),iVar141 - iVar185,0x24,
                          (ulong)(uint)(iVar176 * 2),iVar176,opt->workspace_allocator);
              lVar177 = (long)iVar141;
              for (lVar163 = 0; lVar163 != 0x24; lVar163 = lVar163 + 1) {
                lVar146 = (long)(int)opt_q._44_4_ *
                          CONCAT44(opt_q.workspace_allocator._4_4_,opt_q.workspace_allocator._0_4_);
                for (uVar160 = 0; (long)(uVar160 | 1) < lVar177; uVar160 = uVar160 + 2) {
                  puVar167 = (undefined8 *)((uVar160 >> 1) * lVar146 + opt_q._0_8_);
                  puVar166 = (undefined8 *)((uVar160 + lVar163 * lVar177) * 0x10 + (long)d0);
                  asVar168 = asVar198;
                  while (iVar176 = asVar168._0_4_, asVar168._0_4_ = iVar176 - 1, asVar168[2] = 0,
                        asVar168[3] = 0, iVar176 != 0) {
                    uVar225 = puVar166[1];
                    auVar286 = *(undefined1 (*) [16])(puVar166 + 2);
                    *puVar167 = *puVar166;
                    puVar167[1] = uVar225;
                    *(undefined1 (*) [16])(puVar167 + 2) = auVar286;
                    puVar166 = puVar166 + local_568 * 2;
                    puVar167 = puVar167 + 4;
                  }
                }
                for (; (long)uVar160 < lVar177; uVar160 = uVar160 + 1) {
                  puVar167 = (undefined8 *)
                             ((ulong)(((uint)uVar160 & 1) + ((uint)(uVar160 >> 1) & 0x7fffffff)) *
                              lVar146 + opt_q._0_8_);
                  puVar166 = (undefined8 *)((uVar160 + lVar163 * lVar177) * 0x10 + (long)d0);
                  asVar196 = asVar198;
                  while (iVar176 = asVar196._0_4_, asVar196._0_4_ = iVar176 - 1, asVar196[2] = 0,
                        asVar196[3] = 0, iVar176 != 0) {
                    uVar225 = puVar166[1];
                    *puVar167 = *puVar166;
                    puVar167[1] = uVar225;
                    puVar166 = puVar166 + local_568 * 2;
                    puVar167 = puVar167 + 2;
                  }
                }
              }
              local_568 = 0;
              d0[0] = 0;
              d0[1] = 0;
              d0[2] = 0;
              d0[3] = 0;
              auStack_578 = SUB1612((undefined1  [16])0x0,4);
              local_588 = (Allocator *)0x0;
              iStack_580 = 0;
              iStack_57c = 0;
              Mat::create((Mat *)d1,iVar141,0x24,iVar142,4,1,opt->workspace_allocator);
              local_630._0_4_ = iVar142 >> 2;
              local_620[0] = d1[0];
              local_620[1] = d1[1];
              local_620[2] = d1[2];
              local_620[3] = d1[3];
              local_618 = (void *)0x0;
              pvVar162 = (this->weight_winograd43_data).data;
              local_628 = (void *)(this->weight_winograd43_data).elemsize;
              asVar171[0] = 0;
              asVar171[1] = 0;
              asVar171[2] = 0;
              asVar171[3] = 0;
              local_630[2] = 0;
              local_630[3] = 0;
              if ((int)local_630._0_4_ < 1) {
                local_630 = asVar171;
              }
              local_5b0 = (this->weight_winograd43_data).cstep * (long)local_628;
              auVar215 = extraout_XMM0_00;
              while (asVar145 = asVar171, asVar145 != local_630) {
                iVar176 = (this->weight_winograd43_data).w;
                asVar144 = d1;
                pvVar153 = pvVar162;
                asVar195 = d1;
                asVar168 = d1;
                asVar196 = d1;
                for (lVar163 = 0; lVar163 != 0x24; lVar163 = lVar163 + 1) {
                  lVar187 = (long)(int)opt_q._44_4_ *
                            CONCAT44(opt_q.workspace_allocator._4_4_,opt_q.workspace_allocator._0_4_
                                    );
                  lVar146 = opt_q._0_8_;
                  for (uVar160 = 0; (long)(uVar160 | 1) < lVar177; uVar160 = uVar160 + 2) {
                    auVar503 = (undefined1  [16])0x0;
                    lVar178 = 0;
                    iVar185 = 0;
                    iVar169 = 0;
                    iVar256 = 0;
                    iVar259 = 0;
                    auVar383 = (undefined1  [16])0x0;
                    iVar292 = 0;
                    iVar310 = 0;
                    iVar313 = 0;
                    iVar315 = 0;
                    asVar161 = asVar198;
                    while( true ) {
                      iVar261 = asVar161._0_4_;
                      asVar161._0_4_ = iVar261 - 1;
                      asVar161[2] = 0;
                      asVar161[3] = 0;
                      iVar288 = auVar503._4_4_;
                      iVar289 = auVar503._8_4_;
                      iVar290 = auVar503._12_4_;
                      if (iVar261 == 0) break;
                      auVar286 = *(undefined1 (*) [16])(lVar146 + lVar178);
                      auVar418 = *(undefined1 (*) [16])(lVar146 + 0x10 + lVar178);
                      auVar244 = *(undefined1 (*) [16])((long)pvVar153 + lVar178 * 2);
                      auVar350 = *(undefined1 (*) [16])((long)pvVar153 + lVar178 * 2 + 0x10);
                      auVar388 = *(undefined1 (*) [16])((long)pvVar153 + lVar178 * 2 + 0x20);
                      sVar392 = auVar286._6_2_;
                      auVar283._0_12_ = auVar286._0_12_;
                      auVar283._12_2_ = sVar392;
                      auVar283._14_2_ = sVar392;
                      auVar282._12_4_ = auVar283._12_4_;
                      auVar282._0_10_ = auVar286._0_10_;
                      sVar486 = auVar286._4_2_;
                      auVar282._10_2_ = sVar486;
                      auVar281._10_6_ = auVar282._10_6_;
                      auVar281._0_8_ = auVar286._0_8_;
                      auVar281._8_2_ = sVar486;
                      auVar212 = pshuflw(auVar215,auVar286,0x50);
                      sVar525 = auVar286._8_2_;
                      uVar223 = CONCAT22(sVar525,sVar525);
                      sVar484 = auVar286._10_2_;
                      auVar367._0_8_ = CONCAT26(sVar484,CONCAT24(sVar484,uVar223));
                      sVar397 = auVar286._12_2_;
                      auVar367._8_2_ = sVar397;
                      auVar367._10_2_ = sVar397;
                      auVar384._14_2_ = auVar286._14_2_;
                      auVar384._12_2_ = auVar384._14_2_;
                      auVar384._0_12_ = auVar367;
                      sVar518 = auVar418._6_2_;
                      auVar426._0_12_ = auVar418._0_12_;
                      auVar426._12_2_ = sVar518;
                      auVar426._14_2_ = sVar518;
                      auVar425._12_4_ = auVar426._12_4_;
                      auVar425._0_10_ = auVar418._0_10_;
                      sVar507 = auVar418._4_2_;
                      auVar425._10_2_ = sVar507;
                      auVar424._10_6_ = auVar425._10_6_;
                      auVar424._0_8_ = auVar418._0_8_;
                      auVar424._8_2_ = sVar507;
                      auVar480 = pshuflw(in_XMM8,auVar418,0x50);
                      sVar255 = auVar418._8_2_;
                      uVar291 = CONCAT22(sVar255,sVar255);
                      sVar257 = auVar418._10_2_;
                      auVar491._0_8_ = CONCAT26(sVar257,CONCAT24(sVar257,uVar291));
                      sVar258 = auVar418._12_2_;
                      auVar491._8_2_ = sVar258;
                      auVar491._10_2_ = sVar258;
                      auVar504._14_2_ = auVar418._14_2_;
                      auVar504._12_2_ = auVar504._14_2_;
                      auVar504._0_12_ = auVar491;
                      auVar343._4_4_ = auVar212._0_4_;
                      auVar343._0_4_ = auVar212._0_4_;
                      auVar343._8_4_ = auVar212._4_4_;
                      auVar343._12_4_ = auVar212._4_4_;
                      sVar312 = auVar244._6_2_ * auVar212._2_2_;
                      auVar344 = pmulhw(auVar343,auVar244);
                      auVar481._0_4_ = auVar480._0_4_;
                      auVar481._4_4_ = auVar481._0_4_;
                      auVar481._8_4_ = auVar480._4_4_;
                      auVar481._12_4_ = auVar480._4_4_;
                      sVar539 = auVar244._6_2_ * auVar480._2_2_;
                      auVar252 = pmulhw(auVar244,auVar481);
                      auVar284._4_4_ = auVar281._8_4_;
                      auVar284._0_4_ = auVar281._8_4_;
                      auVar284._8_4_ = auVar282._12_4_;
                      auVar284._12_4_ = auVar282._12_4_;
                      sVar544 = auVar350._6_2_ * sVar486;
                      auVar285 = pmulhw(auVar284,auVar350);
                      auVar427._4_4_ = auVar424._8_4_;
                      auVar427._0_4_ = auVar424._8_4_;
                      auVar427._8_4_ = auVar425._12_4_;
                      auVar427._12_4_ = auVar425._12_4_;
                      sVar526 = auVar350._6_2_ * sVar507;
                      auVar447 = pmulhw(auVar350,auVar427);
                      uVar260 = (undefined4)((ulong)auVar367._0_8_ >> 0x20);
                      auVar546._4_4_ = uVar223;
                      auVar546._0_4_ = uVar223;
                      auVar546._8_4_ = uVar260;
                      auVar546._12_4_ = uVar260;
                      sVar485 = auVar388._6_2_ * sVar525;
                      auVar547 = pmulhw(auVar546,auVar388);
                      uVar223 = (undefined4)((ulong)auVar491._0_8_ >> 0x20);
                      auVar514._4_4_ = uVar291;
                      auVar514._0_4_ = uVar291;
                      auVar514._8_4_ = uVar223;
                      auVar514._12_4_ = uVar223;
                      sVar429 = auVar388._6_2_ * sVar255;
                      in_XMM7 = pmulhw(auVar388,auVar514);
                      auVar213._4_4_ = auVar367._8_4_;
                      auVar213._0_4_ = auVar367._8_4_;
                      auVar213._8_4_ = auVar384._12_4_;
                      auVar213._12_4_ = auVar384._12_4_;
                      auVar286 = *(undefined1 (*) [16])((long)pvVar153 + lVar178 * 2 + 0x30);
                      sVar393 = auVar286._6_2_ * sVar397;
                      auVar418 = pmulhw(auVar213,auVar286);
                      auVar214._4_4_ = auVar491._8_4_;
                      auVar214._0_4_ = auVar491._8_4_;
                      auVar214._8_4_ = auVar504._12_4_;
                      auVar214._12_4_ = auVar504._12_4_;
                      sVar508 = auVar286._6_2_ * sVar258;
                      auVar515 = pmulhw(auVar286,auVar214);
                      iVar261 = CONCAT22(auVar344._6_2_,sVar312);
                      Var78 = CONCAT64(CONCAT42(iVar261,auVar344._4_2_),
                                       CONCAT22(auVar244._4_2_ * auVar212._0_2_,sVar312));
                      auVar117._4_8_ = (long)((unkuint10)Var78 >> 0x10);
                      auVar117._2_2_ = auVar344._2_2_;
                      auVar117._0_2_ = auVar244._2_2_ * auVar212._2_2_;
                      iVar357 = CONCAT22(auVar344._8_2_,auVar244._8_2_ * auVar212._4_2_);
                      auVar299._0_8_ =
                           CONCAT26(auVar344._10_2_,
                                    CONCAT24(auVar244._10_2_ * auVar212._6_2_,iVar357));
                      auVar299._8_2_ = auVar244._12_2_ * auVar212._4_2_;
                      auVar299._10_2_ = auVar344._12_2_;
                      auVar308._12_2_ = auVar244._14_2_ * auVar212._6_2_;
                      auVar308._0_12_ = auVar299;
                      auVar308._14_2_ = auVar344._14_2_;
                      iVar293 = CONCAT22(auVar252._6_2_,sVar539);
                      Var81 = CONCAT64(CONCAT42(iVar293,auVar252._4_2_),
                                       CONCAT22(auVar244._4_2_ * auVar480._0_2_,sVar539));
                      auVar118._4_8_ = (long)((unkuint10)Var81 >> 0x10);
                      auVar118._2_2_ = auVar252._2_2_;
                      auVar118._0_2_ = auVar244._2_2_ * auVar480._2_2_;
                      iVar452 = CONCAT22(auVar252._8_2_,auVar244._8_2_ * auVar480._4_2_);
                      auVar528._0_8_ =
                           CONCAT26(auVar252._10_2_,
                                    CONCAT24(auVar244._10_2_ * auVar480._6_2_,iVar452));
                      auVar528._8_2_ = auVar244._12_2_ * auVar480._4_2_;
                      auVar528._10_2_ = auVar252._12_2_;
                      auVar538._12_2_ = auVar244._14_2_ * auVar480._6_2_;
                      auVar538._0_12_ = auVar528;
                      auVar538._14_2_ = auVar252._14_2_;
                      iVar311 = CONCAT22(auVar285._6_2_,sVar544);
                      Var84 = CONCAT64(CONCAT42(iVar311,auVar285._4_2_),
                                       CONCAT22(auVar350._4_2_ * sVar486,sVar544));
                      auVar119._4_8_ = (long)((unkuint10)Var84 >> 0x10);
                      auVar119._2_2_ = auVar285._2_2_;
                      auVar119._0_2_ = auVar350._2_2_ * sVar486;
                      iVar455 = CONCAT22(auVar285._8_2_,auVar350._8_2_ * sVar392);
                      auVar541._0_8_ =
                           CONCAT26(auVar285._10_2_,CONCAT24(auVar350._10_2_ * sVar392,iVar455));
                      auVar541._8_2_ = auVar350._12_2_ * sVar392;
                      auVar541._10_2_ = auVar285._12_2_;
                      auVar543._12_2_ = auVar350._14_2_ * sVar392;
                      auVar543._0_12_ = auVar541;
                      auVar543._14_2_ = auVar285._14_2_;
                      iVar314 = CONCAT22(auVar447._6_2_,sVar526);
                      Var132 = CONCAT64(CONCAT42(iVar314,auVar447._4_2_),
                                        CONCAT22(auVar350._4_2_ * sVar507,sVar526));
                      auVar120._4_8_ = (long)((unkuint10)Var132 >> 0x10);
                      auVar120._2_2_ = auVar447._2_2_;
                      auVar120._0_2_ = auVar350._2_2_ * sVar507;
                      iVar430 = CONCAT22(auVar447._8_2_,auVar350._8_2_ * sVar518);
                      auVar521._0_8_ =
                           CONCAT26(auVar447._10_2_,CONCAT24(auVar350._10_2_ * sVar518,iVar430));
                      auVar521._8_2_ = auVar350._12_2_ * sVar518;
                      auVar521._10_2_ = auVar447._12_2_;
                      auVar524._12_2_ = auVar350._14_2_ * sVar518;
                      auVar524._0_12_ = auVar521;
                      auVar524._14_2_ = auVar447._14_2_;
                      iVar316 = CONCAT22(auVar547._6_2_,sVar485);
                      Var133 = CONCAT64(CONCAT42(iVar316,auVar547._4_2_),
                                        CONCAT22(auVar388._4_2_ * sVar525,sVar485));
                      auVar121._4_8_ = (long)((unkuint10)Var133 >> 0x10);
                      auVar121._2_2_ = auVar547._2_2_;
                      auVar121._0_2_ = auVar388._2_2_ * sVar525;
                      iVar360 = CONCAT22(auVar547._8_2_,auVar388._8_2_ * sVar484);
                      auVar462._0_8_ =
                           CONCAT26(auVar547._10_2_,CONCAT24(auVar388._10_2_ * sVar484,iVar360));
                      auVar462._8_2_ = auVar388._12_2_ * sVar484;
                      auVar462._10_2_ = auVar547._12_2_;
                      auVar482._12_2_ = auVar388._14_2_ * sVar484;
                      auVar482._0_12_ = auVar462;
                      auVar482._14_2_ = auVar547._14_2_;
                      in_XMM8._0_4_ = iVar360 + iVar455 + auVar383._0_4_ + iVar357;
                      in_XMM8._4_4_ =
                           (int)((ulong)auVar462._0_8_ >> 0x20) +
                           (int)((ulong)auVar541._0_8_ >> 0x20) +
                           auVar383._4_4_ + (int)((ulong)auVar299._0_8_ >> 0x20);
                      in_XMM8._8_4_ =
                           auVar462._8_4_ + auVar541._8_4_ + auVar383._8_4_ + auVar299._8_4_;
                      in_XMM8._12_4_ =
                           auVar482._12_4_ + auVar543._12_4_ + auVar383._12_4_ + auVar308._12_4_;
                      iVar357 = CONCAT22(in_XMM7._6_2_,sVar429);
                      Var134 = CONCAT64(CONCAT42(iVar357,in_XMM7._4_2_),
                                        CONCAT22(auVar388._4_2_ * sVar255,sVar429));
                      auVar122._4_8_ = (long)((unkuint10)Var134 >> 0x10);
                      auVar122._2_2_ = in_XMM7._2_2_;
                      auVar122._0_2_ = auVar388._2_2_ * sVar255;
                      auVar215._0_4_ =
                           CONCAT22(in_XMM7._0_2_,auVar388._0_2_ * sVar255) +
                           CONCAT22(auVar447._0_2_,auVar350._0_2_ * sVar507) +
                           iVar185 + CONCAT22(auVar252._0_2_,auVar244._0_2_ * auVar480._0_2_);
                      auVar215._4_4_ = auVar122._0_4_ + auVar120._0_4_ + iVar169 + auVar118._0_4_;
                      auVar215._8_4_ =
                           (int)((unkuint10)Var134 >> 0x10) + (int)((unkuint10)Var132 >> 0x10) +
                           iVar256 + (int)((unkuint10)Var81 >> 0x10);
                      auVar215._12_4_ = iVar357 + iVar314 + iVar259 + iVar293;
                      iVar293 = CONCAT22(in_XMM7._8_2_,auVar388._8_2_ * sVar257);
                      auVar400._0_8_ =
                           CONCAT26(in_XMM7._10_2_,CONCAT24(auVar388._10_2_ * sVar257,iVar293));
                      auVar400._8_2_ = auVar388._12_2_ * sVar257;
                      auVar400._10_2_ = in_XMM7._12_2_;
                      auVar428._12_2_ = auVar388._14_2_ * sVar257;
                      auVar428._0_12_ = auVar400;
                      auVar428._14_2_ = in_XMM7._14_2_;
                      local_698 = auVar418._0_2_;
                      uStack_696 = auVar418._2_2_;
                      uStack_694 = auVar418._4_2_;
                      uStack_692 = auVar418._6_2_;
                      uStack_690 = auVar418._8_2_;
                      uStack_68e = auVar418._10_2_;
                      uStack_68c = auVar418._12_2_;
                      uStack_68a = auVar418._14_2_;
                      iVar259 = CONCAT22(uStack_692,sVar393);
                      Var81 = CONCAT64(CONCAT42(iVar259,uStack_694),
                                       CONCAT22(auVar286._4_2_ * sVar397,sVar393));
                      auVar123._4_8_ = (long)((unkuint10)Var81 >> 0x10);
                      auVar123._2_2_ = uStack_696;
                      auVar123._0_2_ = auVar286._2_2_ * sVar397;
                      iVar292 = CONCAT22(local_698,auVar286._0_2_ * sVar397) +
                                CONCAT22(auVar547._0_2_,auVar388._0_2_ * sVar525) +
                                CONCAT22(auVar285._0_2_,auVar350._0_2_ * sVar486) +
                                iVar292 + CONCAT22(auVar344._0_2_,auVar244._0_2_ * auVar212._0_2_);
                      iVar310 = auVar123._0_4_ +
                                auVar121._0_4_ + auVar119._0_4_ + iVar310 + auVar117._0_4_;
                      iVar313 = (int)((unkuint10)Var81 >> 0x10) +
                                (int)((unkuint10)Var133 >> 0x10) + (int)((unkuint10)Var84 >> 0x10) +
                                iVar313 + (int)((unkuint10)Var78 >> 0x10);
                      iVar315 = iVar259 + iVar316 + iVar311 + iVar315 + iVar261;
                      iVar259 = CONCAT22(uStack_690,auVar286._8_2_ * auVar384._14_2_);
                      auVar368._0_8_ =
                           CONCAT26(uStack_68e,CONCAT24(auVar286._10_2_ * auVar384._14_2_,iVar259));
                      auVar368._8_2_ = auVar286._12_2_ * auVar384._14_2_;
                      auVar368._10_2_ = uStack_68c;
                      auVar385._12_2_ = auVar286._14_2_ * auVar384._14_2_;
                      auVar385._0_12_ = auVar368;
                      auVar385._14_2_ = uStack_68a;
                      auVar383._0_4_ = iVar259 + in_XMM8._0_4_;
                      auVar383._4_4_ = (int)((ulong)auVar368._0_8_ >> 0x20) + in_XMM8._4_4_;
                      auVar383._8_4_ = auVar368._8_4_ + in_XMM8._8_4_;
                      auVar383._12_4_ = auVar385._12_4_ + in_XMM8._12_4_;
                      iVar259 = CONCAT22(auVar515._6_2_,sVar508);
                      Var78 = CONCAT64(CONCAT42(iVar259,auVar515._4_2_),
                                       CONCAT22(auVar286._4_2_ * sVar258,sVar508));
                      auVar124._4_8_ = (long)((unkuint10)Var78 >> 0x10);
                      auVar124._2_2_ = auVar515._2_2_;
                      auVar124._0_2_ = auVar286._2_2_ * sVar258;
                      iVar185 = CONCAT22(auVar515._0_2_,auVar286._0_2_ * sVar258) + auVar215._0_4_;
                      iVar169 = auVar124._0_4_ + auVar215._4_4_;
                      iVar256 = (int)((unkuint10)Var78 >> 0x10) + auVar215._8_4_;
                      iVar259 = iVar259 + auVar215._12_4_;
                      iVar261 = CONCAT22(auVar515._8_2_,auVar286._8_2_ * auVar504._14_2_);
                      auVar492._0_8_ =
                           CONCAT26(auVar515._10_2_,
                                    CONCAT24(auVar286._10_2_ * auVar504._14_2_,iVar261));
                      auVar492._8_2_ = auVar286._12_2_ * auVar504._14_2_;
                      auVar492._10_2_ = auVar515._12_2_;
                      auVar505._12_2_ = auVar286._14_2_ * auVar504._14_2_;
                      auVar505._0_12_ = auVar492;
                      auVar505._14_2_ = auVar515._14_2_;
                      auVar503._0_4_ = iVar261 + iVar293 + iVar430 + auVar503._0_4_ + iVar452;
                      auVar503._4_4_ =
                           (int)((ulong)auVar492._0_8_ >> 0x20) +
                           (int)((ulong)auVar400._0_8_ >> 0x20) +
                           (int)((ulong)auVar521._0_8_ >> 0x20) +
                           iVar288 + (int)((ulong)auVar528._0_8_ >> 0x20);
                      auVar503._8_4_ =
                           auVar492._8_4_ +
                           auVar400._8_4_ + auVar521._8_4_ + iVar289 + auVar528._8_4_;
                      auVar503._12_4_ =
                           auVar505._12_4_ +
                           auVar428._12_4_ + auVar524._12_4_ + iVar290 + auVar538._12_4_;
                      lVar178 = lVar178 + 0x20;
                    }
                    iVar259 = iVar259 + iVar290;
                    *(int *)asVar168 = iVar292 + auVar383._0_4_;
                    *(int *)asVar195 = iVar310 + auVar383._4_4_;
                    *(int *)asVar196 = iVar313 + auVar383._8_4_;
                    *(int *)asVar144 = iVar315 + auVar383._12_4_;
                    *(int *)((long)asVar168 + 4) = iVar185 + auVar503._0_4_;
                    *(int *)((long)asVar195 + 4) = iVar169 + iVar288;
                    *(int *)((long)asVar196 + 4) = iVar256 + iVar289;
                    auVar215._4_4_ = iVar259;
                    auVar215._0_4_ = iVar259;
                    auVar215._8_4_ = iVar259;
                    auVar215._12_4_ = iVar259;
                    *(int *)((long)asVar144 + 4) = iVar259;
                    asVar168 = (short  [4])((long)asVar168 + 8);
                    asVar195 = (short  [4])((long)asVar195 + 8);
                    asVar196 = (short  [4])((long)asVar196 + 8);
                    asVar144 = (short  [4])((long)asVar144 + 8);
                    lVar146 = lVar146 + lVar187;
                  }
                  while (uVar199 = (uint)uVar160, (int)uVar199 < iVar141) {
                    auVar253 = (undefined1  [16])0x0;
                    lVar146 = 0;
                    iVar259 = 0;
                    iVar185 = 0;
                    iVar169 = 0;
                    iVar256 = 0;
                    asVar155 = asVar198;
                    while( true ) {
                      iVar292 = asVar155._0_4_;
                      asVar155._0_4_ = iVar292 - 1;
                      asVar155[2] = 0;
                      asVar155[3] = 0;
                      iVar315 = auVar253._12_4_;
                      iVar310 = auVar253._4_4_;
                      iVar313 = auVar253._8_4_;
                      if (iVar292 == 0) break;
                      auVar286 = *(undefined1 (*) [16])
                                  ((ulong)((uVar199 & 1) + ((uint)(uVar160 >> 1) & 0x7fffffff)) *
                                   lVar187 + opt_q._0_8_ + lVar146);
                      auVar418 = *(undefined1 (*) [16])((long)pvVar153 + lVar146 * 4);
                      auVar244 = *(undefined1 (*) [16])((long)pvVar153 + lVar146 * 4 + 0x10);
                      auVar350 = *(undefined1 (*) [16])((long)pvVar153 + lVar146 * 4 + 0x20);
                      auVar388 = *(undefined1 (*) [16])((long)pvVar153 + lVar146 * 4 + 0x30);
                      sVar392 = auVar286._6_2_;
                      auVar347._0_12_ = auVar286._0_12_;
                      auVar347._12_2_ = sVar392;
                      auVar347._14_2_ = sVar392;
                      auVar346._12_4_ = auVar347._12_4_;
                      auVar346._0_10_ = auVar286._0_10_;
                      sVar486 = auVar286._4_2_;
                      auVar346._10_2_ = sVar486;
                      auVar345._10_6_ = auVar346._10_6_;
                      auVar345._0_8_ = auVar286._0_8_;
                      auVar345._8_2_ = sVar486;
                      auVar285 = pshuflw(in_XMM7,auVar286,0x50);
                      sVar525 = auVar286._8_2_;
                      uVar223 = CONCAT22(sVar525,sVar525);
                      sVar484 = auVar286._10_2_;
                      auVar369._0_8_ = CONCAT26(sVar484,CONCAT24(sVar484,uVar223));
                      sVar397 = auVar286._12_2_;
                      auVar369._8_2_ = sVar397;
                      auVar369._10_2_ = sVar397;
                      auVar386._14_2_ = auVar286._14_2_;
                      auVar386._12_2_ = auVar386._14_2_;
                      auVar386._0_12_ = auVar369;
                      auVar448._0_4_ = auVar285._0_4_;
                      auVar448._4_4_ = auVar448._0_4_;
                      auVar448._8_4_ = auVar285._4_4_;
                      auVar448._12_4_ = auVar285._4_4_;
                      sVar485 = auVar418._6_2_ * auVar285._2_2_;
                      auVar344 = pmulhw(auVar418,auVar448);
                      auVar348._4_4_ = auVar345._8_4_;
                      auVar348._0_4_ = auVar345._8_4_;
                      auVar348._8_4_ = auVar346._12_4_;
                      auVar348._12_4_ = auVar346._12_4_;
                      sVar429 = auVar244._6_2_ * sVar486;
                      auVar252 = pmulhw(auVar244,auVar348);
                      uVar260 = (undefined4)((ulong)auVar369._0_8_ >> 0x20);
                      auVar516._4_4_ = uVar223;
                      auVar516._0_4_ = uVar223;
                      auVar516._8_4_ = uVar260;
                      auVar516._12_4_ = uVar260;
                      sVar312 = auVar350._6_2_ * sVar525;
                      auVar212 = pmulhw(auVar350,auVar516);
                      auVar517._4_4_ = auVar369._8_4_;
                      auVar517._0_4_ = auVar369._8_4_;
                      auVar517._8_4_ = auVar386._12_4_;
                      auVar517._12_4_ = auVar386._12_4_;
                      sVar393 = auVar388._6_2_ * sVar397;
                      auVar286 = pmulhw(auVar388,auVar517);
                      iVar292 = CONCAT22(auVar344._6_2_,sVar485);
                      Var78 = CONCAT64(CONCAT42(iVar292,auVar344._4_2_),
                                       CONCAT22(auVar418._4_2_ * auVar285._0_2_,sVar485));
                      auVar125._4_8_ = (long)((unkuint10)Var78 >> 0x10);
                      auVar125._2_2_ = auVar344._2_2_;
                      auVar125._0_2_ = auVar418._2_2_ * auVar285._2_2_;
                      iVar311 = CONCAT22(auVar344._8_2_,auVar418._8_2_ * auVar285._4_2_);
                      auVar493._0_8_ =
                           CONCAT26(auVar344._10_2_,
                                    CONCAT24(auVar418._10_2_ * auVar285._6_2_,iVar311));
                      auVar493._8_2_ = auVar418._12_2_ * auVar285._4_2_;
                      auVar493._10_2_ = auVar344._12_2_;
                      auVar506._12_2_ = auVar418._14_2_ * auVar285._6_2_;
                      auVar506._0_12_ = auVar493;
                      auVar506._14_2_ = auVar344._14_2_;
                      iVar261 = CONCAT22(auVar252._6_2_,sVar429);
                      Var81 = CONCAT64(CONCAT42(iVar261,auVar252._4_2_),
                                       CONCAT22(auVar244._4_2_ * sVar486,sVar429));
                      auVar126._4_8_ = (long)((unkuint10)Var81 >> 0x10);
                      auVar126._2_2_ = auVar252._2_2_;
                      auVar126._0_2_ = auVar244._2_2_ * sVar486;
                      in_XMM8._0_4_ = CONCAT22(auVar252._0_2_,auVar244._0_2_ * sVar486);
                      in_XMM8._4_12_ = auVar126;
                      iVar293 = CONCAT22(auVar252._8_2_,auVar244._8_2_ * sVar392);
                      auVar432._0_8_ =
                           CONCAT26(auVar252._10_2_,CONCAT24(auVar244._10_2_ * sVar392,iVar293));
                      auVar432._8_2_ = auVar244._12_2_ * sVar392;
                      auVar432._10_2_ = auVar252._12_2_;
                      in_XMM7._12_2_ = auVar244._14_2_ * sVar392;
                      in_XMM7._0_12_ = auVar432;
                      in_XMM7._14_2_ = auVar252._14_2_;
                      iVar288 = CONCAT22(auVar212._6_2_,sVar312);
                      Var84 = CONCAT64(CONCAT42(iVar288,auVar212._4_2_),
                                       CONCAT22(auVar350._4_2_ * sVar525,sVar312));
                      auVar127._4_8_ = (long)((unkuint10)Var84 >> 0x10);
                      auVar127._2_2_ = auVar212._2_2_;
                      auVar127._0_2_ = auVar350._2_2_ * sVar525;
                      iVar290 = CONCAT22(auVar212._8_2_,auVar350._8_2_ * sVar484);
                      auVar320._0_8_ =
                           CONCAT26(auVar212._10_2_,CONCAT24(auVar350._10_2_ * sVar484,iVar290));
                      auVar320._8_2_ = auVar350._12_2_ * sVar484;
                      auVar320._10_2_ = auVar212._12_2_;
                      auVar349._12_2_ = auVar350._14_2_ * sVar484;
                      auVar349._0_12_ = auVar320;
                      auVar349._14_2_ = auVar212._14_2_;
                      iVar289 = CONCAT22(auVar286._6_2_,sVar393);
                      Var132 = CONCAT64(CONCAT42(iVar289,auVar286._4_2_),
                                        CONCAT22(auVar388._4_2_ * sVar397,sVar393));
                      auVar128._4_8_ = (long)((unkuint10)Var132 >> 0x10);
                      auVar128._2_2_ = auVar286._2_2_;
                      auVar128._0_2_ = auVar388._2_2_ * sVar397;
                      iVar259 = CONCAT22(auVar286._0_2_,auVar388._0_2_ * sVar397) +
                                CONCAT22(auVar212._0_2_,auVar350._0_2_ * sVar525) + in_XMM8._0_4_ +
                                iVar259 + CONCAT22(auVar344._0_2_,auVar418._0_2_ * auVar285._0_2_);
                      iVar185 = auVar128._0_4_ +
                                auVar127._0_4_ + auVar126._0_4_ + iVar185 + auVar125._0_4_;
                      iVar169 = (int)((unkuint10)Var132 >> 0x10) +
                                (int)((unkuint10)Var84 >> 0x10) + (int)((unkuint10)Var81 >> 0x10) +
                                iVar169 + (int)((unkuint10)Var78 >> 0x10);
                      iVar256 = iVar289 + iVar288 + iVar261 + iVar256 + iVar292;
                      iVar292 = CONCAT22(auVar286._8_2_,auVar388._8_2_ * auVar386._14_2_);
                      auVar370._0_8_ =
                           CONCAT26(auVar286._10_2_,
                                    CONCAT24(auVar388._10_2_ * auVar386._14_2_,iVar292));
                      auVar370._8_2_ = auVar388._12_2_ * auVar386._14_2_;
                      auVar370._10_2_ = auVar286._12_2_;
                      auVar387._12_2_ = auVar388._14_2_ * auVar386._14_2_;
                      auVar387._0_12_ = auVar370;
                      auVar387._14_2_ = auVar286._14_2_;
                      auVar253._0_4_ = iVar292 + iVar290 + iVar293 + auVar253._0_4_ + iVar311;
                      auVar253._4_4_ =
                           (int)((ulong)auVar370._0_8_ >> 0x20) +
                           (int)((ulong)auVar320._0_8_ >> 0x20) +
                           (int)((ulong)auVar432._0_8_ >> 0x20) +
                           iVar310 + (int)((ulong)auVar493._0_8_ >> 0x20);
                      auVar253._8_4_ =
                           auVar370._8_4_ +
                           auVar320._8_4_ + auVar432._8_4_ + iVar313 + auVar493._8_4_;
                      auVar253._12_4_ =
                           auVar387._12_4_ +
                           auVar349._12_4_ + in_XMM7._12_4_ + iVar315 + auVar506._12_4_;
                      lVar146 = lVar146 + 0x10;
                    }
                    auVar215._12_4_ = iVar256 + iVar315;
                    *(int *)asVar168 = iVar259 + auVar253._0_4_;
                    *(int *)asVar195 = iVar185 + iVar310;
                    *(int *)asVar196 = iVar169 + iVar313;
                    auVar215._4_4_ = auVar215._12_4_;
                    auVar215._0_4_ = auVar215._12_4_;
                    auVar215._8_4_ = auVar215._12_4_;
                    *(int *)asVar144 = auVar215._12_4_;
                    asVar168 = (short  [4])((long)asVar168 + 4);
                    asVar195 = (short  [4])((long)asVar195 + 4);
                    asVar196 = (short  [4])((long)asVar196 + 4);
                    asVar144 = (short  [4])((long)asVar144 + 4);
                    uVar160 = (ulong)(uVar199 + 1);
                  }
                  pvVar153 = (void *)((long)pvVar153 + (long)iVar176 * (long)local_628);
                }
                pvVar162 = (void *)((long)pvVar162 + local_5b0);
                local_610 = asVar145;
                asVar171 = (short  [4])((long)asVar145 + 1);
              }
              pvVar162 = (this->weight_winograd43_data).data;
              sVar184 = (this->weight_winograd43_data).elemsize;
              sVar47 = (this->weight_winograd43_data).cstep;
              for (uVar160 = uVar135 & 0xfffffffffffffffc; (long)uVar160 < (long)uVar135;
                  uVar160 = uVar160 + 1) {
                uVar172 = (ulong)(uint)((int)uVar160 >> 0x1f) << 0x20 | uVar160 & 0xffffffff;
                iVar176 = (this->weight_winograd43_data).w;
                pvVar153 = (void *)((long)((int)((long)uVar172 % 4) + (int)((long)uVar172 / 4)) *
                                    sVar47 * sVar184 + (long)pvVar162);
                asVar145 = d1;
                for (lVar163 = 0; lVar163 != 0x24; lVar163 = lVar163 + 1) {
                  lVar187 = (long)(int)opt_q._44_4_ *
                            CONCAT44(opt_q.workspace_allocator._4_4_,opt_q.workspace_allocator._0_4_
                                    );
                  lVar146 = opt_q._0_8_;
                  for (uVar172 = 0; (long)(uVar172 | 1) < lVar177; uVar172 = uVar172 + 2) {
                    iVar292 = 0;
                    iVar310 = 0;
                    iVar313 = 0;
                    iVar315 = 0;
                    lVar178 = 0;
                    iVar261 = 0;
                    iVar288 = 0;
                    iVar289 = 0;
                    iVar290 = 0;
                    iVar293 = 0;
                    iVar311 = 0;
                    iVar314 = 0;
                    iVar316 = 0;
                    iVar259 = 0;
                    iVar185 = 0;
                    iVar169 = 0;
                    iVar256 = 0;
                    asVar158 = asVar198;
                    while (iVar357 = asVar158._0_4_, asVar158._0_4_ = iVar357 - 1, asVar158[2] = 0,
                          asVar158[3] = 0, iVar357 != 0) {
                      auVar286 = *(undefined1 (*) [16])(lVar146 + lVar178 * 2);
                      auVar418 = *(undefined1 (*) [16])(lVar146 + 0x10 + lVar178 * 2);
                      auVar244 = *(undefined1 (*) [16])((long)pvVar153 + lVar178);
                      sVar312 = auVar244._6_2_ * auVar286._6_2_;
                      auVar350 = pmulhw(auVar286,auVar244);
                      sVar486 = auVar244._6_2_ * auVar418._6_2_;
                      auVar388 = pmulhw(auVar418,auVar244);
                      iVar357 = CONCAT22(auVar350._6_2_,sVar312);
                      Var78 = CONCAT64(CONCAT42(iVar357,auVar350._4_2_),
                                       CONCAT22(auVar244._4_2_ * auVar286._4_2_,sVar312));
                      auVar129._4_8_ = (long)((unkuint10)Var78 >> 0x10);
                      auVar129._2_2_ = auVar350._2_2_;
                      auVar129._0_2_ = auVar244._2_2_ * auVar286._2_2_;
                      iVar292 = iVar292 + CONCAT22(auVar350._0_2_,auVar244._0_2_ * auVar286._0_2_);
                      iVar310 = iVar310 + auVar129._0_4_;
                      iVar313 = iVar313 + (int)((unkuint10)Var78 >> 0x10);
                      iVar315 = iVar315 + iVar357;
                      iVar357 = CONCAT22(auVar350._8_2_,auVar244._8_2_ * auVar286._8_2_);
                      auVar433._0_8_ =
                           CONCAT26(auVar350._10_2_,
                                    CONCAT24(auVar244._10_2_ * auVar286._10_2_,iVar357));
                      auVar433._8_2_ = auVar244._12_2_ * auVar286._12_2_;
                      auVar433._10_2_ = auVar350._12_2_;
                      auVar449._12_2_ = auVar244._14_2_ * auVar286._14_2_;
                      auVar449._0_12_ = auVar433;
                      auVar449._14_2_ = auVar350._14_2_;
                      iVar261 = iVar261 + iVar357;
                      iVar288 = iVar288 + (int)((ulong)auVar433._0_8_ >> 0x20);
                      iVar289 = iVar289 + auVar433._8_4_;
                      iVar290 = iVar290 + auVar449._12_4_;
                      iVar357 = CONCAT22(auVar388._6_2_,sVar486);
                      Var78 = CONCAT64(CONCAT42(iVar357,auVar388._4_2_),
                                       CONCAT22(auVar244._4_2_ * auVar418._4_2_,sVar486));
                      auVar130._4_8_ = (long)((unkuint10)Var78 >> 0x10);
                      auVar130._2_2_ = auVar388._2_2_;
                      auVar130._0_2_ = auVar244._2_2_ * auVar418._2_2_;
                      iVar293 = iVar293 + CONCAT22(auVar388._0_2_,auVar244._0_2_ * auVar418._0_2_);
                      iVar311 = iVar311 + auVar130._0_4_;
                      iVar314 = iVar314 + (int)((unkuint10)Var78 >> 0x10);
                      iVar316 = iVar316 + iVar357;
                      iVar357 = CONCAT22(auVar388._8_2_,auVar244._8_2_ * auVar418._8_2_);
                      auVar463._0_8_ =
                           CONCAT26(auVar388._10_2_,
                                    CONCAT24(auVar244._10_2_ * auVar418._10_2_,iVar357));
                      auVar463._8_2_ = auVar244._12_2_ * auVar418._12_2_;
                      auVar463._10_2_ = auVar388._12_2_;
                      auVar483._12_2_ = auVar244._14_2_ * auVar418._14_2_;
                      auVar483._0_12_ = auVar463;
                      auVar483._14_2_ = auVar388._14_2_;
                      iVar259 = iVar259 + iVar357;
                      iVar185 = iVar185 + (int)((ulong)auVar463._0_8_ >> 0x20);
                      iVar169 = iVar169 + auVar463._8_4_;
                      iVar256 = iVar256 + auVar483._12_4_;
                      lVar178 = lVar178 + 0x10;
                    }
                    *(ulong *)asVar145 =
                         CONCAT44(iVar169 + iVar314 + iVar259 + iVar293 +
                                  iVar256 + iVar316 + iVar185 + iVar311,
                                  iVar289 + iVar313 + iVar261 + iVar292 +
                                  iVar290 + iVar315 + iVar288 + iVar310);
                    asVar145 = (short  [4])((long)asVar145 + 8);
                    lVar146 = lVar146 + lVar187;
                  }
                  while (uVar199 = (uint)uVar172, (int)uVar199 < iVar141) {
                    iVar259 = 0;
                    iVar185 = 0;
                    iVar169 = 0;
                    iVar256 = 0;
                    lVar146 = 0;
                    iVar292 = 0;
                    iVar310 = 0;
                    iVar313 = 0;
                    iVar315 = 0;
                    asVar181 = asVar198;
                    while (iVar261 = asVar181._0_4_, asVar181._0_4_ = iVar261 - 1, asVar181[2] = 0,
                          asVar181[3] = 0, iVar261 != 0) {
                      auVar286 = *(undefined1 (*) [16])
                                  ((ulong)((uVar199 & 1) + ((uint)(uVar172 >> 1) & 0x7fffffff)) *
                                   lVar187 + opt_q._0_8_ + lVar146);
                      auVar418 = *(undefined1 (*) [16])((long)pvVar153 + lVar146);
                      sVar312 = auVar418._6_2_ * auVar286._6_2_;
                      auVar244 = pmulhw(auVar286,auVar418);
                      iVar261 = CONCAT22(auVar244._6_2_,sVar312);
                      Var78 = CONCAT64(CONCAT42(iVar261,auVar244._4_2_),
                                       CONCAT22(auVar418._4_2_ * auVar286._4_2_,sVar312));
                      auVar131._4_8_ = (long)((unkuint10)Var78 >> 0x10);
                      auVar131._2_2_ = auVar244._2_2_;
                      auVar131._0_2_ = auVar418._2_2_ * auVar286._2_2_;
                      iVar259 = iVar259 + CONCAT22(auVar244._0_2_,auVar418._0_2_ * auVar286._0_2_);
                      iVar185 = iVar185 + auVar131._0_4_;
                      iVar169 = iVar169 + (int)((unkuint10)Var78 >> 0x10);
                      iVar256 = iVar256 + iVar261;
                      iVar261 = CONCAT22(auVar244._8_2_,auVar418._8_2_ * auVar286._8_2_);
                      auVar321._0_8_ =
                           CONCAT26(auVar244._10_2_,
                                    CONCAT24(auVar418._10_2_ * auVar286._10_2_,iVar261));
                      auVar321._8_2_ = auVar418._12_2_ * auVar286._12_2_;
                      auVar321._10_2_ = auVar244._12_2_;
                      auVar351._12_2_ = auVar418._14_2_ * auVar286._14_2_;
                      auVar351._0_12_ = auVar321;
                      auVar351._14_2_ = auVar244._14_2_;
                      iVar292 = iVar292 + iVar261;
                      iVar310 = iVar310 + (int)((ulong)auVar321._0_8_ >> 0x20);
                      iVar313 = iVar313 + auVar321._8_4_;
                      iVar315 = iVar315 + auVar351._12_4_;
                      lVar146 = lVar146 + 0x10;
                    }
                    *(int *)asVar145 =
                         iVar315 + iVar256 + iVar310 + iVar185 +
                         iVar313 + iVar169 + iVar292 + iVar259;
                    asVar145 = (short  [4])((long)asVar145 + 4);
                    uVar172 = (ulong)(uVar199 + 1);
                  }
                  pvVar153 = (void *)((long)pvVar153 + (long)iVar176 * sVar184);
                }
              }
              piVar193 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
              if (piVar193 != (int *)0x0) {
                LOCK();
                *piVar193 = *piVar193 + -1;
                UNLOCK();
                if (*piVar193 == 0) {
                  if (opt_q._32_8_ == 0) {
                    free((void *)opt_q._0_8_);
                  }
                  else {
                    (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
                  }
                }
              }
              local_568 = 0;
              d0[0] = 0;
              d0[1] = 0;
              d0[2] = 0;
              d0[3] = 0;
              auStack_578 = SUB1612((undefined1  [16])0x0,4);
              local_588 = (Allocator *)0x0;
              iStack_580 = 0;
              iStack_57c = 0;
              opt_b.lightmode = false;
              opt_b._1_3_ = 0;
              opt_b.num_threads = 0;
              opt_b.blob_allocator._0_4_ = 0;
              opt_b.blob_allocator._4_4_ = 0;
              opt_b.workspace_allocator = (Allocator *)0x0;
              opt_b.openmp_blocktime = 0;
              opt_b.use_bf16_storage = false;
              opt_b.use_fp16_packed = false;
              opt_b.use_fp16_storage = false;
              opt_b.use_fp16_arithmetic = false;
              opt_b.use_int8_packed = false;
              opt_b.use_int8_storage = false;
              opt_b.use_int8_arithmetic = false;
              opt_b.use_packing_layout = false;
              opt_b.use_shader_pack8 = false;
              opt_b.use_subgroup_basic = false;
              opt_b.use_subgroup_vote = false;
              opt_b.use_subgroup_ballot = false;
              opt_b.use_subgroup_shuffle = false;
              opt_b.use_image_storage = false;
              opt_b.use_tensor_storage = false;
              opt_b.use_reserved_0 = false;
              opt_b.flush_denormals = 0;
              opt_b.use_local_pool_allocator = false;
              opt_b.use_shader_local_memory = false;
              opt_b.use_cooperative_matrix = false;
              opt_b.use_winograd23_convolution = false;
              opt_b.use_winograd43_convolution = false;
              opt_b.use_winograd63_convolution = false;
              opt_b.use_reserved_6 = false;
              opt_b.use_reserved_7 = false;
              auVar216._4_4_ = -(uint)(uVar148 == local_5f8.w);
              auVar216._0_4_ = -(uint)(uVar148 == local_5f8.w);
              auVar216._8_4_ = -(uint)(uVar190 == local_5f8.h);
              auVar216._12_4_ = -(uint)(uVar190 == local_5f8.h);
              iVar176 = movmskpd((int)&local_588,auVar216);
              if (iVar176 == 3) {
                piVar193 = (int *)CONCAT44(local_5f8.refcount._4_4_,local_5f8.refcount._0_4_);
                if (piVar193 != (int *)0x0) {
                  LOCK();
                  *piVar193 = *piVar193 + 1;
                  UNLOCK();
                }
                opt_b._0_8_ = local_5f8.data;
                opt_b.blob_allocator._0_4_ = local_5f8.refcount._0_4_;
                opt_b.blob_allocator._4_4_ = local_5f8.refcount._4_4_;
                opt_b.workspace_allocator = (Allocator *)local_5f8.elemsize;
                opt_b.openmp_blocktime = local_5f8.elempack;
                opt_b._32_8_ = local_5f8.allocator;
                opt_b.use_shader_pack8 = (bool)(undefined1)local_5f8.dims;
                opt_b.use_subgroup_basic = (bool)local_5f8.dims._1_1_;
                opt_b.use_subgroup_vote = (bool)local_5f8.dims._2_1_;
                opt_b.use_subgroup_ballot = (bool)local_5f8.dims._3_1_;
                opt_b.use_subgroup_shuffle = (bool)(undefined1)local_5f8.w;
                opt_b.use_image_storage = (bool)local_5f8.w._1_1_;
                opt_b.use_tensor_storage = (bool)local_5f8.w._2_1_;
                opt_b.use_reserved_0 = (bool)local_5f8.w._3_1_;
                opt_b.flush_denormals = local_5f8.h;
                opt_b.use_local_pool_allocator = (bool)(undefined1)local_5f8.d;
                opt_b.use_shader_local_memory = (bool)local_5f8.d._1_1_;
                opt_b.use_cooperative_matrix = (bool)local_5f8.d._2_1_;
                opt_b.use_winograd23_convolution = (bool)local_5f8.d._3_1_;
                opt_b.use_winograd43_convolution = (bool)(undefined1)local_5f8.c;
                opt_b.use_winograd63_convolution = (bool)local_5f8.c._1_1_;
                opt_b.use_reserved_6 = (bool)local_5f8.c._2_1_;
                opt_b.use_reserved_7 = (bool)local_5f8.c._3_1_;
                sVar184 = local_5f8.cstep;
              }
              else {
                Mat::create((Mat *)&opt_b,(int)local_600,uVar190,iVar142,4,1,
                            opt->workspace_allocator);
                sVar184 = 0;
              }
              uVar135 = (ulong)(uint)iVar142;
              if (iVar142 < 1) {
                uVar135 = 0;
              }
              lVar163 = (long)(int)local_600;
              local_3f8._0_2_ = 0;
              local_3f8._2_2_ = 0;
              local_3f8._4_2_ = 0;
              local_3f8._6_2_ = 0;
              lVar146 = (long)(iVar141 * 6) * 4;
              local_630 = (short  [4])((long)d1 + lVar177 * 4);
              local_620 = (short  [4])((long)d1 + (long)(iVar141 * 2) * 4);
              local_618 = (void *)((long)d1 + (long)(iVar141 * 3) * 4);
              local_628 = (void *)((long)d1 + (long)(iVar141 * 4) * 4);
              local_610[0] = d1[0];
              local_610[1] = d1[1];
              local_610[2] = d1[2];
              local_610[3] = d1[3];
              local_438 = (int *)(opt_b._0_8_ + 0xc);
              local_408 = (short  [4])(sVar184 * (long)opt_b.workspace_allocator);
              uVar160 = 0;
              while (uVar172 = uVar160, uVar172 != uVar135) {
                local_600 = (long)(int)opt_b._44_4_ * (long)opt_b.workspace_allocator * 4;
                local_6e8 = local_438;
                asVar147[0] = 0;
                asVar147[1] = 0;
                asVar147[2] = 0;
                asVar147[3] = 0;
                for (; asVar147 != local_608; asVar147 = (short  [4])((long)asVar147 + 1)) {
                  lVar187 = (long)((iVar189 * asVar147._0_4_) / 6);
                  asVar164[0] = 0;
                  asVar164[1] = 0;
                  asVar164[2] = 0;
                  asVar164[3] = 0;
                  uVar160 = (ulong)local_628;
                  asVar145 = d1;
                  lVar177 = (long)d1 + (long)(iVar141 * 5) * 4;
                  piVar193 = local_6e8;
                  uVar175 = (ulong)local_618;
                  uVar192 = (ulong)local_620;
                  asVar198 = local_630;
                  for (; asVar164 != asVar173; asVar164 = (short  [4])((long)asVar164 + 1)) {
                    asVar144 = asVar145;
                    lVar154 = lVar177;
                    uVar159 = uVar160;
                    uVar174 = uVar175;
                    uVar191 = uVar192;
                    asVar195 = asVar198;
                    for (lVar178 = -5; lVar178 != 0; lVar178 = lVar178 + 1) {
                      iVar142 = *(int *)((long)asVar195 + lVar187 * 4);
                      iVar259 = *(int *)(uVar191 + lVar187 * 4);
                      iVar176 = iVar259 + iVar142;
                      iVar142 = iVar142 - iVar259;
                      iVar185 = *(int *)(uVar174 + lVar187 * 4);
                      iVar169 = *(int *)(uVar159 + lVar187 * 4);
                      iVar259 = iVar169 + iVar185;
                      iVar185 = iVar185 - iVar169;
                      *(int *)((long)&opt_q.workspace_allocator + lVar178 * 4 + 4) =
                           iVar176 + *(int *)((long)asVar144 + lVar187 * 4) + iVar259;
                      *(int *)(&opt_q.use_subgroup_shuffle + lVar178 * 4) = iVar142 + iVar185 * 2;
                      aiStack_380[lVar178 + -1] = iVar176 + iVar259 * 4;
                      aiStack_368[lVar178 + -1] =
                           iVar142 + iVar185 * 8 + *(int *)(lVar154 + lVar187 * 4) * 4;
                      asVar144 = (short  [4])((long)asVar144 + lVar146);
                      asVar195 = (short  [4])((long)asVar195 + lVar146);
                      uVar191 = uVar191 + lVar146;
                      uVar174 = uVar174 + lVar146;
                      uVar159 = uVar159 + lVar146;
                      lVar154 = lVar154 + lVar146;
                    }
                    iVar176 = *(int *)(uVar174 + lVar187 * 4);
                    iVar259 = *(int *)(uVar159 + lVar187 * 4);
                    iVar169 = iVar176 - iVar259;
                    iVar142 = *(int *)((long)asVar195 + lVar187 * 4);
                    iVar185 = *(int *)(uVar191 + lVar187 * 4);
                    iVar256 = iVar142 - iVar185;
                    opt_q.workspace_allocator._4_4_ =
                         (iVar185 + iVar142 + iVar259 + iVar176 +
                         *(int *)((long)asVar144 + lVar187 * 4)) * 4;
                    opt_q._44_4_ = iVar169 * 8 + iVar256 * 4;
                    local_378._12_4_ =
                         *(int *)(lVar154 + lVar187 * 4) * 0x10 + iVar169 * 0x20 + iVar256 * 4;
                    piVar138 = piVar193;
                    for (lVar178 = 0x14; lVar178 != 0x74; lVar178 = lVar178 + 0x18) {
                      iVar142 = *(int *)((long)w1 + lVar178 + 4);
                      iVar176 = iVar142 + *(int *)((long)w1 + lVar178);
                      iVar142 = *(int *)((long)w1 + lVar178) - iVar142;
                      iVar259 = *(int *)((long)&uStack_3cc + lVar178) +
                                *(int *)((long)&uStack_3d0 + lVar178);
                      iVar185 = *(int *)((long)&uStack_3d0 + lVar178) -
                                *(int *)((long)&uStack_3cc + lVar178);
                      piVar138[-3] = (*(int *)((long)w1 + lVar178 + -4) + iVar176 + iVar259) / 0x240
                      ;
                      piVar138[-2] = (iVar142 + iVar185 * 2) / 0x240;
                      piVar138[-1] = (iVar176 + iVar259 * 4) / 0x240;
                      *piVar138 = (iVar142 + iVar185 * 8 + *(int *)(&opt_q.lightmode + lVar178)) /
                                  0x240;
                      piVar138 = piVar138 + lVar163;
                    }
                    asVar145 = (short  [4])((long)asVar145 + 4);
                    asVar198 = (short  [4])((long)asVar198 + 4);
                    uVar192 = uVar192 + 4;
                    uVar175 = uVar175 + 4;
                    uVar160 = uVar160 + 4;
                    lVar177 = lVar177 + 4;
                    piVar193 = piVar193 + 4;
                  }
                  local_6e8 = (int *)((long)local_6e8 + local_600);
                }
                local_438 = (int *)((long)local_438 + sVar184 * (long)opt_b.workspace_allocator);
                local_5b0 = uVar172;
                uVar160 = uVar172 + 1;
              }
              copy_cut_border((Mat *)&opt_b,&local_5f8,0,opt_b.flush_denormals - local_5f8.h,0,
                              opt_b._44_4_ - local_5f8.w,opt);
              piVar193 = (int *)CONCAT44(opt_b.blob_allocator._4_4_,opt_b.blob_allocator._0_4_);
              if (piVar193 != (int *)0x0) {
                LOCK();
                *piVar193 = *piVar193 + -1;
                UNLOCK();
                if (*piVar193 == 0) {
                  if (opt_b._32_8_ == 0) {
                    free((void *)opt_b._0_8_);
                  }
                  else {
                    (**(code **)(*(long *)opt_b._32_8_ + 0x18))();
                  }
                }
              }
              piVar193 = (int *)CONCAT44(local_558.refcount._4_4_,local_558.refcount._0_4_);
              if (piVar193 != (int *)0x0) {
                LOCK();
                *piVar193 = *piVar193 + -1;
                UNLOCK();
                if (*piVar193 == 0) {
                  pvVar162 = local_558.data;
                  if (local_558.allocator == (Allocator *)0x0) {
LAB_001a214b:
                    free(pvVar162);
                  }
                  else {
                    (*(local_558.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
            }
            else {
              conv3x3s1_winograd43_pack8to1_int8_sse_xop
                        (&local_678,&local_5f8,&this->weight_winograd43_data,opt);
            }
          }
          else {
            uVar148 = *(uint *)((long)&(this->weight_winograd23_data).c + (long)p_Var45);
            iVar259 = *(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var45);
            iVar169 = *(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var45);
            iVar141 = *(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var45 + 4));
            iVar256 = *(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var45);
            lVar163 = (long)local_5f8.w;
            uVar190 = uVar148 * uVar165;
            if (opt->use_sgemm_convolution == true) {
              opt_q.lightmode = false;
              opt_q._1_3_ = 0;
              opt_q.num_threads = 0;
              opt_q.blob_allocator._0_4_ = 0;
              opt_q.blob_allocator._4_4_ = 0;
              opt_q.workspace_allocator._0_4_ = 0;
              opt_q.workspace_allocator._4_4_ = 0;
              opt_q.openmp_blocktime = 0;
              opt_q.use_bf16_storage = false;
              opt_q.use_fp16_packed = false;
              opt_q.use_fp16_storage = false;
              opt_q.use_fp16_arithmetic = false;
              opt_q.use_int8_packed = false;
              opt_q.use_int8_storage = false;
              opt_q.use_int8_arithmetic = false;
              opt_q.use_packing_layout = false;
              opt_q.use_shader_pack8 = false;
              opt_q.use_subgroup_basic = false;
              opt_q.use_subgroup_vote = false;
              opt_q.use_subgroup_ballot = false;
              opt_q.use_subgroup_shuffle = false;
              opt_q.use_image_storage = false;
              opt_q.use_tensor_storage = false;
              opt_q.use_reserved_0 = false;
              opt_q.flush_denormals = 0;
              opt_q.use_local_pool_allocator = false;
              opt_q.use_shader_local_memory = false;
              opt_q.use_cooperative_matrix = false;
              opt_q.use_winograd23_convolution = false;
              opt_q.use_winograd43_convolution = false;
              opt_q.use_winograd63_convolution = false;
              opt_q.use_reserved_6 = false;
              opt_q.use_reserved_7 = false;
              Mat::create((Mat *)&opt_q,local_5f8.h * local_5f8.w,uVar190,local_678.c,8,8,
                          opt->workspace_allocator);
              uVar160 = 0;
              uVar190 = iVar185;
              if (iVar185 < 1) {
                uVar190 = 0;
              }
              if ((int)uVar199 < 1) {
                uVar199 = 0;
              }
              if ((int)uVar165 < 1) {
                uVar135 = uVar160;
              }
              uVar172 = (ulong)uVar148;
              if ((int)uVar148 < 1) {
                uVar172 = uVar160;
              }
              uVar175 = (ulong)(uint)iVar142;
              if (iVar142 < 1) {
                uVar175 = uVar160;
              }
              for (; uVar160 != uVar175; uVar160 = uVar160 + 1) {
                puVar167 = (undefined8 *)opt_q._0_8_;
                for (uVar192 = 0; uVar192 != uVar172; uVar192 = uVar192 + 1) {
                  for (uVar159 = 0; uVar159 != uVar135; uVar159 = uVar159 + 1) {
                    puVar166 = (undefined8 *)
                               ((long)local_678.data +
                               uVar159 * (long)iVar259 * 8 +
                               local_678.elemsize * (long)local_678.w * (long)iVar169 * uVar192 +
                               local_678.cstep * uVar160 * local_678.elemsize);
                    for (uVar165 = 0; uVar148 = uVar190, uVar165 != uVar199; uVar165 = uVar165 + 1)
                    {
                      while (uVar148 != 0) {
                        *puVar167 = *puVar166;
                        puVar167 = puVar167 + 1;
                        puVar166 = puVar166 + iVar141;
                        uVar148 = uVar148 - 1;
                      }
                      puVar166 = puVar166 + ((long)(iVar176 * iVar256) - (long)(iVar141 * iVar185));
                    }
                  }
                }
              }
              im2col_sgemm_pack8to1_int8_sse((Mat *)&opt_q,&local_5f8,&this->weight_sgemm_data,opt);
              piVar193 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
              if (piVar193 != (int *)0x0) {
                LOCK();
                *piVar193 = *piVar193 + -1;
                UNLOCK();
                if (*piVar193 == 0) {
                  pvVar162 = (void *)opt_q._0_8_;
                  if (opt_q._32_8_ == 0) goto LAB_001a214b;
                  (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
                }
              }
            }
            else {
              uVar160 = (ulong)(uint)local_5f8.c;
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)&opt_q,(long)(int)uVar190,
                         (allocator_type *)&local_558);
              uVar140 = 0;
              if ((int)uVar165 < 1) {
                uVar135 = 0;
              }
              if ((int)uVar148 < 1) {
                uVar148 = uVar140;
              }
              iVar310 = 0;
              uVar172 = uVar135;
              iVar292 = 0;
              for (; uVar140 != uVar148; uVar140 = uVar140 + 1) {
                for (lVar177 = (long)iVar292; (int)uVar172 != lVar177; lVar177 = lVar177 + 1) {
                  *(int *)(opt_q._0_8_ + lVar177 * 4) = iVar310;
                  iVar310 = iVar310 + iVar259;
                }
                iVar310 = iVar310 + (iVar176 * iVar169 - iVar259 * uVar165);
                uVar172 = (ulong)(uint)((int)uVar172 + (int)uVar135);
                iVar292 = iVar292 + (int)uVar135;
              }
              if ((int)uVar190 < 1) {
                uVar190 = 0;
              }
              uVar135 = (ulong)(uint)iVar142;
              if (iVar142 < 1) {
                uVar135 = 0;
              }
              uVar172 = 0;
              if (0 < iVar185) {
                uVar172 = (ulong)(uint)iVar185;
              }
              if ((int)uVar199 < 1) {
                uVar199 = 0;
              }
              if (iVar189 < 1) {
                uVar160 = 0;
              }
              for (uVar175 = 0; uVar175 != uVar160; uVar175 = uVar175 + 1) {
                local_708 = (void *)(local_5f8.elemsize * local_5f8.cstep * uVar175 +
                                    (long)local_5f8.data);
                for (uVar192 = 0; uVar192 != uVar199; uVar192 = uVar192 + 1) {
                  sVar184 = (this->weight_data_tm).cstep;
                  sVar47 = (this->weight_data_tm).elemsize;
                  pvVar162 = (this->weight_data_tm).data;
                  for (uVar159 = 0; uVar159 != uVar172; uVar159 = uVar159 + 1) {
                    iVar176 = 0;
                    pvVar153 = (void *)(sVar184 * uVar175 * sVar47 + (long)pvVar162);
                    for (uVar174 = 0; uVar174 != uVar135; uVar174 = uVar174 + 1) {
                      for (uVar191 = 0; uVar190 != uVar191; uVar191 = uVar191 + 1) {
                        uVar151 = *(ulong *)((long)local_678.data +
                                            (long)*(int *)(opt_q._0_8_ + uVar191 * 4) * 8 +
                                            local_678.cstep * local_678.elemsize * uVar174 +
                                            (long)(iVar141 * 8 * (int)uVar159) +
                                            (long)local_678.w * uVar192 * (long)iVar256 *
                                            local_678.elemsize);
                        cVar217 = (char)(uVar151 >> 8);
                        cVar218 = (char)(uVar151 >> 0x10);
                        cVar219 = (char)(uVar151 >> 0x18);
                        cVar220 = (char)(uVar151 >> 0x20);
                        cVar221 = (char)(uVar151 >> 0x28);
                        cVar222 = (char)(uVar151 >> 0x30);
                        auVar207._8_6_ = 0;
                        auVar207._0_8_ = uVar151;
                        auVar207[0xe] = (char)(uVar151 >> 0x38);
                        auVar207[0xf] = -((long)uVar151 < 0);
                        auVar206._14_2_ = auVar207._14_2_;
                        auVar206._8_5_ = 0;
                        auVar206._0_8_ = uVar151;
                        auVar206[0xd] = -(cVar222 < '\0');
                        auVar205._13_3_ = auVar206._13_3_;
                        auVar205._8_4_ = 0;
                        auVar205._0_8_ = uVar151;
                        auVar205[0xc] = cVar222;
                        auVar204._12_4_ = auVar205._12_4_;
                        auVar204._8_3_ = 0;
                        auVar204._0_8_ = uVar151;
                        auVar204[0xb] = -(cVar221 < '\0');
                        auVar203._11_5_ = auVar204._11_5_;
                        auVar203._8_2_ = 0;
                        auVar203._0_8_ = uVar151;
                        auVar203[10] = cVar221;
                        auVar202._10_6_ = auVar203._10_6_;
                        auVar202[8] = 0;
                        auVar202._0_8_ = uVar151;
                        auVar202[9] = -(cVar220 < '\0');
                        auVar201._9_7_ = auVar202._9_7_;
                        auVar201[8] = cVar220;
                        auVar201._0_8_ = uVar151;
                        Var78 = CONCAT91(CONCAT81(auVar201._8_8_,-(cVar219 < '\0')),cVar219);
                        auVar93._2_10_ = Var78;
                        auVar93[1] = -(cVar218 < '\0');
                        auVar93[0] = cVar218;
                        auVar92._2_12_ = auVar93;
                        auVar92[1] = -(cVar217 < '\0');
                        auVar92[0] = cVar217;
                        auVar200._0_2_ = CONCAT11(-((char)uVar151 < '\0'),(char)uVar151);
                        auVar200._2_14_ = auVar92;
                        uVar151 = *(ulong *)((long)pvVar153 + uVar191 * 8);
                        cVar217 = (char)(uVar151 >> 8);
                        cVar218 = (char)(uVar151 >> 0x10);
                        cVar219 = (char)(uVar151 >> 0x18);
                        cVar220 = (char)(uVar151 >> 0x20);
                        cVar221 = (char)(uVar151 >> 0x28);
                        cVar222 = (char)(uVar151 >> 0x30);
                        auVar238._8_6_ = 0;
                        auVar238._0_8_ = uVar151;
                        auVar238[0xe] = (char)(uVar151 >> 0x38);
                        auVar238[0xf] = -((long)uVar151 < 0);
                        auVar237._14_2_ = auVar238._14_2_;
                        auVar237._8_5_ = 0;
                        auVar237._0_8_ = uVar151;
                        auVar237[0xd] = -(cVar222 < '\0');
                        auVar236._13_3_ = auVar237._13_3_;
                        auVar236._8_4_ = 0;
                        auVar236._0_8_ = uVar151;
                        auVar236[0xc] = cVar222;
                        auVar235._12_4_ = auVar236._12_4_;
                        auVar235._8_3_ = 0;
                        auVar235._0_8_ = uVar151;
                        auVar235[0xb] = -(cVar221 < '\0');
                        auVar234._11_5_ = auVar235._11_5_;
                        auVar234._8_2_ = 0;
                        auVar234._0_8_ = uVar151;
                        auVar234[10] = cVar221;
                        auVar233._10_6_ = auVar234._10_6_;
                        auVar233[8] = 0;
                        auVar233._0_8_ = uVar151;
                        auVar233[9] = -(cVar220 < '\0');
                        auVar232._9_7_ = auVar233._9_7_;
                        auVar232[8] = cVar220;
                        auVar232._0_8_ = uVar151;
                        Var81 = CONCAT91(CONCAT81(auVar232._8_8_,-(cVar219 < '\0')),cVar219);
                        auVar95._2_10_ = Var81;
                        auVar95[1] = -(cVar218 < '\0');
                        auVar95[0] = cVar218;
                        auVar94._2_12_ = auVar95;
                        auVar94[1] = -(cVar217 < '\0');
                        auVar94[0] = cVar217;
                        auVar231._0_2_ = CONCAT11(-((char)uVar151 < '\0'),(char)uVar151);
                        auVar231._2_14_ = auVar94;
                        sVar312 = (short)Var81 * (short)Var78;
                        auVar286 = pmulhw(auVar231,auVar200);
                        iVar259 = CONCAT22(auVar286._6_2_,sVar312);
                        Var78 = CONCAT64(CONCAT42(iVar259,auVar286._4_2_),
                                         CONCAT22(auVar95._0_2_ * auVar93._0_2_,sVar312));
                        auVar96._4_8_ = (long)((unkuint10)Var78 >> 0x10);
                        auVar96._2_2_ = auVar286._2_2_;
                        auVar96._0_2_ = auVar94._0_2_ * auVar92._0_2_;
                        iVar142 = CONCAT22(auVar286._8_2_,auVar232._8_2_ * auVar201._8_2_);
                        auVar264._0_8_ =
                             CONCAT26(auVar286._10_2_,
                                      CONCAT24(auVar234._10_2_ * auVar203._10_2_,iVar142));
                        auVar264._8_2_ = auVar236._12_2_ * auVar205._12_2_;
                        auVar264._10_2_ = auVar286._12_2_;
                        auVar277._12_2_ = auVar237._14_2_ * auVar206._14_2_;
                        auVar277._0_12_ = auVar264;
                        auVar277._14_2_ = auVar286._14_2_;
                        iVar176 = iVar176 + auVar277._12_4_ + iVar259 +
                                            (int)((ulong)auVar264._0_8_ >> 0x20) + auVar96._0_4_ +
                                            auVar264._8_4_ + (int)((unkuint10)Var78 >> 0x10) +
                                            iVar142 + CONCAT22(auVar286._0_2_,
                                                               auVar231._0_2_ * auVar200._0_2_);
                      }
                      pvVar153 = (void *)((long)pvVar153 + (ulong)uVar190 * 8);
                    }
                    *(int *)((long)local_708 + uVar159 * 4) = iVar176;
                  }
                  local_708 = (void *)((long)local_708 + lVar163 * 4);
                }
              }
LAB_0019e481:
              std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                        ((_Vector_base<int,_std::allocator<int>_> *)&opt_q);
            }
          }
        }
      }
      else if (iVar259 == 1 && iVar169 == 1) {
        p_Var45 = this->_vptr_Convolution_x86[-3];
        uVar165 = *(uint *)((long)&(this->weight_winograd23_data).d + (long)p_Var45);
        uVar135 = (ulong)uVar165;
        if ((uVar165 == 1) &&
           (*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var45) == 1)) {
          if ((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var45) == 1) &&
             (((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var45) == 1 &&
               (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var45 + 4)) == 1))
              && (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var45) == 1)))) {
            conv1x1s1_sgemm_int8_sse(&local_678,&local_5f8,&this->weight_sgemm_data,opt);
          }
          else {
            if ((((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var45) != 1) ||
                 (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var45) != 1)) ||
                (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var45 + 4)) != 2))
               || (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var45) != 2))
            goto LAB_0019d96d;
            opt_q.lightmode = false;
            opt_q._1_3_ = 0;
            opt_q.num_threads = 0;
            opt_q.blob_allocator._0_4_ = 0;
            opt_q.blob_allocator._4_4_ = 0;
            opt_q.workspace_allocator._0_4_ = 0;
            opt_q.workspace_allocator._4_4_ = 0;
            opt_q.openmp_blocktime = 0;
            opt_q.use_bf16_storage = false;
            opt_q.use_fp16_packed = false;
            opt_q.use_fp16_storage = false;
            opt_q.use_fp16_arithmetic = false;
            opt_q.use_int8_packed = false;
            opt_q.use_int8_storage = false;
            opt_q.use_int8_arithmetic = false;
            opt_q.use_packing_layout = false;
            opt_q.use_shader_pack8 = false;
            opt_q.use_subgroup_basic = false;
            opt_q.use_subgroup_vote = false;
            opt_q.use_subgroup_ballot = false;
            opt_q.use_subgroup_shuffle = false;
            opt_q.use_image_storage = false;
            opt_q.use_tensor_storage = false;
            opt_q.use_reserved_0 = false;
            opt_q.flush_denormals = 0;
            opt_q.use_local_pool_allocator = false;
            opt_q.use_shader_local_memory = false;
            opt_q.use_cooperative_matrix = false;
            opt_q.use_winograd23_convolution = false;
            opt_q.use_winograd43_convolution = false;
            opt_q.use_winograd63_convolution = false;
            opt_q.use_reserved_6 = false;
            opt_q.use_reserved_7 = false;
            Mat::create((Mat *)&opt_q,local_5f8.w,local_5f8.h,local_678.c,local_678.elemsize,
                        local_678.elempack,opt->workspace_allocator);
            uVar135 = 0;
            if ((int)uVar199 < 1) {
              uVar199 = 0;
            }
            uVar160 = (ulong)(uint)iVar142;
            if (iVar142 < 1) {
              uVar160 = uVar135;
            }
            for (; uVar135 != uVar160; uVar135 = uVar135 + 1) {
              puVar150 = (undefined1 *)
                         (local_678.cstep * uVar135 * local_678.elemsize + (long)local_678.data);
              lVar163 = opt_q._0_8_;
              for (uVar165 = 0; uVar165 != uVar199; uVar165 = uVar165 + 1) {
                puVar170 = puVar150 + (iVar176 - iVar185) * 2;
                puVar179 = puVar150;
                for (lVar177 = 0; (int)lVar177 + 3 < iVar185; lVar177 = lVar177 + 4) {
                  *(undefined1 *)(lVar163 + lVar177) = *puVar179;
                  *(undefined1 *)(lVar163 + 1 + lVar177) = puVar179[2];
                  *(undefined1 *)(lVar163 + 2 + lVar177) = puVar179[4];
                  *(undefined1 *)(lVar163 + 3 + lVar177) = puVar179[6];
                  puVar179 = puVar179 + 8;
                  puVar170 = puVar170 + 8;
                }
                for (; (int)lVar177 + 1 < iVar185; lVar177 = lVar177 + 2) {
                  *(undefined1 *)(lVar163 + lVar177) = *puVar179;
                  *(undefined1 *)(lVar163 + 1 + lVar177) = puVar179[2];
                  puVar179 = puVar179 + 4;
                  puVar170 = puVar170 + 4;
                }
                for (; (int)lVar177 < iVar185; lVar177 = lVar177 + 1) {
                  *(undefined1 *)(lVar163 + lVar177) = puVar150[lVar177 * 2];
                  puVar170 = puVar170 + 2;
                }
                lVar163 = lVar163 + lVar177;
                puVar150 = puVar170;
              }
            }
            conv1x1s1_sgemm_int8_sse((Mat *)&opt_q,&local_5f8,&this->weight_sgemm_data,opt);
            piVar193 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
            if (piVar193 != (int *)0x0) {
              LOCK();
              *piVar193 = *piVar193 + -1;
              UNLOCK();
              if (*piVar193 == 0) {
                pvVar162 = (void *)opt_q._0_8_;
                if (opt_q._32_8_ == 0) goto LAB_001a214b;
                (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
              }
            }
          }
        }
        else {
LAB_0019d96d:
          if ((((opt->use_winograd_convolution != true) || (uVar165 != 3)) ||
              ((opt->use_winograd23_convolution == false ||
               (((*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var45) != 3 ||
                 (*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var45) != 1)) ||
                (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var45) != 1)))))) ||
             (((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var45 + 4)) != 1 ||
               (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var45) != 1)) ||
              ((iVar259 * local_608._0_4_ < 0x10 ||
               (*(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var45) < 0x10)))))) {
            uVar148 = *(uint *)((long)&(this->weight_winograd23_data).c + (long)p_Var45);
            iVar259 = *(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var45);
            iVar169 = *(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var45);
            iVar141 = *(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var45 + 4));
            lVar163 = (long)iVar141;
            iVar256 = *(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var45);
            lVar177 = (long)local_5f8.w;
            uVar160 = (ulong)(uint)local_5f8.h;
            uVar190 = uVar148 * uVar165;
            uVar172 = (ulong)uVar190;
            if (opt->use_sgemm_convolution == true) {
              opt_q.lightmode = false;
              opt_q._1_3_ = 0;
              opt_q.num_threads = 0;
              opt_q.blob_allocator._0_4_ = 0;
              opt_q.blob_allocator._4_4_ = 0;
              opt_q.workspace_allocator._0_4_ = 0;
              opt_q.workspace_allocator._4_4_ = 0;
              opt_q.openmp_blocktime = 0;
              opt_q.use_bf16_storage = false;
              opt_q.use_fp16_packed = false;
              opt_q.use_fp16_storage = false;
              opt_q.use_fp16_arithmetic = false;
              opt_q.use_int8_packed = false;
              opt_q.use_int8_storage = false;
              opt_q.use_int8_arithmetic = false;
              opt_q.use_packing_layout = false;
              opt_q.use_shader_pack8 = false;
              opt_q.use_subgroup_basic = false;
              opt_q.use_subgroup_vote = false;
              opt_q.use_subgroup_ballot = false;
              opt_q.use_subgroup_shuffle = false;
              opt_q.use_image_storage = false;
              opt_q.use_tensor_storage = false;
              opt_q.use_reserved_0 = false;
              opt_q.flush_denormals = 0;
              opt_q.use_local_pool_allocator = false;
              opt_q.use_shader_local_memory = false;
              opt_q.use_cooperative_matrix = false;
              opt_q.use_winograd23_convolution = false;
              opt_q.use_winograd43_convolution = false;
              opt_q.use_winograd63_convolution = false;
              opt_q.use_reserved_6 = false;
              opt_q.use_reserved_7 = false;
              Mat::create((Mat *)&opt_q,local_5f8.h * local_5f8.w,uVar190,local_678.c,1,1,
                          opt->workspace_allocator);
              lVar177 = (long)(iVar141 * 2);
              uVar160 = 0;
              if ((int)uVar199 < 1) {
                uVar199 = 0;
              }
              if ((int)uVar165 < 1) {
                uVar135 = uVar160;
              }
              uVar172 = (ulong)uVar148;
              if ((int)uVar148 < 1) {
                uVar172 = uVar160;
              }
              uVar175 = (ulong)(uint)iVar142;
              if (iVar142 < 1) {
                uVar175 = uVar160;
              }
              for (; uVar160 != uVar175; uVar160 = uVar160 + 1) {
                lVar146 = opt_q._0_8_;
                for (uVar192 = 0; uVar192 != uVar172; uVar192 = uVar192 + 1) {
                  for (uVar159 = 0; uVar159 != uVar135; uVar159 = uVar159 + 1) {
                    puVar150 = (undefined1 *)
                               ((long)local_678.data +
                               uVar159 * (long)iVar259 +
                               (long)local_678.w * local_678.elemsize * (long)iVar169 * uVar192 +
                               local_678.cstep * uVar160 * local_678.elemsize);
                    for (uVar165 = 0; uVar165 != uVar199; uVar165 = uVar165 + 1) {
                      lVar178 = 0;
                      puVar170 = puVar150;
                      for (lVar187 = 0; (int)lVar187 + 3 < iVar185; lVar187 = lVar187 + 4) {
                        *(undefined1 *)(lVar146 + lVar187) = *puVar170;
                        *(undefined1 *)(lVar146 + 1 + lVar187) = puVar170[lVar163];
                        *(undefined1 *)(lVar146 + 2 + lVar187) = puVar170[lVar177];
                        *(undefined1 *)(lVar146 + 3 + lVar187) = puVar170[iVar141 * 3];
                        puVar170 = puVar170 + iVar141 * 4;
                        lVar178 = lVar178 + iVar141 * 4;
                      }
                      for (; (int)lVar187 + 1 < iVar185; lVar187 = lVar187 + 2) {
                        *(undefined1 *)(lVar146 + lVar187) = *puVar170;
                        *(undefined1 *)(lVar146 + 1 + lVar187) = puVar170[lVar163];
                        puVar170 = puVar170 + lVar177;
                        lVar178 = lVar178 + lVar177;
                      }
                      for (; (int)lVar187 < iVar185; lVar187 = lVar187 + 1) {
                        *(undefined1 *)(lVar146 + lVar187) = puVar150[lVar178];
                        lVar178 = lVar178 + lVar163;
                      }
                      puVar150 = puVar150 + lVar178 + (iVar176 * iVar256 - iVar185 * iVar141);
                      lVar146 = lVar146 + lVar187;
                    }
                  }
                }
              }
              im2col_sgemm_int8_sse((Mat *)&opt_q,&local_5f8,&this->weight_sgemm_data,opt);
              piVar193 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
              if (piVar193 != (int *)0x0) {
                LOCK();
                *piVar193 = *piVar193 + -1;
                UNLOCK();
                if (*piVar193 == 0) {
                  pvVar162 = (void *)opt_q._0_8_;
                  if (opt_q._32_8_ == 0) goto LAB_001a214b;
                  (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
                }
              }
              goto LAB_0019e48e;
            }
            uVar175 = (ulong)(uint)local_5f8.c;
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)&opt_q,(long)(int)uVar190,
                       (allocator_type *)&local_558);
            iVar141 = 0;
            if ((int)uVar165 < 1) {
              uVar135 = 0;
            }
            if ((int)uVar148 < 1) {
              uVar148 = 0;
            }
            uVar192 = uVar135;
            iVar292 = 0;
            for (uVar140 = 0; uVar140 != uVar148; uVar140 = uVar140 + 1) {
              for (lVar146 = (long)iVar292; (int)uVar192 != lVar146; lVar146 = lVar146 + 1) {
                *(int *)(opt_q._0_8_ + lVar146 * 4) = iVar141;
                iVar141 = iVar141 + iVar259;
              }
              iVar141 = iVar141 + (iVar176 * iVar169 - iVar259 * uVar165);
              uVar192 = (ulong)(uint)((int)uVar192 + (int)uVar135);
              iVar292 = iVar292 + (int)uVar135;
            }
            local_608 = (short  [4])(local_5f8.elemsize * local_5f8.cstep);
            if ((int)uVar190 < 1) {
              uVar172 = 0;
            }
            uVar135 = (ulong)(uint)iVar142;
            if (iVar142 < 1) {
              uVar135 = 0;
            }
            uVar192 = 0;
            if (0 < iVar185) {
              uVar192 = (ulong)(uint)iVar185;
            }
            if ((int)uVar199 < 1) {
              uVar160 = 0;
            }
            if (iVar189 < 1) {
              uVar175 = 0;
            }
            for (uVar159 = 0; uVar159 != uVar175; uVar159 = uVar159 + 1) {
              local_708 = (void *)((long)local_608 * uVar159 + (long)local_5f8.data);
              for (uVar174 = 0; uVar174 != uVar160; uVar174 = uVar174 + 1) {
                pvVar162 = (this->weight_data_tm).data;
                for (uVar191 = 0; uVar191 != uVar192; uVar191 = uVar191 + 1) {
                  iVar176 = 0;
                  lVar146 = (long)pvVar162 + (long)(int)(iVar142 * uVar190 * (int)uVar159);
                  for (uVar151 = 0; uVar151 != uVar135; uVar151 = uVar151 + 1) {
                    for (uVar180 = 0; uVar172 != uVar180; uVar180 = uVar180 + 1) {
                      iVar176 = iVar176 + (int)*(char *)(lVar146 + uVar180) *
                                          (int)*(char *)((long)local_678.data +
                                                        (long)*(int *)(opt_q._0_8_ + uVar180 * 4) +
                                                        local_678.cstep * local_678.elemsize *
                                                        uVar151 + uVar191 * lVar163 +
                                                                  (long)local_678.w *
                                                                  uVar174 * (long)iVar256 *
                                                                  local_678.elemsize);
                    }
                    lVar146 = lVar146 + (int)uVar190;
                  }
                  *(int *)((long)local_708 + uVar191 * 4) = iVar176;
                }
                local_708 = (void *)((long)local_708 + lVar177 * 4);
              }
            }
            goto LAB_0019e481;
          }
          lVar163 = (long)local_678.c;
          uVar135 = (ulong)local_5f8.c;
          piVar193 = (int *)CONCAT44(local_678.refcount._4_4_,local_678.refcount._0_4_);
          opt_q._0_8_ = local_678.data;
          opt_q.blob_allocator._0_4_ = local_678.refcount._0_4_;
          opt_q.blob_allocator._4_4_ = local_678.refcount._4_4_;
          opt_q.workspace_allocator._0_4_ = (undefined4)local_678.elemsize;
          opt_q.workspace_allocator._4_4_ = (int)(local_678.elemsize >> 0x20);
          opt_q.openmp_blocktime = local_678.elempack;
          opt_q._32_8_ = local_678.allocator;
          opt_q._52_4_ = local_678.d;
          opt_q.flush_denormals = local_678.h;
          opt_q.use_shader_pack8 = (bool)(undefined1)local_678.dims;
          opt_q.use_subgroup_basic = (bool)local_678.dims._1_1_;
          opt_q.use_subgroup_vote = (bool)local_678.dims._2_1_;
          opt_q.use_subgroup_ballot = (bool)local_678.dims._3_1_;
          opt_q.use_subgroup_shuffle = (bool)(undefined1)local_678.w;
          opt_q.use_image_storage = (bool)local_678.w._1_1_;
          opt_q.use_tensor_storage = (bool)local_678.w._2_1_;
          opt_q.use_reserved_0 = (bool)local_678.w._3_1_;
          opt_q.use_winograd43_convolution = (bool)(undefined1)local_678.c;
          opt_q.use_winograd63_convolution = (bool)local_678.c._1_1_;
          opt_q.use_reserved_6 = (bool)local_678.c._2_1_;
          opt_q.use_reserved_7 = (bool)local_678.c._3_1_;
          if (piVar193 != (int *)0x0) {
            LOCK();
            *piVar193 = *piVar193 + 1;
            UNLOCK();
          }
          uVar160 = (long)(int)(local_5f8.w + 1) / 2;
          local_400 = uVar160 & 0xffffffff;
          uVar172 = (long)(int)(local_5f8.h + 1) / 2;
          iVar176 = (int)uVar172;
          local_3e0 = iVar176 * 2;
          iVar259 = (int)uVar160 * 2 + 2;
          opt_b.lightmode = opt->lightmode;
          opt_b._1_3_ = *(undefined3 *)&opt->field_0x1;
          opt_b.num_threads = opt->num_threads;
          opt_b.workspace_allocator = opt->workspace_allocator;
          uVar48 = opt->openmp_blocktime;
          uVar49 = opt->use_winograd_convolution;
          uVar51 = opt->use_sgemm_convolution;
          uVar53 = opt->use_int8_inference;
          uVar55 = opt->use_vulkan_compute;
          uVar54 = CONCAT11(uVar55,uVar53);
          uVar52 = CONCAT21(uVar54,uVar51);
          uVar50 = CONCAT31(uVar52,uVar49);
          opt_b.use_bf16_storage = opt->use_bf16_storage;
          opt_b.use_fp16_packed = opt->use_fp16_packed;
          opt_b.use_fp16_storage = opt->use_fp16_storage;
          opt_b.use_fp16_arithmetic = opt->use_fp16_arithmetic;
          opt_b.use_int8_packed = opt->use_int8_packed;
          opt_b.use_int8_storage = opt->use_int8_storage;
          opt_b.use_int8_arithmetic = opt->use_int8_arithmetic;
          opt_b.use_packing_layout = opt->use_packing_layout;
          uVar225._0_1_ = opt->use_shader_pack8;
          uVar225._1_1_ = opt->use_subgroup_basic;
          uVar225._2_1_ = opt->use_subgroup_vote;
          uVar225._3_1_ = opt->use_subgroup_ballot;
          uVar56 = opt->use_subgroup_shuffle;
          uVar57 = opt->use_image_storage;
          uVar59 = opt->use_tensor_storage;
          uVar61 = opt->use_reserved_0;
          uVar60 = CONCAT11(uVar61,uVar59);
          uVar58 = CONCAT21(uVar60,uVar57);
          uVar225._4_4_ = CONCAT31(uVar58,uVar56);
          uVar62 = opt->flush_denormals;
          uVar63 = opt->use_local_pool_allocator;
          uVar65 = opt->use_shader_local_memory;
          uVar67 = opt->use_cooperative_matrix;
          uVar69 = opt->use_winograd23_convolution;
          uVar68 = CONCAT11(uVar69,uVar67);
          uVar66 = CONCAT21(uVar68,uVar65);
          uVar64 = CONCAT31(uVar66,uVar63);
          uVar263._0_1_ = opt->use_winograd43_convolution;
          uVar263._1_1_ = opt->use_winograd63_convolution;
          uVar263._2_1_ = opt->use_reserved_6;
          uVar263._3_1_ = opt->use_reserved_7;
          uVar70 = opt->use_reserved_8;
          uVar71 = opt->use_reserved_9;
          uVar73 = opt->use_reserved_10;
          uVar75 = opt->use_reserved_11;
          uVar74 = CONCAT11(uVar75,uVar73);
          uVar72 = CONCAT21(uVar74,uVar71);
          uVar263._4_4_ = CONCAT31(uVar72,uVar70);
          opt_b._56_4_ = SUB84(uVar263,0);
          opt_b._40_4_ = SUB84(uVar225,0);
          opt_b.blob_allocator._0_4_ = SUB84(opt->workspace_allocator,0);
          opt_b.blob_allocator._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
          opt_b.openmp_blocktime = uVar48;
          opt_b._28_4_ = uVar50;
          opt_b._44_4_ = uVar225._4_4_;
          opt_b.flush_denormals = uVar62;
          opt_b._52_4_ = uVar64;
          opt_b._60_4_ = uVar263._4_4_;
          copy_make_border(&local_678,(Mat *)&opt_q,0,(local_3e0 - local_678.h) + 2,0,
                           iVar259 - local_678.w,0,0.0,&opt_b);
          local_558.cstep = 0;
          uVar148 = iVar176 * (int)local_400;
          local_558.data = (void *)0x0;
          local_558.refcount._0_4_ = 0;
          local_558.refcount._4_4_ = 0;
          local_558.elemsize = 0;
          local_558.elempack = 0;
          local_558.allocator = (Allocator *)0x0;
          local_558.dims = 0;
          local_558.w = 0;
          local_558.h = 0;
          local_558.d = 0;
          local_558.c = 0;
          Mat::create(&local_558,0x10,uVar148,iVar142,2,opt->workspace_allocator);
          uVar225 = opt_q._0_8_;
          pvVar162 = local_558.data;
          uVar199 = (uint)local_400;
          local_3e4 = uVar199 * 2;
          lVar177 = CONCAT44(opt_q.workspace_allocator._4_4_,opt_q.workspace_allocator._0_4_);
          lVar146 = local_558.elemsize * local_558.cstep;
          lVar187 = (long)iVar259;
          uVar160 = 0;
          uVar165 = 0;
          if (0 < (int)uVar199) {
            uVar165 = uVar199;
          }
          uVar172 = uVar172 & 0xffffffff;
          if (iVar176 < 1) {
            uVar172 = uVar160;
          }
          uVar175 = 0;
          if (0 < iVar142) {
            uVar175 = (ulong)(uint)iVar142;
          }
          for (; uVar160 != uVar175; uVar160 = uVar160 + 1) {
            pvVar153 = (void *)(lVar146 * uVar160 + (long)pvVar162);
            for (uVar192 = 0; uVar192 != uVar172; uVar192 = uVar192 + 1) {
              lVar186 = (long)(iVar259 * 2 * (int)uVar192) + lVar177 * sVar184 * uVar160 + uVar225;
              lVar178 = lVar186 + lVar187;
              lVar154 = lVar187 + lVar178;
              lVar149 = lVar154 + lVar187;
              for (uVar199 = 0; uVar199 != uVar165; uVar199 = uVar199 + 1) {
                for (lVar157 = 0; lVar157 != 4; lVar157 = lVar157 + 1) {
                  d0[lVar157] = (short)*(char *)(lVar186 + lVar157);
                  d1[lVar157] = (short)*(char *)(lVar178 + lVar157);
                  d2[lVar157] = (short)*(char *)(lVar154 + lVar157);
                  d3[lVar157] = (short)*(char *)(lVar149 + lVar157);
                }
                for (lVar157 = 0; lVar157 != 8; lVar157 = lVar157 + 2) {
                  sVar312 = *(short *)((long)d2 + lVar157);
                  *(short *)((long)w0 + lVar157) = *(short *)((long)d0 + lVar157) - sVar312;
                  sVar486 = *(short *)((long)d1 + lVar157);
                  *(short *)((long)w1 + lVar157) = sVar486 + sVar312;
                  *(short *)((long)w2 + lVar157) = sVar312 - sVar486;
                  *(short *)((long)w3 + lVar157) = *(short *)((long)d3 + lVar157) - sVar486;
                }
                t0[1] = w1[0];
                t0[0] = w0[0];
                t1[1] = w1[1];
                t1[0] = w0[1];
                t2[1] = w1[2];
                t2[0] = w0[2];
                t3[1] = w1[3];
                t3[0] = w0[3];
                t0[2] = (short)w2._0_4_;
                t0[3] = w3[0];
                t1[3] = w3[1];
                t1[2] = w2[1];
                t2[2] = (short)w2._4_4_;
                t2[3] = w3[2];
                t3[3] = w3[3];
                t3[2] = w2[3];
                for (lVar157 = 0; lVar157 != 8; lVar157 = lVar157 + 2) {
                  sVar312 = *(short *)((long)t2 + lVar157);
                  *(short *)((long)d0 + lVar157) = *(short *)((long)t0 + lVar157) - sVar312;
                  sVar486 = *(short *)((long)t1 + lVar157);
                  *(short *)((long)d1 + lVar157) = sVar486 + sVar312;
                  *(short *)((long)d2 + lVar157) = sVar312 - sVar486;
                  *(short *)((long)d3 + lVar157) = *(short *)((long)t3 + lVar157) - sVar486;
                }
                for (lVar157 = 0; lVar157 != 8; lVar157 = lVar157 + 2) {
                  *(undefined2 *)((long)pvVar153 + lVar157) = *(undefined2 *)((long)d0 + lVar157);
                  *(undefined2 *)((long)pvVar153 + lVar157 + 8) =
                       *(undefined2 *)((long)d1 + lVar157);
                  *(undefined2 *)((long)pvVar153 + lVar157 + 0x10) =
                       *(undefined2 *)((long)d2 + lVar157);
                  *(undefined2 *)((long)pvVar153 + lVar157 + 0x18) =
                       *(undefined2 *)((long)d3 + lVar157);
                }
                lVar186 = lVar186 + 2;
                lVar178 = lVar178 + 2;
                lVar154 = lVar154 + 2;
                lVar149 = lVar149 + 2;
                pvVar153 = (void *)((long)pvVar153 + 0x20);
              }
            }
          }
          piVar193 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
          if (piVar193 != (int *)0x0) {
            LOCK();
            *piVar193 = *piVar193 + -1;
            UNLOCK();
            if (*piVar193 == 0) {
              if (opt_q._32_8_ == 0) {
                free((void *)opt_q._0_8_);
              }
              else {
                (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
              }
            }
          }
          opt_q.lightmode = false;
          opt_q._1_3_ = 0;
          opt_q.num_threads = 0;
          opt_q.blob_allocator._0_4_ = 0;
          opt_q.blob_allocator._4_4_ = 0;
          opt_q.workspace_allocator._0_4_ = 0;
          opt_q.workspace_allocator._4_4_ = 0;
          opt_q.openmp_blocktime = 0;
          opt_q.flush_denormals = 0;
          opt_q.use_local_pool_allocator = false;
          opt_q.use_shader_local_memory = false;
          opt_q.use_cooperative_matrix = false;
          opt_q.use_winograd23_convolution = false;
          opt_q.use_winograd43_convolution = false;
          opt_q.use_winograd63_convolution = false;
          opt_q.use_reserved_6 = false;
          opt_q.use_reserved_7 = false;
          opt_q.use_bf16_storage = false;
          opt_q.use_fp16_packed = false;
          opt_q.use_fp16_storage = false;
          opt_q.use_fp16_arithmetic = false;
          opt_q.use_int8_packed = false;
          opt_q.use_int8_storage = false;
          opt_q.use_int8_arithmetic = false;
          opt_q.use_packing_layout = false;
          opt_q.use_shader_pack8 = false;
          opt_q.use_subgroup_basic = false;
          opt_q.use_subgroup_vote = false;
          opt_q.use_subgroup_ballot = false;
          opt_q.use_subgroup_shuffle = false;
          opt_q.use_image_storage = false;
          opt_q.use_tensor_storage = false;
          opt_q.use_reserved_0 = false;
          local_568 = 0;
          d0[0] = 0;
          d0[1] = 0;
          d0[2] = 0;
          d0[3] = 0;
          local_588 = (Allocator *)0x0;
          iStack_580 = 0;
          iStack_57c = 0;
          auStack_578 = SUB1612((undefined1  [16])0x0,4);
          Mat::create((Mat *)d0,0x10,uVar148,iVar189,4,opt->workspace_allocator);
          local_168 = 0;
          local_170 = (this->weight_winograd23_data).elemsize;
          lVar177 = (this->weight_winograd23_data).cstep * local_170;
          uVar175 = 0;
          uVar160 = (ulong)uVar148;
          if ((int)uVar148 < 1) {
            uVar160 = uVar175;
          }
          local_160 = (ulong)(uint)(iVar189 >> 2);
          if (iVar189 >> 2 < 1) {
            local_160 = uVar175;
          }
          local_630 = (short  [4])(this->weight_winograd23_data).data;
          local_178 = lVar177 * 4;
          local_180 = local_170 * 4;
          local_620 = (short  [4])(lVar177 * 3 + (long)local_630);
          local_618 = (void *)((long)local_630 + lVar177 * 2);
          local_188 = 0;
          local_408._0_2_ = d0[0];
          local_408._2_2_ = d0[1];
          local_408._4_2_ = d0[2];
          local_408._6_2_ = d0[3];
          local_628 = (void *)((long)local_630 + lVar177);
          for (; uVar175 != local_160; uVar175 = uVar175 + 1) {
            lVar146 = (long)(this->weight_winograd23_data).w;
            lVar187 = local_170 * lVar146;
            lVar146 = lVar146 * local_170 * 4;
            local_3f8._0_2_ = d0[0];
            local_3f8._2_2_ = d0[1];
            local_3f8._4_2_ = d0[2];
            local_3f8._6_2_ = d0[3];
            for (uVar192 = 0; uVar192 != uVar160; uVar192 = uVar192 + 1) {
              d1[0] = 0;
              d1[1] = 0;
              d1[2] = 0;
              d1[3] = 0;
              _d2 = (undefined1  [16])0x0;
              _d3 = (undefined1  [16])0x0;
              _w0 = (undefined1  [16])0x0;
              local_610 = (short  [4])(local_558.elemsize * local_558.cstep);
              lVar154 = (long)local_558.w * uVar192;
              pvVar182 = (void *)((local_558.cstep * 3 + lVar154) * local_558.elemsize +
                                 (long)local_558.data);
              lVar178 = (long)local_610 * 4;
              pvVar188 = (void *)((lVar154 + local_558.cstep * 2) * local_558.elemsize +
                                 (long)local_558.data);
              pvVar197 = (void *)((local_558.cstep + lVar154) * local_558.elemsize +
                                 (long)local_558.data);
              pvVar153 = (void *)(lVar154 * local_558.elemsize + (long)local_558.data);
              local_6c8 = local_618;
              pvVar162 = local_628;
              asVar173 = local_620;
              asVar145 = local_630;
              for (uVar159 = 0; (long)(uVar159 | 3) < lVar163; uVar159 = uVar159 + 4) {
                for (lVar154 = 0; lVar154 != 0x20; lVar154 = lVar154 + 2) {
                  iVar185 = (int)*(short *)((long)pvVar153 + lVar154);
                  iVar176 = (int)*(short *)((long)pvVar197 + lVar154);
                  iVar259 = (int)*(short *)((long)pvVar188 + lVar154);
                  iVar142 = (int)*(short *)((long)pvVar182 + lVar154);
                  *(int *)(d1 + lVar154) =
                       *(short *)((long)asVar145 + lVar154 + 0x60) * iVar142 +
                       *(short *)((long)asVar145 + lVar154 + 0x40) * iVar259 +
                       *(short *)((long)asVar145 + lVar154 + 0x20) * iVar176 +
                       *(short *)((long)asVar145 + lVar154) * iVar185 + *(int *)(d1 + lVar154);
                  lVar149 = lVar177 + lVar154;
                  *(int *)(d2 + lVar154) =
                       *(short *)((long)asVar145 + lVar177 + 0x60 + lVar154) * iVar142 +
                       *(short *)((long)asVar145 + lVar177 + 0x40 + lVar154) * iVar259 +
                       *(short *)((long)asVar145 + lVar177 + 0x20 + lVar154) * iVar176 +
                       *(short *)((long)asVar145 + lVar177 + lVar154) * iVar185 +
                       *(int *)(d2 + lVar154);
                  lVar186 = lVar177 + lVar149;
                  *(int *)(d3 + lVar154) =
                       *(short *)((long)asVar145 + lVar177 + 0x60 + lVar149) * iVar142 +
                       *(short *)((long)asVar145 + lVar177 + 0x40 + lVar149) * iVar259 +
                       *(short *)((long)asVar145 + lVar177 + 0x20 + lVar149) * iVar176 +
                       *(short *)((long)asVar145 + lVar177 + lVar149) * iVar185 +
                       *(int *)(d3 + lVar154);
                  *(int *)(w0 + lVar154) =
                       *(short *)((long)asVar145 + lVar177 + 0x60 + lVar186) * iVar142 +
                       *(short *)((long)asVar145 + lVar177 + 0x40 + lVar186) * iVar259 +
                       *(short *)((long)asVar145 + lVar177 + 0x20 + lVar186) * iVar176 +
                       *(short *)((long)asVar145 + lVar177 + lVar186) * iVar185 +
                       *(int *)(w0 + lVar154);
                }
                pvVar182 = (void *)((long)pvVar182 + lVar178);
                pvVar188 = (void *)((long)pvVar188 + lVar178);
                pvVar197 = (void *)((long)pvVar197 + lVar178);
                asVar145 = (short  [4])((long)asVar145 + lVar146);
                pvVar153 = (void *)((long)pvVar153 + lVar178);
                asVar173 = (short  [4])((long)asVar173 + lVar146);
                local_6c8 = (void *)((long)local_6c8 + lVar146);
                pvVar162 = (void *)((long)pvVar162 + lVar146);
              }
              for (; (long)uVar159 < lVar163; uVar159 = uVar159 + 1) {
                for (lVar178 = 0; lVar178 != 0x20; lVar178 = lVar178 + 2) {
                  iVar176 = (int)*(short *)((long)pvVar153 + lVar178);
                  *(int *)(d1 + lVar178) =
                       *(int *)(d1 + lVar178) + *(short *)((long)asVar145 + lVar178) * iVar176;
                  *(int *)(d2 + lVar178) =
                       *(int *)(d2 + lVar178) + *(short *)((long)pvVar162 + lVar178) * iVar176;
                  *(int *)(d3 + lVar178) =
                       *(int *)(d3 + lVar178) + *(short *)((long)local_6c8 + lVar178) * iVar176;
                  *(int *)(w0 + lVar178) =
                       *(int *)(w0 + lVar178) + *(short *)((long)asVar173 + lVar178) * iVar176;
                }
                asVar173 = (short  [4])((long)asVar173 + lVar187);
                local_6c8 = (void *)((long)local_6c8 + lVar187);
                pvVar162 = (void *)((long)pvVar162 + lVar187);
                asVar145 = (short  [4])((long)asVar145 + lVar187);
                pvVar153 = (void *)((long)pvVar153 + (long)local_610);
              }
              for (lVar178 = 0; lVar178 != 0x40; lVar178 = lVar178 + 4) {
                *(undefined4 *)((long)d0 + lVar178) = *(undefined4 *)((long)d1 + lVar178);
                *(undefined4 *)((long)d0 + lVar178) = *(undefined4 *)((long)d2 + lVar178);
                *(undefined4 *)((long)local_408 + lVar178) = *(undefined4 *)((long)d3 + lVar178);
                *(undefined4 *)((long)d0 + lVar178) = *(undefined4 *)((long)w0 + lVar178);
              }
              local_608 = local_408;
            }
            local_630 = (short  [4])((long)local_630 + local_178);
            local_620 = (short  [4])((long)local_620 + local_178);
            local_618 = (void *)((long)local_618 + local_178);
            local_628 = (void *)((long)local_628 + local_178);
          }
          uVar175 = uVar135 & 0xfffffffffffffffc;
          local_618 = (void *)(this->weight_winograd23_data).elemsize;
          local_628 = (void *)((this->weight_winograd23_data).cstep * (long)local_618);
          local_720 = (void *)((long)local_628 * uVar175 + (long)(this->weight_winograd23_data).data
                              );
          local_5b0 = (long)local_618 * 4;
          local_600 = (long)local_618 * 2;
          local_620[0] = 0;
          local_620[1] = 0;
          local_620[2] = 0;
          local_620[3] = 0;
          local_630[0] = d0[0];
          local_630[1] = d0[1];
          local_630[2] = d0[2];
          local_630[3] = d0[3];
          for (; (long)uVar175 < (long)uVar135; uVar175 = uVar175 + 1) {
            lVar177 = (long)(this->weight_winograd23_data).w;
            lVar146 = local_5b0 * lVar177;
            local_608 = (short  [4])(lVar177 * local_600 + (long)local_720);
            local_610 = (short  [4])((long)local_720 + (long)local_618 * lVar177);
            for (uVar192 = 0; uVar192 != uVar160; uVar192 = uVar192 + 1) {
              d1[0] = 0;
              d1[1] = 0;
              d1[2] = 0;
              d1[3] = 0;
              lVar178 = (long)local_558.w * uVar192;
              pvVar197 = (void *)((local_558.cstep * 3 + lVar178) * local_558.elemsize +
                                 (long)local_558.data);
              lVar187 = local_558.elemsize * local_558.cstep * 4;
              pvVar182 = (void *)((lVar178 + local_558.cstep * 2) * local_558.elemsize +
                                 (long)local_558.data);
              pvVar183 = (void *)((local_558.cstep + lVar178) * local_558.elemsize +
                                 (long)local_558.data);
              pvVar188 = (void *)(lVar178 * local_558.elemsize + (long)local_558.data);
              pvVar162 = local_720;
              asVar173 = local_610;
              pvVar153 = (void *)((long)local_618 * 3 * lVar177 + (long)local_720);
              asVar145 = local_608;
              for (uVar159 = 0; (long)(uVar159 | 3) < lVar163; uVar159 = uVar159 + 4) {
                for (lVar178 = 0; lVar178 != 0x20; lVar178 = lVar178 + 2) {
                  *(int *)(d1 + lVar178) =
                       (int)*(short *)((long)pvVar153 + lVar178) *
                       (int)*(short *)((long)pvVar197 + lVar178) +
                       (int)*(short *)((long)asVar145 + lVar178) *
                       (int)*(short *)((long)pvVar182 + lVar178) +
                       (int)*(short *)((long)asVar173 + lVar178) *
                       (int)*(short *)((long)pvVar183 + lVar178) +
                       (int)*(short *)((long)pvVar162 + lVar178) *
                       (int)*(short *)((long)pvVar188 + lVar178) + *(int *)(d1 + lVar178);
                }
                pvVar153 = (void *)((long)pvVar153 + lVar146);
                pvVar197 = (void *)((long)pvVar197 + lVar187);
                asVar145 = (short  [4])((long)asVar145 + lVar146);
                pvVar182 = (void *)((long)pvVar182 + lVar187);
                asVar173 = (short  [4])((long)asVar173 + lVar146);
                pvVar183 = (void *)((long)pvVar183 + lVar187);
                pvVar162 = (void *)((long)pvVar162 + lVar146);
                pvVar188 = (void *)((long)pvVar188 + lVar187);
              }
              for (; (long)uVar159 < lVar163; uVar159 = uVar159 + 1) {
                for (lVar187 = 0; lVar187 != 0x10; lVar187 = lVar187 + 1) {
                  *(int *)(d1 + lVar187 * 2) =
                       *(int *)(d1 + lVar187 * 2) +
                       (int)*(short *)((long)pvVar162 + lVar187 * 2) *
                       (int)*(short *)((long)pvVar188 + lVar187 * 2);
                }
                pvVar162 = (void *)((long)pvVar162 + (long)local_618 * lVar177);
                pvVar188 = (void *)((long)pvVar188 + local_558.elemsize * local_558.cstep);
              }
              for (lVar187 = 0; lVar187 != 0x10; lVar187 = lVar187 + 1) {
                *(undefined4 *)((long)d0 + lVar187 * 4) = *(undefined4 *)(d1 + lVar187 * 2);
              }
            }
            local_720 = (void *)((long)local_720 + (long)local_628);
          }
          piVar193 = (int *)CONCAT44(local_558.refcount._4_4_,local_558.refcount._0_4_);
          if (piVar193 != (int *)0x0) {
            LOCK();
            *piVar193 = *piVar193 + -1;
            UNLOCK();
            if (*piVar193 == 0) {
              if (local_558.allocator == (Allocator *)0x0) {
                free(local_558.data);
              }
              else {
                (*(local_558.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_558.cstep = 0;
          local_558.data = (void *)0x0;
          local_558.refcount._0_4_ = 0;
          local_558.refcount._4_4_ = 0;
          local_558.elemsize = 0;
          local_558.elempack = 0;
          local_558.h = 0;
          local_558.d = 0;
          local_558.c = 0;
          local_558.allocator = (Allocator *)0x0;
          local_558.dims = 0;
          local_558.w = 0;
          d1[0] = 0;
          d1[1] = 0;
          d1[2] = 0;
          d1[3] = 0;
          Mat::create((Mat *)d1,local_3e4,local_3e0,iVar189,4,opt->workspace_allocator);
          uVar160 = 0;
          uVar135 = (ulong)(uint)iVar189;
          if (iVar189 < 1) {
            uVar135 = uVar160;
          }
          for (; uVar160 != uVar135; uVar160 = uVar160 + 1) {
            for (uVar175 = 0; uVar175 != uVar172; uVar175 = uVar175 + 1) {
              asVar173 = d1;
              asVar145 = d1;
              for (uVar192 = 0; uVar192 != uVar165; uVar192 = uVar192 + 1) {
                for (lVar163 = 0; lVar163 != 0x10; lVar163 = lVar163 + 4) {
                  *(undefined4 *)((long)d2 + lVar163) = *(undefined4 *)((long)d0 + lVar163);
                  *(undefined4 *)((long)d3 + lVar163) = *(undefined4 *)((long)d0 + 0x10 + lVar163);
                  *(undefined4 *)((long)w0 + lVar163) = *(undefined4 *)((long)d0 + 0x20 + lVar163);
                  *(undefined4 *)((long)w1 + lVar163) = *(undefined4 *)((long)d0 + 0x30 + lVar163);
                }
                for (lVar163 = 0; lVar163 != 0x10; lVar163 = lVar163 + 4) {
                  *(int *)((long)w2 + lVar163) =
                       *(int *)((long)d2 + lVar163) + *(int *)((long)d3 + lVar163) +
                       *(int *)((long)w0 + lVar163);
                  *(int *)((long)w3 + lVar163) =
                       (*(int *)((long)d3 + lVar163) - *(int *)((long)w0 + lVar163)) +
                       *(int *)((long)w1 + lVar163);
                }
                t0[0] = w2[0];
                t0[1] = w2[1];
                t0[2] = w3[0];
                t0[3] = w3[1];
                t1[0] = w2[2];
                t1[1] = w2[3];
                t1[2] = w3[2];
                t1[3] = w3[3];
                t2[0] = (undefined2)local_410;
                t2[1] = local_410._2_2_;
                t2._4_4_ = local_420;
                t3[0] = (undefined2)local_40c;
                t3[1] = local_40c._2_2_;
                t3._4_4_ = local_41c;
                for (lVar163 = 0; lVar163 != 8; lVar163 = lVar163 + 4) {
                  *(int *)((long)o0 + lVar163) =
                       *(int *)((long)t0 + lVar163) + *(int *)((long)t1 + lVar163) +
                       *(int *)((long)t2 + lVar163);
                  *(int *)((long)local_158 + lVar163) =
                       (*(int *)((long)t1 + lVar163) - *(int *)((long)t2 + lVar163)) +
                       *(int *)((long)t3 + lVar163);
                }
                *(ulong *)asVar173 = CONCAT44(o0[1] >> 2,o0[0] >> 2);
                *(ulong *)asVar145 = CONCAT44(local_158[1] >> 2,local_158[0] >> 2);
                asVar173 = (short  [4])((long)asVar173 + 8);
                asVar145 = (short  [4])((long)asVar145 + 8);
              }
            }
          }
          copy_cut_border((Mat *)d1,&local_5f8,0,-local_5f8.h,0,-local_5f8.w,opt);
          piVar193 = (int *)CONCAT44(local_558.refcount._4_4_,local_558.refcount._0_4_);
          if (piVar193 != (int *)0x0) {
            LOCK();
            *piVar193 = *piVar193 + -1;
            UNLOCK();
            if (*piVar193 == 0) {
              if (local_558.allocator == (Allocator *)0x0) {
                free(local_558.data);
              }
              else {
                (*(local_558.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          piVar193 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
          if (piVar193 != (int *)0x0) {
            LOCK();
            *piVar193 = *piVar193 + -1;
            UNLOCK();
            if (*piVar193 == 0) {
              pvVar162 = (void *)opt_q._0_8_;
              if (opt_q._32_8_ == 0) goto LAB_001a214b;
              (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
            }
          }
        }
      }
    }
LAB_0019e48e:
    p_Var45 = this->_vptr_Convolution_x86[-3];
    if (local_3dc < 0x65) {
      dequantize_from_int32
                (&local_5f8,local_3f0,&this->scale_in_data,
                 (Mat *)((long)&(this->scale_in_data).dims + (long)p_Var45),opt);
      pLVar46 = this->activation;
      iVar176 = 0;
      if (pLVar46 != (Layer *)0x0) {
        (*pLVar46->_vptr_Layer[9])(pLVar46,local_3f0,opt);
      }
    }
    else {
      iVar176 = 0;
      requantize_from_int32_to_int8
                (&local_5f8,local_3f0,&this->scale_in_data,
                 (Mat *)(&this->field_0x280 + (long)p_Var45),
                 (Mat *)((long)&(this->scale_in_data).dims + (long)p_Var45),
                 *(int *)((long)&(this->weight_winograd43_data).allocator + (long)(p_Var45 + 4)),
                 (Mat *)((long)&(this->weight_winograd43_data).dims + (long)p_Var45),opt);
    }
  }
  piVar193 = (int *)CONCAT44(local_5f8.refcount._4_4_,local_5f8.refcount._0_4_);
  if (piVar193 != (int *)0x0) {
    LOCK();
    *piVar193 = *piVar193 + -1;
    UNLOCK();
    if (*piVar193 == 0) {
      if (local_5f8.allocator == (Allocator *)0x0) {
        free(local_5f8.data);
      }
      else {
        (*(local_5f8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
LAB_0019e56f:
  piVar193 = (int *)CONCAT44(local_678.refcount._4_4_,local_678.refcount._0_4_);
  if (piVar193 != (int *)0x0) {
    LOCK();
    *piVar193 = *piVar193 + -1;
    UNLOCK();
    if (*piVar193 == 0) {
      if (local_678.allocator == (Allocator *)0x0) {
        free(local_678.data);
      }
      else {
        (*(local_678.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  if (local_100.refcount != (int *)0x0) {
    LOCK();
    *local_100.refcount = *local_100.refcount + -1;
    UNLOCK();
    if (*local_100.refcount == 0) {
      if (local_100.allocator == (Allocator *)0x0) {
        free(local_100.data);
      }
      else {
        (*(local_100.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar176;
}

Assistant:

int Convolution_x86::forward_int8_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int elembits = bottom_blob.elembits();

    Mat bottom_blob_int8 = bottom_blob;
    if (elembits != 8)
    {
        Option opt_q = opt;
        opt_q.blob_allocator = opt.workspace_allocator;
        quantize_to_int8(bottom_blob, bottom_blob_int8, bottom_blob_int8_scales, opt_q);
    }

    //     NCNN_LOGE("Convolution_arm input %d x %d  ksize=%d %d  stride=%d %d", w, h, kernel_w, kernel_h, stride_w, stride_h);

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_int8, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    int w = bottom_blob_bordered.w;
    int h = bottom_blob_bordered.h;
    int channels = bottom_blob_bordered.c;
    int elempack = bottom_blob_bordered.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    bool use_int8_requantize = int8_scale_term > 100;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        if (use_int8_requantize)
            out_elempack = num_output % 8 == 0 ? 8 : 1;
        else
            out_elempack = num_output % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__
    size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

    //     NCNN_LOGE("forward_int8_arm %d %d %d    %d %d", w, h, bottom_blob_bordered.c, elempack, out_elempack);

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    const int num_input = channels * elempack;

    int out_elempack_int32 = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        out_elempack_int32 = num_output % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__

    Mat top_blob_int32;
    top_blob_int32.create(outw, outh, num_output / out_elempack_int32, (size_t)(4u * out_elempack_int32), out_elempack_int32, opt.workspace_allocator);
    if (top_blob_int32.empty())
        return -100;

#if __SSE2__
    if (elempack == 8 && out_elempack_int32 == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv1x1s1_sgemm_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv1x1s2_sgemm_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (opt.use_winograd_convolution && opt.use_winograd43_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_winograd43_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_winograd43_data, opt);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
        else
        {
            convolution_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_tm, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
    }

    if (elempack == 1 && out_elempack_int32 == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv1x1s1_sgemm_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv1x1s2_sgemm_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv3x3s2_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 7 && kernel_h == 7 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv7x7s2_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (opt.use_sgemm_convolution) // TODO better condition && num_input >= 8 && num_output >= 8)
        {
            convolution_im2col_sgemm_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
        else
        {
            convolution_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_tm, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
    }

    if (elempack == 8 && out_elempack_int32 == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv1x1s1_sgemm_pack8to1_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv1x1s2_sgemm_pack8to1_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (opt.use_winograd_convolution && opt.use_winograd43_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_winograd43_pack8to1_int8_sse(bottom_blob_bordered, top_blob_int32, weight_winograd43_data, opt);
        }
        else if (opt.use_sgemm_convolution) // TODO better condition && num_input >= 8 && num_output >= 8)
        {
            convolution_im2col_sgemm_pack8to1_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
        else
        {
            convolution_pack8to1_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_tm, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
    }
#endif // __SSE2__

    if (elempack == 1 && out_elempack_int32 == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv1x1s1_sgemm_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv1x1s2_sgemm_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (opt.use_winograd_convolution && opt.use_winograd23_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1 && num_input >= 16 && num_output >= 16)
        {
            conv3x3s1_winograd23_int8_sse(bottom_blob_bordered, top_blob_int32, weight_winograd23_data, opt);
            // conv3x3s1_winograd43_int8_sse(bottom_blob_bordered, top_blob_int32, weight_winograd43_data, opt);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
        else
        {
            convolution_int8(bottom_blob_bordered, top_blob_int32, weight_data_tm, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
    }

    if (use_int8_requantize)
    {
        requantize_from_int32_to_int8(top_blob_int32, top_blob, scale_in_data, top_blob_int8_scales, bias_data, activation_type, activation_params, opt);
    }
    else
    {
        dequantize_from_int32(top_blob_int32, top_blob, scale_in_data, bias_data, opt);

        if (activation)
        {
            activation->forward_inplace(top_blob, opt);
        }
    }

    return 0;
}